

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [48];
  undefined1 auVar145 [24];
  undefined1 auVar146 [40];
  undefined1 auVar147 [56];
  undefined1 auVar148 [24];
  undefined1 auVar149 [40];
  undefined1 auVar150 [48];
  undefined1 auVar151 [56];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  float fVar157;
  float fVar158;
  undefined1 auVar156 [32];
  undefined1 auVar159 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_pow op;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 local_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 uStack_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 uStack_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  int local_4534;
  undefined1 local_452d;
  int local_452c;
  float *local_4528;
  undefined1 (*local_4520) [64];
  undefined1 (*local_4518) [64];
  undefined1 (*local_4510) [64];
  undefined1 (*local_4508) [64];
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 uStack_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  float *local_4498;
  undefined1 (*local_4490) [64];
  undefined1 (*local_4488) [64];
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  float *local_4458;
  undefined1 (*local_4450) [64];
  undefined1 (*local_4448) [64];
  undefined8 local_4440;
  undefined8 uStack_4438;
  float *local_4428;
  undefined8 *local_4420;
  undefined8 *local_4418;
  undefined1 *local_4410;
  undefined8 *local_4408;
  undefined8 *local_4400;
  undefined1 *local_43f8;
  undefined8 *local_43f0;
  undefined8 *local_43e8;
  undefined1 *local_43e0;
  undefined1 (*local_43d8) [64];
  undefined1 (*local_43d0) [64];
  undefined1 *local_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 uStack_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 uStack_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 uStack_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 uStack_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined1 local_42c0 [64];
  undefined1 local_4280 [8];
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 uStack_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  ushort local_4202;
  float local_4200 [2];
  float afStack_41f8 [2];
  float afStack_41f0 [2];
  float afStack_41e8 [2];
  float afStack_41e0 [2];
  float afStack_41d8 [2];
  float afStack_41d0 [2];
  float afStack_41c8 [2];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [16];
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 uStack_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  float local_40c0 [2];
  float afStack_40b8 [2];
  float afStack_40b0 [2];
  float afStack_40a8 [2];
  float afStack_40a0 [2];
  float afStack_4098 [2];
  float afStack_4090 [2];
  float afStack_4088 [2];
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 uStack_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 uStack_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 uStack_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 uStack_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  float local_3f40 [2];
  float afStack_3f38 [2];
  float afStack_3f30 [2];
  float afStack_3f28 [2];
  float afStack_3f20 [2];
  float afStack_3f18 [2];
  float afStack_3f10 [2];
  float afStack_3f08 [2];
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  float local_3ec0 [2];
  float afStack_3eb8 [2];
  float afStack_3eb0 [2];
  float afStack_3ea8 [2];
  float afStack_3ea0 [2];
  float afStack_3e98 [2];
  float afStack_3e90 [2];
  float afStack_3e88 [2];
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 uStack_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined1 local_3e40 [8];
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 uStack_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  ushort local_3d42;
  undefined1 local_3d40 [16];
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 uStack_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined2 local_3cc2;
  float local_3cc0 [2];
  float afStack_3cb8 [2];
  float afStack_3cb0 [2];
  float afStack_3ca8 [2];
  float afStack_3ca0 [2];
  float afStack_3c98 [2];
  float afStack_3c90 [2];
  float afStack_3c88 [2];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 uStack_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 uStack_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  float local_3b80 [2];
  float afStack_3b78 [2];
  float afStack_3b70 [2];
  float afStack_3b68 [2];
  float afStack_3b60 [2];
  float afStack_3b58 [2];
  float afStack_3b50 [2];
  float afStack_3b48 [2];
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 uStack_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  float local_3b00 [2];
  float afStack_3af8 [2];
  float afStack_3af0 [2];
  float afStack_3ae8 [2];
  float afStack_3ae0 [2];
  float afStack_3ad8 [2];
  float afStack_3ad0 [2];
  float afStack_3ac8 [2];
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 uStack_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 uStack_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 uStack_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 uStack_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 uStack_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 uStack_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  int local_3900 [2];
  int aiStack_38f8 [2];
  int aiStack_38f0 [2];
  int aiStack_38e8 [2];
  int aiStack_38e0 [2];
  int aiStack_38d8 [2];
  int aiStack_38d0 [2];
  int aiStack_38c8 [2];
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 uStack_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 uStack_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 uStack_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 uStack_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  float local_37c0 [2];
  float afStack_37b8 [2];
  float afStack_37b0 [2];
  float afStack_37a8 [2];
  float afStack_37a0 [2];
  float afStack_3798 [2];
  float afStack_3790 [2];
  float afStack_3788 [2];
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 uStack_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 uStack_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  float local_3700 [2];
  float afStack_36f8 [2];
  float afStack_36f0 [2];
  float afStack_36e8 [2];
  float afStack_36e0 [2];
  float afStack_36d8 [2];
  float afStack_36d0 [2];
  float afStack_36c8 [2];
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 uStack_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  float local_3680 [2];
  float afStack_3678 [2];
  float afStack_3670 [2];
  float afStack_3668 [2];
  float afStack_3660 [2];
  float afStack_3658 [2];
  float afStack_3650 [2];
  float afStack_3648 [2];
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 uStack_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 uStack_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  float local_35c0 [2];
  float afStack_35b8 [2];
  float afStack_35b0 [2];
  float afStack_35a8 [2];
  float afStack_35a0 [2];
  float afStack_3598 [2];
  float afStack_3590 [2];
  float afStack_3588 [2];
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 uStack_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 uStack_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  float local_3500 [2];
  float afStack_34f8 [2];
  float afStack_34f0 [2];
  float afStack_34e8 [2];
  float afStack_34e0 [2];
  float afStack_34d8 [2];
  float afStack_34d0 [2];
  float afStack_34c8 [2];
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 uStack_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 uStack_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  float local_3440 [2];
  float afStack_3438 [2];
  float afStack_3430 [2];
  float afStack_3428 [2];
  float afStack_3420 [2];
  float afStack_3418 [2];
  float afStack_3410 [2];
  float afStack_3408 [2];
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 uStack_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  float local_3380 [2];
  float afStack_3378 [2];
  float afStack_3370 [2];
  float afStack_3368 [2];
  float afStack_3360 [2];
  float afStack_3358 [2];
  float afStack_3350 [2];
  float afStack_3348 [2];
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 uStack_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 uStack_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  float local_32c0 [2];
  float afStack_32b8 [2];
  float afStack_32b0 [2];
  float afStack_32a8 [2];
  float afStack_32a0 [2];
  float afStack_3298 [2];
  float afStack_3290 [2];
  float afStack_3288 [2];
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 uStack_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 uStack_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  float local_3200 [2];
  float afStack_31f8 [2];
  float afStack_31f0 [2];
  float afStack_31e8 [2];
  float afStack_31e0 [2];
  float afStack_31d8 [2];
  float afStack_31d0 [2];
  float afStack_31c8 [2];
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 uStack_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 uStack_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  float local_3140 [2];
  float afStack_3138 [2];
  float afStack_3130 [2];
  float afStack_3128 [2];
  float afStack_3120 [2];
  float afStack_3118 [2];
  float afStack_3110 [2];
  float afStack_3108 [2];
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 uStack_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  float local_30c0 [2];
  float afStack_30b8 [2];
  float afStack_30b0 [2];
  float afStack_30a8 [2];
  float afStack_30a0 [2];
  float afStack_3098 [2];
  float afStack_3090 [2];
  float afStack_3088 [2];
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 uStack_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 uStack_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 uStack_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  float local_2fc0 [2];
  float afStack_2fb8 [2];
  float afStack_2fb0 [2];
  float afStack_2fa8 [2];
  float afStack_2fa0 [2];
  float afStack_2f98 [2];
  float afStack_2f90 [2];
  float afStack_2f88 [2];
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  float local_2f00 [2];
  float afStack_2ef8 [2];
  float afStack_2ef0 [2];
  float afStack_2ee8 [2];
  float afStack_2ee0 [2];
  float afStack_2ed8 [2];
  float afStack_2ed0 [2];
  float afStack_2ec8 [2];
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 uStack_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  float local_2e40 [2];
  float afStack_2e38 [2];
  float afStack_2e30 [2];
  float afStack_2e28 [2];
  float afStack_2e20 [2];
  float afStack_2e18 [2];
  float afStack_2e10 [2];
  float afStack_2e08 [2];
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  float local_2d80 [2];
  float afStack_2d78 [2];
  float afStack_2d70 [2];
  float afStack_2d68 [2];
  float afStack_2d60 [2];
  float afStack_2d58 [2];
  float afStack_2d50 [2];
  float afStack_2d48 [2];
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  float local_2cc0 [2];
  float afStack_2cb8 [2];
  float afStack_2cb0 [2];
  float afStack_2ca8 [2];
  float afStack_2ca0 [2];
  float afStack_2c98 [2];
  float afStack_2c90 [2];
  float afStack_2c88 [2];
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  float local_2c40 [2];
  float afStack_2c38 [2];
  float afStack_2c30 [2];
  float afStack_2c28 [2];
  float afStack_2c20 [2];
  float afStack_2c18 [2];
  float afStack_2c10 [2];
  float afStack_2c08 [2];
  float local_2c00 [2];
  float afStack_2bf8 [2];
  float afStack_2bf0 [2];
  float afStack_2be8 [2];
  float afStack_2be0 [2];
  float afStack_2bd8 [2];
  float afStack_2bd0 [2];
  float afStack_2bc8 [2];
  float local_2bc0 [2];
  float afStack_2bb8 [2];
  float afStack_2bb0 [2];
  float afStack_2ba8 [2];
  float afStack_2ba0 [2];
  float afStack_2b98 [2];
  float afStack_2b90 [2];
  float afStack_2b88 [2];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  float local_2b40 [2];
  float afStack_2b38 [2];
  float afStack_2b30 [2];
  float afStack_2b28 [2];
  float afStack_2b20 [2];
  float afStack_2b18 [2];
  float afStack_2b10 [2];
  float afStack_2b08 [2];
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  ushort local_2a82;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  float local_2a40 [2];
  float afStack_2a38 [2];
  float afStack_2a30 [2];
  float afStack_2a28 [2];
  float afStack_2a20 [2];
  float afStack_2a18 [2];
  float afStack_2a10 [2];
  float afStack_2a08 [2];
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  float local_29c0 [2];
  float afStack_29b8 [2];
  float afStack_29b0 [2];
  float afStack_29a8 [2];
  float afStack_29a0 [2];
  float afStack_2998 [2];
  float afStack_2990 [2];
  float afStack_2988 [2];
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  ushort local_2902;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  float local_28c0 [2];
  float afStack_28b8 [2];
  float afStack_28b0 [2];
  float afStack_28a8 [2];
  float afStack_28a0 [2];
  float afStack_2898 [2];
  float afStack_2890 [2];
  float afStack_2888 [2];
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  float local_2800 [2];
  float afStack_27f8 [2];
  float afStack_27f0 [2];
  float afStack_27e8 [2];
  float afStack_27e0 [2];
  float afStack_27d8 [2];
  float afStack_27d0 [2];
  float afStack_27c8 [2];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  float local_2740 [2];
  float afStack_2738 [2];
  float afStack_2730 [2];
  float afStack_2728 [2];
  float afStack_2720 [2];
  float afStack_2718 [2];
  float afStack_2710 [2];
  float afStack_2708 [2];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  float local_2680 [2];
  float afStack_2678 [2];
  float afStack_2670 [2];
  float afStack_2668 [2];
  float afStack_2660 [2];
  float afStack_2658 [2];
  float afStack_2650 [2];
  float afStack_2648 [2];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [64];
  undefined1 local_2580 [64];
  undefined4 local_2504;
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined4 local_23c4;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  int local_2340 [2];
  int aiStack_2338 [2];
  int aiStack_2330 [2];
  int aiStack_2328 [2];
  int aiStack_2320 [2];
  int aiStack_2318 [2];
  int aiStack_2310 [2];
  int aiStack_2308 [2];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [64];
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  float local_2240 [2];
  float afStack_2238 [2];
  float afStack_2230 [2];
  float afStack_2228 [2];
  float afStack_2220 [2];
  float afStack_2218 [2];
  float afStack_2210 [2];
  float afStack_2208 [2];
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  ushort local_2042;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined2 local_1f62;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [8];
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [32];
  undefined1 local_1e20 [8];
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [8];
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined4 local_1ce0;
  undefined4 uStack_1cdc;
  undefined4 uStack_1cd8;
  undefined4 uStack_1cd4;
  undefined4 uStack_1cd0;
  undefined4 uStack_1ccc;
  undefined4 uStack_1cc8;
  undefined4 uStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined4 local_1ca0;
  undefined4 uStack_1c9c;
  undefined4 uStack_1c98;
  undefined4 uStack_1c94;
  undefined4 uStack_1c90;
  undefined4 uStack_1c8c;
  undefined4 uStack_1c88;
  undefined4 uStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined1 local_1c60 [8];
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float fStack_1c24;
  undefined1 local_1c20 [32];
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [8];
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 local_1bc0 [32];
  undefined4 local_1ba0;
  undefined4 uStack_1b9c;
  undefined4 uStack_1b98;
  undefined4 uStack_1b94;
  undefined4 uStack_1b90;
  undefined4 uStack_1b8c;
  undefined4 uStack_1b88;
  undefined4 uStack_1b84;
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [8];
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined1 local_1a80 [32];
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  ulong uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined4 local_1940;
  undefined4 uStack_193c;
  undefined4 uStack_1938;
  undefined4 uStack_1934;
  undefined4 uStack_1930;
  undefined4 uStack_192c;
  undefined4 uStack_1928;
  undefined4 uStack_1924;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined1 *local_18b8;
  float *local_18b0;
  undefined1 *local_18a8;
  undefined1 *local_18a0;
  float *local_1898;
  undefined1 *local_1890;
  float *local_1888;
  undefined1 *local_1880;
  undefined1 *local_1878;
  float *local_1870;
  undefined1 *local_1868;
  undefined1 *local_1860;
  float *local_1858;
  undefined1 *local_1850;
  undefined1 *local_1848;
  float *local_1840;
  undefined1 *local_1838;
  undefined1 *local_1830;
  float *local_1828;
  undefined1 *local_1820;
  undefined1 *local_1818;
  float *local_1810;
  undefined1 *local_1808;
  undefined1 *local_1800;
  float *local_17f8;
  undefined1 *local_17f0;
  undefined1 *local_17e8;
  float *local_17e0;
  undefined1 *local_17d8;
  undefined1 *local_17d0;
  undefined1 *local_17c8;
  undefined1 *local_17c0;
  undefined1 *local_17b8;
  float *local_17b0;
  undefined1 *local_17a8;
  undefined1 *local_17a0;
  float *local_1798;
  undefined1 *local_1790;
  undefined1 *local_1788;
  float *local_1780;
  undefined1 *local_1778;
  undefined1 *local_1770;
  float *local_1768;
  undefined1 *local_1760;
  undefined1 *local_1758;
  float *local_1750;
  undefined1 *local_1748;
  undefined1 *local_1740;
  float *local_1738;
  float *local_1730;
  undefined1 *local_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined4 local_16a0;
  undefined4 uStack_169c;
  undefined4 uStack_1698;
  undefined4 uStack_1694;
  undefined4 uStack_1690;
  undefined4 uStack_168c;
  undefined4 uStack_1688;
  undefined4 uStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined1 *local_1608;
  float *local_1600;
  float *local_15f8;
  undefined1 *local_15f0;
  float *local_15e8;
  undefined1 *local_15e0;
  undefined1 *local_15d8;
  float *local_15d0;
  undefined1 *local_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined4 local_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500 [2];
  float afStack_14f8 [2];
  float afStack_14f0 [2];
  float afStack_14e8 [2];
  float local_14e0 [2];
  float afStack_14d8 [2];
  float afStack_14d0 [2];
  float afStack_14c8 [2];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_14a0 [2];
  float afStack_1498 [2];
  float afStack_1490 [2];
  float afStack_1488 [2];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  float local_1440 [2];
  float afStack_1438 [2];
  float afStack_1430 [2];
  float afStack_1428 [2];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0 [2];
  float afStack_13d8 [2];
  float afStack_13d0 [2];
  float afStack_13c8 [2];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380 [2];
  float afStack_1378 [2];
  float afStack_1370 [2];
  float afStack_1368 [2];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float local_1320 [2];
  float afStack_1318 [2];
  float afStack_1310 [2];
  float afStack_1308 [2];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260 [2];
  float afStack_1258 [2];
  float afStack_1250 [2];
  float afStack_1248 [2];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200 [2];
  float afStack_11f8 [2];
  float afStack_11f0 [2];
  float afStack_11e8 [2];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float local_11a0 [2];
  float afStack_1198 [2];
  float afStack_1190 [2];
  float afStack_1188 [2];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140 [2];
  float afStack_1138 [2];
  float afStack_1130 [2];
  float afStack_1128 [2];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0 [2];
  float afStack_10d8 [2];
  float afStack_10d0 [2];
  float afStack_10c8 [2];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080 [2];
  float afStack_1078 [2];
  float afStack_1070 [2];
  float afStack_1068 [2];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020 [2];
  float afStack_1018 [2];
  float afStack_1010 [2];
  float afStack_1008 [2];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0 [2];
  float afStack_fb8 [2];
  float afStack_fb0 [2];
  float afStack_fa8 [2];
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  ulong uStack_f48;
  float local_f40 [2];
  float afStack_f38 [2];
  float afStack_f30 [2];
  float afStack_f28 [2];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  float local_ee0 [2];
  float afStack_ed8 [2];
  float afStack_ed0 [2];
  float afStack_ec8 [2];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80 [2];
  float afStack_e78 [2];
  float afStack_e70 [2];
  float afStack_e68 [2];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float local_e20 [2];
  float afStack_e18 [2];
  float afStack_e10 [2];
  float afStack_e08 [2];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0 [2];
  float afStack_db8 [2];
  float afStack_db0 [2];
  float afStack_da8 [2];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined4 local_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined4 local_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c60;
  undefined4 uStack_c5c;
  undefined4 uStack_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  undefined4 uStack_c48;
  undefined4 uStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined4 local_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined4 local_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [8];
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  undefined8 uStack_a98;
  undefined1 local_a90 [8];
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined4 local_a60;
  undefined4 uStack_a5c;
  undefined4 uStack_a58;
  undefined4 uStack_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined4 local_9e0;
  undefined4 uStack_9dc;
  undefined4 uStack_9d8;
  undefined4 uStack_9d4;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined4 local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_998;
  undefined4 uStack_994;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [8];
  undefined8 uStack_978;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  undefined8 uStack_938;
  undefined1 local_930 [16];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined1 local_890 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined4 local_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined1 *local_6c8;
  float *local_6c0;
  float *local_6b8;
  undefined1 *local_6b0;
  float *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  float *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  float *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  float *local_660;
  undefined1 *local_658;
  float *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  float *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  float *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  float *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  float *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  float *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  float *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  float *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  float *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  float *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  float *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  float *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  float *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined4 local_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470 [2];
  float afStack_468 [2];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  float local_420 [2];
  float afStack_418 [2];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_3f0 [2];
  float afStack_3e8 [2];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390 [2];
  float afStack_388 [2];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  float local_360 [2];
  float afStack_358 [2];
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270 [2];
  float afStack_268 [2];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_4528 = in_RDX;
  local_4520 = in_RSI;
  local_4518 = in_RDI;
  for (local_4534 = 0; local_4534 + 0xf < in_ECX; local_4534 = local_4534 + 0x10) {
    local_4508 = local_4518;
    local_4580 = *(undefined8 *)*local_4518;
    uStack_4578 = *(undefined8 *)(*local_4518 + 8);
    uStack_4570 = *(undefined8 *)(*local_4518 + 0x10);
    uStack_4568 = *(undefined8 *)(*local_4518 + 0x18);
    uStack_4560 = *(undefined8 *)(*local_4518 + 0x20);
    uStack_4558 = *(undefined8 *)(*local_4518 + 0x28);
    auVar144 = *(undefined1 (*) [48])*local_4518;
    uStack_4550 = *(undefined8 *)(*local_4518 + 0x30);
    uStack_4548 = *(undefined8 *)(*local_4518 + 0x38);
    local_4510 = local_4520;
    local_45c0 = *(undefined8 *)*local_4520;
    uStack_45b8 = *(undefined8 *)(*local_4520 + 8);
    uStack_45b0 = *(undefined8 *)(*local_4520 + 0x10);
    uStack_45a8 = *(undefined8 *)(*local_4520 + 0x18);
    uStack_45a0 = *(undefined8 *)(*local_4520 + 0x20);
    uStack_4598 = *(undefined8 *)(*local_4520 + 0x28);
    uStack_4590 = *(undefined8 *)(*local_4520 + 0x30);
    uStack_4588 = *(undefined8 *)(*local_4520 + 0x38);
    local_4410 = &local_452d;
    local_4418 = &local_4580;
    local_4420 = &local_45c0;
    local_3cc0[0] = 1.0;
    local_3cc0[1] = 1.0;
    afStack_3cb8[0] = 1.0;
    afStack_3cb8[1] = 1.0;
    afStack_3cb0[0] = 1.0;
    afStack_3cb0[1] = 1.0;
    afStack_3ca8[0] = 1.0;
    afStack_3ca8[1] = 1.0;
    afStack_3ca0[0] = 1.0;
    afStack_3ca0[1] = 1.0;
    afStack_3c98[0] = 1.0;
    afStack_3c98[1] = 1.0;
    afStack_3c90[0] = 1.0;
    afStack_3c90[1] = 1.0;
    afStack_3c88[0] = 1.0;
    afStack_3c88[1] = 1.0;
    local_3880 = 0;
    uStack_3878 = 0;
    uStack_3870 = 0;
    uStack_3868 = 0;
    uStack_3860 = 0;
    uStack_3858 = 0;
    uStack_3850 = 0;
    uStack_3848 = 0;
    uVar20 = vcmpps_avx512f(*local_4518,ZEXT1664(ZEXT816(0)),2);
    local_3cc2 = (undefined2)uVar20;
    local_3c40._0_8_ = auVar144._0_8_;
    local_38c0 = local_3c40._0_8_;
    local_3c40._8_8_ = auVar144._8_8_;
    uStack_38b8 = local_3c40._8_8_;
    local_3c40._16_8_ = auVar144._16_8_;
    uStack_38b0 = local_3c40._16_8_;
    local_3c40._24_8_ = auVar144._24_8_;
    uStack_38a8 = local_3c40._24_8_;
    local_3c40._32_8_ = auVar144._32_8_;
    uStack_38a0 = local_3c40._32_8_;
    local_3c40._40_8_ = auVar144._40_8_;
    uStack_3898 = local_3c40._40_8_;
    local_3900[0] = 0x800000;
    local_3900[1] = 0x800000;
    aiStack_38f8[0] = 0x800000;
    aiStack_38f8[1] = 0x800000;
    aiStack_38f0[0] = 0x800000;
    aiStack_38f0[1] = 0x800000;
    aiStack_38e8[0] = 0x800000;
    aiStack_38e8[1] = 0x800000;
    aiStack_38e0[0] = 0x800000;
    aiStack_38e0[1] = 0x800000;
    aiStack_38d8[0] = 0x800000;
    aiStack_38d8[1] = 0x800000;
    aiStack_38d0[0] = 0x800000;
    aiStack_38d0[1] = 0x800000;
    aiStack_38c8[0] = 0x800000;
    aiStack_38c8[1] = 0x800000;
    auVar42._8_4_ = 0x800000;
    auVar42._12_4_ = 0x800000;
    auVar42._0_4_ = 0x800000;
    auVar42._4_4_ = 0x800000;
    auVar42._16_4_ = 0x800000;
    auVar42._20_4_ = 0x800000;
    auVar42._24_4_ = 0x800000;
    auVar42._28_4_ = 0x800000;
    auVar42._32_4_ = 0x800000;
    auVar42._36_4_ = 0x800000;
    auVar42._40_4_ = 0x800000;
    auVar42._44_4_ = 0x800000;
    auVar42._48_4_ = 0x800000;
    auVar42._52_4_ = 0x800000;
    auVar42._56_4_ = 0x800000;
    auVar42._60_4_ = 0x800000;
    auVar152 = vmaxps_avx512f(*local_4518,auVar42);
    local_3c40._0_8_ = auVar152._0_8_;
    local_2380 = local_3c40._0_8_;
    local_3c40._8_8_ = auVar152._8_8_;
    uStack_2378 = local_3c40._8_8_;
    local_3c40._16_8_ = auVar152._16_8_;
    uStack_2370 = local_3c40._16_8_;
    local_3c40._24_8_ = auVar152._24_8_;
    uStack_2368 = local_3c40._24_8_;
    local_3c40._32_8_ = auVar152._32_8_;
    uStack_2360 = local_3c40._32_8_;
    local_3c40._40_8_ = auVar152._40_8_;
    uStack_2358 = local_3c40._40_8_;
    local_3c40._48_8_ = auVar152._48_8_;
    uStack_2350 = local_3c40._48_8_;
    local_3c40._56_8_ = auVar152._56_8_;
    uStack_2348 = local_3c40._56_8_;
    local_23c0 = local_3c40._0_8_;
    uStack_23b8 = local_3c40._8_8_;
    uStack_23b0 = local_3c40._16_8_;
    uStack_23a8 = local_3c40._24_8_;
    uStack_23a0 = local_3c40._32_8_;
    uStack_2398 = local_3c40._40_8_;
    uStack_2390 = local_3c40._48_8_;
    uStack_2388 = local_3c40._56_8_;
    local_23c4 = 0x17;
    auVar153 = vmovdqa64_avx512f(auVar152);
    auVar153 = vpsrld_avx512f(auVar153,ZEXT416(0x17));
    auVar153 = vmovdqa64_avx512f(auVar153);
    local_2300 = local_3c40._0_8_;
    uStack_22f8 = local_3c40._8_8_;
    uStack_22f0 = local_3c40._16_8_;
    uStack_22e8 = local_3c40._24_8_;
    uStack_22e0 = local_3c40._32_8_;
    uStack_22d8 = local_3c40._40_8_;
    uStack_22d0 = local_3c40._48_8_;
    uStack_22c8 = local_3c40._56_8_;
    local_2340[0] = -0x7f800001;
    local_2340[1] = -0x7f800001;
    aiStack_2338[0] = -0x7f800001;
    aiStack_2338[1] = -0x7f800001;
    aiStack_2330[0] = -0x7f800001;
    aiStack_2330[1] = -0x7f800001;
    aiStack_2328[0] = -0x7f800001;
    aiStack_2328[1] = -0x7f800001;
    aiStack_2320[0] = -0x7f800001;
    aiStack_2320[1] = -0x7f800001;
    aiStack_2318[0] = -0x7f800001;
    aiStack_2318[1] = -0x7f800001;
    aiStack_2310[0] = -0x7f800001;
    aiStack_2310[1] = -0x7f800001;
    aiStack_2308[0] = -0x7f800001;
    aiStack_2308[1] = -0x7f800001;
    auVar152 = vmovdqa64_avx512f(auVar152);
    auVar80._8_4_ = -0x7f800001;
    auVar80._12_4_ = -0x7f800001;
    auVar80._0_4_ = -0x7f800001;
    auVar80._4_4_ = -0x7f800001;
    auVar80._16_4_ = -0x7f800001;
    auVar80._20_4_ = -0x7f800001;
    auVar80._24_4_ = -0x7f800001;
    auVar80._28_4_ = -0x7f800001;
    auVar80._32_4_ = -0x7f800001;
    auVar80._36_4_ = -0x7f800001;
    auVar80._40_4_ = -0x7f800001;
    auVar80._44_4_ = -0x7f800001;
    auVar80._48_4_ = -0x7f800001;
    auVar80._52_4_ = -0x7f800001;
    auVar80._56_4_ = -0x7f800001;
    auVar80._60_4_ = -0x7f800001;
    auVar154 = vmovdqa64_avx512f(auVar80);
    auVar152 = vpandd_avx512f(auVar152,auVar154);
    auVar152 = vmovdqa64_avx512f(auVar152);
    local_3c40._0_8_ = auVar152._0_8_;
    local_2200 = local_3c40._0_8_;
    local_3c40._8_8_ = auVar152._8_8_;
    uStack_21f8 = local_3c40._8_8_;
    local_3c40._16_8_ = auVar152._16_8_;
    uStack_21f0 = local_3c40._16_8_;
    local_3c40._24_8_ = auVar152._24_8_;
    uStack_21e8 = local_3c40._24_8_;
    local_3c40._32_8_ = auVar152._32_8_;
    uStack_21e0 = local_3c40._32_8_;
    local_3c40._40_8_ = auVar152._40_8_;
    uStack_21d8 = local_3c40._40_8_;
    local_3c40._48_8_ = auVar152._48_8_;
    uStack_21d0 = local_3c40._48_8_;
    local_3c40._56_8_ = auVar152._56_8_;
    uStack_21c8 = local_3c40._56_8_;
    local_2240[0] = 0.5;
    local_2240[1] = 0.5;
    afStack_2238[0] = 0.5;
    afStack_2238[1] = 0.5;
    afStack_2230[0] = 0.5;
    afStack_2230[1] = 0.5;
    afStack_2228[0] = 0.5;
    afStack_2228[1] = 0.5;
    afStack_2220[0] = 0.5;
    afStack_2220[1] = 0.5;
    afStack_2218[0] = 0.5;
    afStack_2218[1] = 0.5;
    afStack_2210[0] = 0.5;
    afStack_2210[1] = 0.5;
    afStack_2208[0] = 0.5;
    afStack_2208[1] = 0.5;
    auVar152 = vmovdqa64_avx512f(auVar152);
    auVar81._8_4_ = 0.5;
    auVar81._12_4_ = 0.5;
    auVar81._0_4_ = 0.5;
    auVar81._4_4_ = 0.5;
    auVar81._16_4_ = 0.5;
    auVar81._20_4_ = 0.5;
    auVar81._24_4_ = 0.5;
    auVar81._28_4_ = 0.5;
    auVar81._32_4_ = 0.5;
    auVar81._36_4_ = 0.5;
    auVar81._40_4_ = 0.5;
    auVar81._44_4_ = 0.5;
    auVar81._48_4_ = 0.5;
    auVar81._52_4_ = 0.5;
    auVar81._56_4_ = 0.5;
    auVar81._60_4_ = 0.5;
    auVar154 = vmovdqa64_avx512f(auVar81);
    auVar152 = vpord_avx512f(auVar152,auVar154);
    auVar152 = vmovdqa64_avx512f(auVar152);
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar154 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    local_2180 = vmovdqa64_avx512f(auVar153);
    local_21c0 = vmovdqa64_avx512f(auVar154);
    auVar153 = vmovdqa64_avx512f(local_2180);
    auVar154 = vmovdqa64_avx512f(local_21c0);
    auVar153 = vpsubd_avx512f(auVar153,auVar154);
    local_3c80 = vmovdqa64_avx512f(auVar153);
    auVar153 = vmovdqa64_avx512f(local_3c80);
    local_2140 = vmovdqa64_avx512f(auVar153);
    auVar153 = vcvtdq2ps_avx512f(local_2140);
    local_3d40._0_8_ = auVar153._0_8_;
    local_3b40 = local_3d40._0_8_;
    local_3d40._8_8_ = auVar153._8_8_;
    uStack_3b38 = local_3d40._8_8_;
    uStack_3d30 = auVar153._16_8_;
    uStack_3b30 = uStack_3d30;
    uStack_3d28 = auVar153._24_8_;
    uStack_3b28 = uStack_3d28;
    uStack_3d20 = auVar153._32_8_;
    uStack_3b20 = uStack_3d20;
    uStack_3d18 = auVar153._40_8_;
    uStack_3b18 = uStack_3d18;
    uStack_3d10 = auVar153._48_8_;
    uStack_3b10 = uStack_3d10;
    uStack_3d08 = auVar153._56_8_;
    uStack_3b08 = uStack_3d08;
    local_3b80[0] = 1.0;
    local_3b80[1] = 1.0;
    afStack_3b78[0] = 1.0;
    afStack_3b78[1] = 1.0;
    afStack_3b70[0] = 1.0;
    afStack_3b70[1] = 1.0;
    afStack_3b68[0] = 1.0;
    afStack_3b68[1] = 1.0;
    afStack_3b60[0] = 1.0;
    afStack_3b60[1] = 1.0;
    afStack_3b58[0] = 1.0;
    afStack_3b58[1] = 1.0;
    afStack_3b50[0] = 1.0;
    afStack_3b50[1] = 1.0;
    afStack_3b48[0] = 1.0;
    afStack_3b48[1] = 1.0;
    auVar37._8_4_ = 1.0;
    auVar37._12_4_ = 1.0;
    auVar37._0_4_ = 1.0;
    auVar37._4_4_ = 1.0;
    auVar37._16_4_ = 1.0;
    auVar37._20_4_ = 1.0;
    auVar37._24_4_ = 1.0;
    auVar37._28_4_ = 1.0;
    auVar37._32_4_ = 1.0;
    auVar37._36_4_ = 1.0;
    auVar37._40_4_ = 1.0;
    auVar37._44_4_ = 1.0;
    auVar37._48_4_ = 1.0;
    auVar37._52_4_ = 1.0;
    auVar37._56_4_ = 1.0;
    auVar37._60_4_ = 1.0;
    auVar153 = vaddps_avx512f(auVar153,auVar37);
    uVar21 = vcmpps_avx512f(auVar152,(undefined1  [64])_ps512_cephes_SQRTHF,1);
    local_3d42 = (ushort)uVar21;
    local_3c40._0_8_ = auVar152._0_8_;
    local_3ac0 = local_3c40._0_8_;
    local_3c40._8_8_ = auVar152._8_8_;
    uStack_3ab8 = local_3c40._8_8_;
    local_3c40._16_8_ = auVar152._16_8_;
    uStack_3ab0 = local_3c40._16_8_;
    local_3c40._24_8_ = auVar152._24_8_;
    uStack_3aa8 = local_3c40._24_8_;
    local_3c40._32_8_ = auVar152._32_8_;
    uStack_3aa0 = local_3c40._32_8_;
    local_3c40._40_8_ = auVar152._40_8_;
    uStack_3a98 = local_3c40._40_8_;
    local_3c40._48_8_ = auVar152._48_8_;
    uStack_3a90 = local_3c40._48_8_;
    local_3c40._56_8_ = auVar152._56_8_;
    uStack_3a88 = local_3c40._56_8_;
    local_3b00[0] = 1.0;
    local_3b00[1] = 1.0;
    afStack_3af8[0] = 1.0;
    afStack_3af8[1] = 1.0;
    afStack_3af0[0] = 1.0;
    afStack_3af0[1] = 1.0;
    afStack_3ae8[0] = 1.0;
    afStack_3ae8[1] = 1.0;
    afStack_3ae0[0] = 1.0;
    afStack_3ae0[1] = 1.0;
    afStack_3ad8[0] = 1.0;
    afStack_3ad8[1] = 1.0;
    afStack_3ad0[0] = 1.0;
    afStack_3ad0[1] = 1.0;
    afStack_3ac8[0] = 1.0;
    afStack_3ac8[1] = 1.0;
    auVar38._8_4_ = 1.0;
    auVar38._12_4_ = 1.0;
    auVar38._0_4_ = 1.0;
    auVar38._4_4_ = 1.0;
    auVar38._16_4_ = 1.0;
    auVar38._20_4_ = 1.0;
    auVar38._24_4_ = 1.0;
    auVar38._28_4_ = 1.0;
    auVar38._32_4_ = 1.0;
    auVar38._36_4_ = 1.0;
    auVar38._40_4_ = 1.0;
    auVar38._44_4_ = 1.0;
    auVar38._48_4_ = 1.0;
    auVar38._52_4_ = 1.0;
    auVar38._56_4_ = 1.0;
    auVar38._60_4_ = 1.0;
    local_3dc0 = vsubps_avx512f(auVar152,auVar38);
    local_3d40._0_8_ = auVar153._0_8_;
    local_2b00 = local_3d40._0_8_;
    local_3d40._8_8_ = auVar153._8_8_;
    uStack_2af8 = local_3d40._8_8_;
    uStack_3d30 = auVar153._16_8_;
    uStack_2af0 = uStack_3d30;
    uStack_3d28 = auVar153._24_8_;
    uStack_2ae8 = uStack_3d28;
    uStack_3d20 = auVar153._32_8_;
    uStack_2ae0 = uStack_3d20;
    uStack_3d18 = auVar153._40_8_;
    uStack_2ad8 = uStack_3d18;
    uStack_3d10 = auVar153._48_8_;
    uStack_2ad0 = uStack_3d10;
    uStack_3d08 = auVar153._56_8_;
    uStack_2ac8 = uStack_3d08;
    local_2b40[0] = 1.0;
    local_2b40[1] = 1.0;
    afStack_2b38[0] = 1.0;
    afStack_2b38[1] = 1.0;
    afStack_2b30[0] = 1.0;
    afStack_2b30[1] = 1.0;
    afStack_2b28[0] = 1.0;
    afStack_2b28[1] = 1.0;
    afStack_2b20[0] = 1.0;
    afStack_2b20[1] = 1.0;
    afStack_2b18[0] = 1.0;
    afStack_2b18[1] = 1.0;
    afStack_2b10[0] = 1.0;
    afStack_2b10[1] = 1.0;
    afStack_2b08[0] = 1.0;
    afStack_2b08[1] = 1.0;
    local_2a00 = local_3d40._0_8_;
    uStack_29f8 = local_3d40._8_8_;
    uStack_29f0 = uStack_3d30;
    uStack_29e8 = uStack_3d28;
    uStack_29e0 = uStack_3d20;
    uStack_29d8 = uStack_3d18;
    uStack_29d0 = uStack_3d10;
    uStack_29c8 = uStack_3d08;
    local_2a40[0] = 1.0;
    local_2a40[1] = 1.0;
    afStack_2a38[0] = 1.0;
    afStack_2a38[1] = 1.0;
    afStack_2a30[0] = 1.0;
    afStack_2a30[1] = 1.0;
    afStack_2a28[0] = 1.0;
    afStack_2a28[1] = 1.0;
    afStack_2a20[0] = 1.0;
    afStack_2a20[1] = 1.0;
    afStack_2a18[0] = 1.0;
    afStack_2a18[1] = 1.0;
    afStack_2a10[0] = 1.0;
    afStack_2a10[1] = 1.0;
    afStack_2a08[0] = 1.0;
    afStack_2a08[1] = 1.0;
    auVar72._8_4_ = 1.0;
    auVar72._12_4_ = 1.0;
    auVar72._0_4_ = 1.0;
    auVar72._4_4_ = 1.0;
    auVar72._16_4_ = 1.0;
    auVar72._20_4_ = 1.0;
    auVar72._24_4_ = 1.0;
    auVar72._28_4_ = 1.0;
    auVar72._32_4_ = 1.0;
    auVar72._36_4_ = 1.0;
    auVar72._40_4_ = 1.0;
    auVar72._44_4_ = 1.0;
    auVar72._48_4_ = 1.0;
    auVar72._52_4_ = 1.0;
    auVar72._56_4_ = 1.0;
    auVar72._60_4_ = 1.0;
    local_2a80._0_4_ = auVar153._0_4_;
    local_2a80._4_4_ = auVar153._4_4_;
    uStack_2a78._0_4_ = auVar153._8_4_;
    uStack_2a78._4_4_ = auVar153._12_4_;
    uStack_2a70._0_4_ = auVar153._16_4_;
    uStack_2a70._4_4_ = auVar153._20_4_;
    uStack_2a68._0_4_ = auVar153._24_4_;
    uStack_2a68._4_4_ = auVar153._28_4_;
    uStack_2a60._0_4_ = auVar153._32_4_;
    uStack_2a60._4_4_ = auVar153._36_4_;
    uStack_2a58._0_4_ = auVar153._40_4_;
    uStack_2a58._4_4_ = auVar153._44_4_;
    uStack_2a50._0_4_ = auVar153._48_4_;
    uStack_2a50._4_4_ = auVar153._52_4_;
    uStack_2a48._0_4_ = auVar153._56_4_;
    uStack_2a48._4_4_ = auVar153._60_4_;
    auVar153 = vsubps_avx512f(auVar153,auVar72);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_3d42 >> 1) & 1);
    bVar3 = (bool)((byte)(local_3d42 >> 2) & 1);
    bVar4 = (bool)((byte)(local_3d42 >> 3) & 1);
    bVar5 = (bool)((byte)(local_3d42 >> 4) & 1);
    bVar6 = (bool)((byte)(local_3d42 >> 5) & 1);
    bVar7 = (bool)((byte)(local_3d42 >> 6) & 1);
    bVar8 = (bool)((byte)(local_3d42 >> 7) & 1);
    bVar9 = (byte)((ulong)uVar21 >> 8);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_3d40._4_4_ = (uint)bVar2 * auVar153._4_4_ | (uint)!bVar2 * local_2a80._4_4_;
    local_3d40._0_4_ = (uint)bVar1 * auVar153._0_4_ | (uint)!bVar1 * (int)local_2a80;
    local_3d40._8_4_ = (uint)bVar3 * auVar153._8_4_ | (uint)!bVar3 * (int)uStack_2a78;
    local_3d40._12_4_ = (uint)bVar4 * auVar153._12_4_ | (uint)!bVar4 * uStack_2a78._4_4_;
    uStack_3d30._0_4_ = (uint)bVar5 * auVar153._16_4_ | (uint)!bVar5 * (int)uStack_2a70;
    uStack_3d30._4_4_ = (uint)bVar6 * auVar153._20_4_ | (uint)!bVar6 * uStack_2a70._4_4_;
    auVar145 = _local_3d40;
    uStack_3d28._0_4_ = (uint)bVar7 * auVar153._24_4_ | (uint)!bVar7 * (int)uStack_2a68;
    uStack_3d28._4_4_ = (uint)bVar8 * auVar153._28_4_ | (uint)!bVar8 * uStack_2a68._4_4_;
    auVar16 = _local_3d40;
    uStack_3d20._0_4_ =
         (uint)(bVar9 & 1) * auVar153._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2a60;
    uStack_3d20._4_4_ = (uint)bVar10 * auVar153._36_4_ | (uint)!bVar10 * uStack_2a60._4_4_;
    auVar146 = _local_3d40;
    uStack_3d18._0_4_ = (uint)bVar11 * auVar153._40_4_ | (uint)!bVar11 * (int)uStack_2a58;
    uStack_3d18._4_4_ = (uint)bVar12 * auVar153._44_4_ | (uint)!bVar12 * uStack_2a58._4_4_;
    auVar144 = _local_3d40;
    uStack_3d10._0_4_ = (uint)bVar13 * auVar153._48_4_ | (uint)!bVar13 * (int)uStack_2a50;
    uStack_3d10._4_4_ = (uint)bVar14 * auVar153._52_4_ | (uint)!bVar14 * uStack_2a50._4_4_;
    auVar147 = _local_3d40;
    uStack_3d08._0_4_ = (uint)bVar15 * auVar153._56_4_ | (uint)!bVar15 * (int)uStack_2a48;
    uStack_3d08._4_4_ =
         (uint)(bVar9 >> 7) * auVar153._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2a48._4_4_;
    auVar37 = _local_3d40;
    local_20c0 = local_3dc0._0_8_;
    uStack_20b8 = local_3dc0._8_8_;
    uStack_20b0 = local_3dc0._16_8_;
    uStack_20a8 = local_3dc0._24_8_;
    uStack_20a0 = local_3dc0._32_8_;
    uStack_2098 = local_3dc0._40_8_;
    uStack_2090 = local_3dc0._48_8_;
    uStack_2088 = local_3dc0._56_8_;
    local_2100 = local_3c40._0_8_;
    uStack_20f8 = local_3c40._8_8_;
    uStack_20f0 = local_3c40._16_8_;
    uStack_20e8 = local_3c40._24_8_;
    uStack_20e0 = local_3c40._32_8_;
    uStack_20d8 = local_3c40._40_8_;
    uStack_20d0 = local_3c40._48_8_;
    uStack_20c8 = local_3c40._56_8_;
    local_1fc0 = local_3dc0._0_8_;
    uStack_1fb8 = local_3dc0._8_8_;
    uStack_1fb0 = local_3dc0._16_8_;
    uStack_1fa8 = local_3dc0._24_8_;
    uStack_1fa0 = local_3dc0._32_8_;
    uStack_1f98 = local_3dc0._40_8_;
    uStack_1f90 = local_3dc0._48_8_;
    uStack_1f88 = local_3dc0._56_8_;
    local_2000 = local_3c40._0_8_;
    uStack_1ff8 = local_3c40._8_8_;
    uStack_1ff0 = local_3c40._16_8_;
    uStack_1fe8 = local_3c40._24_8_;
    uStack_1fe0 = local_3c40._32_8_;
    uStack_1fd8 = local_3c40._40_8_;
    uStack_1fd0 = local_3c40._48_8_;
    uStack_1fc8 = local_3c40._56_8_;
    local_2040._0_4_ = local_3dc0._0_4_;
    local_2040._4_4_ = local_3dc0._4_4_;
    uStack_2038._0_4_ = local_3dc0._8_4_;
    uStack_2038._4_4_ = local_3dc0._12_4_;
    uStack_2030._0_4_ = local_3dc0._16_4_;
    uStack_2030._4_4_ = local_3dc0._20_4_;
    uStack_2028._0_4_ = local_3dc0._24_4_;
    uStack_2028._4_4_ = local_3dc0._28_4_;
    uStack_2020._0_4_ = local_3dc0._32_4_;
    uStack_2020._4_4_ = local_3dc0._36_4_;
    uStack_2018._0_4_ = local_3dc0._40_4_;
    uStack_2018._4_4_ = local_3dc0._44_4_;
    uStack_2010._0_4_ = local_3dc0._48_4_;
    uStack_2010._4_4_ = local_3dc0._52_4_;
    uStack_2008._0_4_ = local_3dc0._56_4_;
    uStack_2008._4_4_ = local_3dc0._60_4_;
    auVar153 = vaddps_avx512f(local_3dc0,auVar152);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_3d42 >> 1) & 1);
    bVar3 = (bool)((byte)(local_3d42 >> 2) & 1);
    bVar4 = (bool)((byte)(local_3d42 >> 3) & 1);
    bVar5 = (bool)((byte)(local_3d42 >> 4) & 1);
    bVar6 = (bool)((byte)(local_3d42 >> 5) & 1);
    bVar7 = (bool)((byte)(local_3d42 >> 6) & 1);
    bVar8 = (bool)((byte)(local_3d42 >> 7) & 1);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_3c40._4_4_ = (uint)bVar2 * auVar153._4_4_ | (uint)!bVar2 * local_2040._4_4_;
    local_3c40._0_4_ = (uint)bVar1 * auVar153._0_4_ | (uint)!bVar1 * (int)local_2040;
    local_3c40._8_4_ = (uint)bVar3 * auVar153._8_4_ | (uint)!bVar3 * (int)uStack_2038;
    local_3c40._12_4_ = (uint)bVar4 * auVar153._12_4_ | (uint)!bVar4 * uStack_2038._4_4_;
    local_3c40._16_4_ = (uint)bVar5 * auVar153._16_4_ | (uint)!bVar5 * (int)uStack_2030;
    local_3c40._20_4_ = (uint)bVar6 * auVar153._20_4_ | (uint)!bVar6 * uStack_2030._4_4_;
    auVar148 = local_3c40._0_24_;
    local_3c40._24_4_ = (uint)bVar7 * auVar153._24_4_ | (uint)!bVar7 * (int)uStack_2028;
    local_3c40._28_4_ = (uint)bVar8 * auVar153._28_4_ | (uint)!bVar8 * uStack_2028._4_4_;
    auVar18 = local_3c40._0_32_;
    local_3c40._32_4_ =
         (uint)(bVar9 & 1) * auVar153._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2020;
    local_3c40._36_4_ = (uint)bVar10 * auVar153._36_4_ | (uint)!bVar10 * uStack_2020._4_4_;
    auVar149 = local_3c40._0_40_;
    local_3c40._40_4_ = (uint)bVar11 * auVar153._40_4_ | (uint)!bVar11 * (int)uStack_2018;
    local_3c40._44_4_ = (uint)bVar12 * auVar153._44_4_ | (uint)!bVar12 * uStack_2018._4_4_;
    auVar150 = local_3c40._0_48_;
    local_3c40._48_4_ = (uint)bVar13 * auVar153._48_4_ | (uint)!bVar13 * (int)uStack_2010;
    local_3c40._52_4_ = (uint)bVar14 * auVar153._52_4_ | (uint)!bVar14 * uStack_2010._4_4_;
    auVar151 = local_3c40._0_56_;
    local_3c40._56_4_ = (uint)bVar15 * auVar153._56_4_ | (uint)!bVar15 * (int)uStack_2008;
    local_3c40._60_4_ =
         (uint)(bVar9 >> 7) * auVar153._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2008._4_4_;
    auVar153 = local_3c40;
    local_3980 = local_3c40._0_8_;
    uStack_3978 = local_3c40._8_8_;
    local_3c40._16_8_ = auVar148._16_8_;
    uStack_3970 = local_3c40._16_8_;
    local_3c40._24_8_ = auVar18._24_8_;
    uStack_3968 = local_3c40._24_8_;
    local_3c40._32_8_ = auVar149._32_8_;
    uStack_3960 = local_3c40._32_8_;
    local_3c40._40_8_ = auVar150._40_8_;
    uStack_3958 = local_3c40._40_8_;
    local_3c40._48_8_ = auVar151._48_8_;
    uStack_3950 = local_3c40._48_8_;
    local_3c40._56_8_ = auVar153._56_8_;
    uStack_3948 = local_3c40._56_8_;
    auVar41._16_8_ = local_3c40._16_8_;
    auVar41._0_16_ = local_3c40._0_16_;
    auVar41._24_8_ = local_3c40._24_8_;
    auVar41._32_8_ = local_3c40._32_8_;
    auVar41._40_8_ = local_3c40._40_8_;
    auVar41._48_8_ = local_3c40._48_8_;
    auVar41._56_8_ = local_3c40._56_8_;
    auVar40._16_8_ = local_3c40._16_8_;
    auVar40._0_16_ = local_3c40._0_16_;
    auVar40._24_8_ = local_3c40._24_8_;
    auVar40._32_8_ = local_3c40._32_8_;
    auVar40._40_8_ = local_3c40._40_8_;
    auVar40._48_8_ = local_3c40._48_8_;
    auVar40._56_8_ = local_3c40._56_8_;
    local_3e00 = vmulps_avx512f(auVar41,auVar40);
    uStack_3e38._0_4_ = 0.070376836;
    uStack_3e38._4_4_ = 0.070376836;
    local_3e40._0_4_ = 0.070376836;
    local_3e40._4_4_ = 0.070376836;
    local_30c0[0] = 0.070376836;
    local_30c0[1] = 0.070376836;
    afStack_30b8[0] = 0.070376836;
    afStack_30b8[1] = 0.070376836;
    afStack_30b0[0] = 0.070376836;
    afStack_30b0[1] = 0.070376836;
    afStack_30a8[0] = 0.070376836;
    afStack_30a8[1] = 0.070376836;
    afStack_30a0[0] = 0.070376836;
    afStack_30a0[1] = 0.070376836;
    afStack_3098[0] = 0.070376836;
    afStack_3098[1] = 0.070376836;
    afStack_3090[0] = 0.070376836;
    afStack_3090[1] = 0.070376836;
    afStack_3088[0] = 0.070376836;
    afStack_3088[1] = 0.070376836;
    local_3100 = local_3c40._0_8_;
    uStack_30f8 = local_3c40._8_8_;
    uStack_30f0 = local_3c40._16_8_;
    uStack_30e8 = local_3c40._24_8_;
    uStack_30e0 = local_3c40._32_8_;
    uStack_30d8 = local_3c40._40_8_;
    uStack_30d0 = local_3c40._48_8_;
    uStack_30c8 = local_3c40._56_8_;
    local_3140[0] = -0.1151461;
    local_3140[1] = -0.1151461;
    afStack_3138[0] = -0.1151461;
    afStack_3138[1] = -0.1151461;
    afStack_3130[0] = -0.1151461;
    afStack_3130[1] = -0.1151461;
    afStack_3128[0] = -0.1151461;
    afStack_3128[1] = -0.1151461;
    afStack_3120[0] = -0.1151461;
    afStack_3120[1] = -0.1151461;
    afStack_3118[0] = -0.1151461;
    afStack_3118[1] = -0.1151461;
    afStack_3110[0] = -0.1151461;
    afStack_3110[1] = -0.1151461;
    afStack_3108[0] = -0.1151461;
    afStack_3108[1] = -0.1151461;
    auVar63._16_4_ = 0.070376836;
    auVar63._20_4_ = 0.070376836;
    auVar63._0_16_ = _local_3e40;
    auVar63._24_4_ = 0.070376836;
    auVar63._28_4_ = 0.070376836;
    auVar63._32_4_ = 0.070376836;
    auVar63._36_4_ = 0.070376836;
    auVar63._40_4_ = 0.070376836;
    auVar63._44_4_ = 0.070376836;
    auVar63._48_4_ = 0.070376836;
    auVar63._52_4_ = 0.070376836;
    auVar63._56_4_ = 0.070376836;
    auVar63._60_4_ = 0.070376836;
    auVar62._16_8_ = local_3c40._16_8_;
    auVar62._0_16_ = local_3c40._0_16_;
    auVar62._24_8_ = local_3c40._24_8_;
    auVar62._32_8_ = local_3c40._32_8_;
    auVar62._40_8_ = local_3c40._40_8_;
    auVar62._48_8_ = local_3c40._48_8_;
    auVar62._56_8_ = local_3c40._56_8_;
    auVar61._8_4_ = -0.1151461;
    auVar61._12_4_ = -0.1151461;
    auVar61._0_4_ = -0.1151461;
    auVar61._4_4_ = -0.1151461;
    auVar61._16_4_ = -0.1151461;
    auVar61._20_4_ = -0.1151461;
    auVar61._24_4_ = -0.1151461;
    auVar61._28_4_ = -0.1151461;
    auVar61._32_4_ = -0.1151461;
    auVar61._36_4_ = -0.1151461;
    auVar61._40_4_ = -0.1151461;
    auVar61._44_4_ = -0.1151461;
    auVar61._48_4_ = -0.1151461;
    auVar61._52_4_ = -0.1151461;
    auVar61._56_4_ = -0.1151461;
    auVar61._60_4_ = -0.1151461;
    auVar153 = vfmadd213ps_avx512f(auVar62,auVar63,auVar61);
    local_3e40 = auVar153._0_8_;
    local_3180 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3178 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3170 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3168 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3160 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3158 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3150 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3148 = uStack_3e08;
    local_31c0 = local_3c40._0_8_;
    uStack_31b8 = local_3c40._8_8_;
    uStack_31b0 = local_3c40._16_8_;
    uStack_31a8 = local_3c40._24_8_;
    uStack_31a0 = local_3c40._32_8_;
    uStack_3198 = local_3c40._40_8_;
    uStack_3190 = local_3c40._48_8_;
    uStack_3188 = local_3c40._56_8_;
    local_3200[0] = 0.116769984;
    local_3200[1] = 0.116769984;
    afStack_31f8[0] = 0.116769984;
    afStack_31f8[1] = 0.116769984;
    afStack_31f0[0] = 0.116769984;
    afStack_31f0[1] = 0.116769984;
    afStack_31e8[0] = 0.116769984;
    afStack_31e8[1] = 0.116769984;
    afStack_31e0[0] = 0.116769984;
    afStack_31e0[1] = 0.116769984;
    afStack_31d8[0] = 0.116769984;
    afStack_31d8[1] = 0.116769984;
    afStack_31d0[0] = 0.116769984;
    afStack_31d0[1] = 0.116769984;
    afStack_31c8[0] = 0.116769984;
    afStack_31c8[1] = 0.116769984;
    auVar60._16_8_ = local_3c40._16_8_;
    auVar60._0_16_ = local_3c40._0_16_;
    auVar60._24_8_ = local_3c40._24_8_;
    auVar60._32_8_ = local_3c40._32_8_;
    auVar60._40_8_ = local_3c40._40_8_;
    auVar60._48_8_ = local_3c40._48_8_;
    auVar60._56_8_ = local_3c40._56_8_;
    auVar59._8_4_ = 0.116769984;
    auVar59._12_4_ = 0.116769984;
    auVar59._0_4_ = 0.116769984;
    auVar59._4_4_ = 0.116769984;
    auVar59._16_4_ = 0.116769984;
    auVar59._20_4_ = 0.116769984;
    auVar59._24_4_ = 0.116769984;
    auVar59._28_4_ = 0.116769984;
    auVar59._32_4_ = 0.116769984;
    auVar59._36_4_ = 0.116769984;
    auVar59._40_4_ = 0.116769984;
    auVar59._44_4_ = 0.116769984;
    auVar59._48_4_ = 0.116769984;
    auVar59._52_4_ = 0.116769984;
    auVar59._56_4_ = 0.116769984;
    auVar59._60_4_ = 0.116769984;
    auVar153 = vfmadd213ps_avx512f(auVar60,auVar153,auVar59);
    local_3e40 = auVar153._0_8_;
    local_3240 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3238 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3230 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3228 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3220 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3218 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3210 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3208 = uStack_3e08;
    local_3280 = local_3c40._0_8_;
    uStack_3278 = local_3c40._8_8_;
    uStack_3270 = local_3c40._16_8_;
    uStack_3268 = local_3c40._24_8_;
    uStack_3260 = local_3c40._32_8_;
    uStack_3258 = local_3c40._40_8_;
    uStack_3250 = local_3c40._48_8_;
    uStack_3248 = local_3c40._56_8_;
    local_32c0[0] = -0.12420141;
    local_32c0[1] = -0.12420141;
    afStack_32b8[0] = -0.12420141;
    afStack_32b8[1] = -0.12420141;
    afStack_32b0[0] = -0.12420141;
    afStack_32b0[1] = -0.12420141;
    afStack_32a8[0] = -0.12420141;
    afStack_32a8[1] = -0.12420141;
    afStack_32a0[0] = -0.12420141;
    afStack_32a0[1] = -0.12420141;
    afStack_3298[0] = -0.12420141;
    afStack_3298[1] = -0.12420141;
    afStack_3290[0] = -0.12420141;
    afStack_3290[1] = -0.12420141;
    afStack_3288[0] = -0.12420141;
    afStack_3288[1] = -0.12420141;
    auVar58._16_8_ = local_3c40._16_8_;
    auVar58._0_16_ = local_3c40._0_16_;
    auVar58._24_8_ = local_3c40._24_8_;
    auVar58._32_8_ = local_3c40._32_8_;
    auVar58._40_8_ = local_3c40._40_8_;
    auVar58._48_8_ = local_3c40._48_8_;
    auVar58._56_8_ = local_3c40._56_8_;
    auVar57._8_4_ = -0.12420141;
    auVar57._12_4_ = -0.12420141;
    auVar57._0_4_ = -0.12420141;
    auVar57._4_4_ = -0.12420141;
    auVar57._16_4_ = -0.12420141;
    auVar57._20_4_ = -0.12420141;
    auVar57._24_4_ = -0.12420141;
    auVar57._28_4_ = -0.12420141;
    auVar57._32_4_ = -0.12420141;
    auVar57._36_4_ = -0.12420141;
    auVar57._40_4_ = -0.12420141;
    auVar57._44_4_ = -0.12420141;
    auVar57._48_4_ = -0.12420141;
    auVar57._52_4_ = -0.12420141;
    auVar57._56_4_ = -0.12420141;
    auVar57._60_4_ = -0.12420141;
    auVar153 = vfmadd213ps_avx512f(auVar58,auVar153,auVar57);
    local_3e40 = auVar153._0_8_;
    local_3300 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_32f8 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_32f0 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_32e8 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_32e0 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_32d8 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_32d0 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_32c8 = uStack_3e08;
    local_3340 = local_3c40._0_8_;
    uStack_3338 = local_3c40._8_8_;
    uStack_3330 = local_3c40._16_8_;
    uStack_3328 = local_3c40._24_8_;
    uStack_3320 = local_3c40._32_8_;
    uStack_3318 = local_3c40._40_8_;
    uStack_3310 = local_3c40._48_8_;
    uStack_3308 = local_3c40._56_8_;
    local_3380[0] = 0.14249323;
    local_3380[1] = 0.14249323;
    afStack_3378[0] = 0.14249323;
    afStack_3378[1] = 0.14249323;
    afStack_3370[0] = 0.14249323;
    afStack_3370[1] = 0.14249323;
    afStack_3368[0] = 0.14249323;
    afStack_3368[1] = 0.14249323;
    afStack_3360[0] = 0.14249323;
    afStack_3360[1] = 0.14249323;
    afStack_3358[0] = 0.14249323;
    afStack_3358[1] = 0.14249323;
    afStack_3350[0] = 0.14249323;
    afStack_3350[1] = 0.14249323;
    afStack_3348[0] = 0.14249323;
    afStack_3348[1] = 0.14249323;
    auVar56._16_8_ = local_3c40._16_8_;
    auVar56._0_16_ = local_3c40._0_16_;
    auVar56._24_8_ = local_3c40._24_8_;
    auVar56._32_8_ = local_3c40._32_8_;
    auVar56._40_8_ = local_3c40._40_8_;
    auVar56._48_8_ = local_3c40._48_8_;
    auVar56._56_8_ = local_3c40._56_8_;
    auVar55._8_4_ = 0.14249323;
    auVar55._12_4_ = 0.14249323;
    auVar55._0_4_ = 0.14249323;
    auVar55._4_4_ = 0.14249323;
    auVar55._16_4_ = 0.14249323;
    auVar55._20_4_ = 0.14249323;
    auVar55._24_4_ = 0.14249323;
    auVar55._28_4_ = 0.14249323;
    auVar55._32_4_ = 0.14249323;
    auVar55._36_4_ = 0.14249323;
    auVar55._40_4_ = 0.14249323;
    auVar55._44_4_ = 0.14249323;
    auVar55._48_4_ = 0.14249323;
    auVar55._52_4_ = 0.14249323;
    auVar55._56_4_ = 0.14249323;
    auVar55._60_4_ = 0.14249323;
    auVar153 = vfmadd213ps_avx512f(auVar56,auVar153,auVar55);
    local_3e40 = auVar153._0_8_;
    local_33c0 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_33b8 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_33b0 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_33a8 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_33a0 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3398 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3390 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3388 = uStack_3e08;
    local_3400 = local_3c40._0_8_;
    uStack_33f8 = local_3c40._8_8_;
    uStack_33f0 = local_3c40._16_8_;
    uStack_33e8 = local_3c40._24_8_;
    uStack_33e0 = local_3c40._32_8_;
    uStack_33d8 = local_3c40._40_8_;
    uStack_33d0 = local_3c40._48_8_;
    uStack_33c8 = local_3c40._56_8_;
    local_3440[0] = -0.16668057;
    local_3440[1] = -0.16668057;
    afStack_3438[0] = -0.16668057;
    afStack_3438[1] = -0.16668057;
    afStack_3430[0] = -0.16668057;
    afStack_3430[1] = -0.16668057;
    afStack_3428[0] = -0.16668057;
    afStack_3428[1] = -0.16668057;
    afStack_3420[0] = -0.16668057;
    afStack_3420[1] = -0.16668057;
    afStack_3418[0] = -0.16668057;
    afStack_3418[1] = -0.16668057;
    afStack_3410[0] = -0.16668057;
    afStack_3410[1] = -0.16668057;
    afStack_3408[0] = -0.16668057;
    afStack_3408[1] = -0.16668057;
    auVar54._16_8_ = local_3c40._16_8_;
    auVar54._0_16_ = local_3c40._0_16_;
    auVar54._24_8_ = local_3c40._24_8_;
    auVar54._32_8_ = local_3c40._32_8_;
    auVar54._40_8_ = local_3c40._40_8_;
    auVar54._48_8_ = local_3c40._48_8_;
    auVar54._56_8_ = local_3c40._56_8_;
    auVar53._8_4_ = -0.16668057;
    auVar53._12_4_ = -0.16668057;
    auVar53._0_4_ = -0.16668057;
    auVar53._4_4_ = -0.16668057;
    auVar53._16_4_ = -0.16668057;
    auVar53._20_4_ = -0.16668057;
    auVar53._24_4_ = -0.16668057;
    auVar53._28_4_ = -0.16668057;
    auVar53._32_4_ = -0.16668057;
    auVar53._36_4_ = -0.16668057;
    auVar53._40_4_ = -0.16668057;
    auVar53._44_4_ = -0.16668057;
    auVar53._48_4_ = -0.16668057;
    auVar53._52_4_ = -0.16668057;
    auVar53._56_4_ = -0.16668057;
    auVar53._60_4_ = -0.16668057;
    auVar153 = vfmadd213ps_avx512f(auVar54,auVar153,auVar53);
    local_3e40 = auVar153._0_8_;
    local_3480 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3478 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3470 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3468 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3460 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3458 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3450 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3448 = uStack_3e08;
    local_34c0 = local_3c40._0_8_;
    uStack_34b8 = local_3c40._8_8_;
    uStack_34b0 = local_3c40._16_8_;
    uStack_34a8 = local_3c40._24_8_;
    uStack_34a0 = local_3c40._32_8_;
    uStack_3498 = local_3c40._40_8_;
    uStack_3490 = local_3c40._48_8_;
    uStack_3488 = local_3c40._56_8_;
    local_3500[0] = 0.20000714;
    local_3500[1] = 0.20000714;
    afStack_34f8[0] = 0.20000714;
    afStack_34f8[1] = 0.20000714;
    afStack_34f0[0] = 0.20000714;
    afStack_34f0[1] = 0.20000714;
    afStack_34e8[0] = 0.20000714;
    afStack_34e8[1] = 0.20000714;
    afStack_34e0[0] = 0.20000714;
    afStack_34e0[1] = 0.20000714;
    afStack_34d8[0] = 0.20000714;
    afStack_34d8[1] = 0.20000714;
    afStack_34d0[0] = 0.20000714;
    afStack_34d0[1] = 0.20000714;
    afStack_34c8[0] = 0.20000714;
    afStack_34c8[1] = 0.20000714;
    auVar52._16_8_ = local_3c40._16_8_;
    auVar52._0_16_ = local_3c40._0_16_;
    auVar52._24_8_ = local_3c40._24_8_;
    auVar52._32_8_ = local_3c40._32_8_;
    auVar52._40_8_ = local_3c40._40_8_;
    auVar52._48_8_ = local_3c40._48_8_;
    auVar52._56_8_ = local_3c40._56_8_;
    auVar51._8_4_ = 0.20000714;
    auVar51._12_4_ = 0.20000714;
    auVar51._0_4_ = 0.20000714;
    auVar51._4_4_ = 0.20000714;
    auVar51._16_4_ = 0.20000714;
    auVar51._20_4_ = 0.20000714;
    auVar51._24_4_ = 0.20000714;
    auVar51._28_4_ = 0.20000714;
    auVar51._32_4_ = 0.20000714;
    auVar51._36_4_ = 0.20000714;
    auVar51._40_4_ = 0.20000714;
    auVar51._44_4_ = 0.20000714;
    auVar51._48_4_ = 0.20000714;
    auVar51._52_4_ = 0.20000714;
    auVar51._56_4_ = 0.20000714;
    auVar51._60_4_ = 0.20000714;
    auVar153 = vfmadd213ps_avx512f(auVar52,auVar153,auVar51);
    local_3e40 = auVar153._0_8_;
    local_3540 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3538 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3530 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3528 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3520 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3518 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3510 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3508 = uStack_3e08;
    local_3580 = local_3c40._0_8_;
    uStack_3578 = local_3c40._8_8_;
    uStack_3570 = local_3c40._16_8_;
    uStack_3568 = local_3c40._24_8_;
    uStack_3560 = local_3c40._32_8_;
    uStack_3558 = local_3c40._40_8_;
    uStack_3550 = local_3c40._48_8_;
    uStack_3548 = local_3c40._56_8_;
    local_35c0[0] = -0.24999994;
    local_35c0[1] = -0.24999994;
    afStack_35b8[0] = -0.24999994;
    afStack_35b8[1] = -0.24999994;
    afStack_35b0[0] = -0.24999994;
    afStack_35b0[1] = -0.24999994;
    afStack_35a8[0] = -0.24999994;
    afStack_35a8[1] = -0.24999994;
    afStack_35a0[0] = -0.24999994;
    afStack_35a0[1] = -0.24999994;
    afStack_3598[0] = -0.24999994;
    afStack_3598[1] = -0.24999994;
    afStack_3590[0] = -0.24999994;
    afStack_3590[1] = -0.24999994;
    afStack_3588[0] = -0.24999994;
    afStack_3588[1] = -0.24999994;
    auVar50._16_8_ = local_3c40._16_8_;
    auVar50._0_16_ = local_3c40._0_16_;
    auVar50._24_8_ = local_3c40._24_8_;
    auVar50._32_8_ = local_3c40._32_8_;
    auVar50._40_8_ = local_3c40._40_8_;
    auVar50._48_8_ = local_3c40._48_8_;
    auVar50._56_8_ = local_3c40._56_8_;
    auVar49._8_4_ = -0.24999994;
    auVar49._12_4_ = -0.24999994;
    auVar49._0_4_ = -0.24999994;
    auVar49._4_4_ = -0.24999994;
    auVar49._16_4_ = -0.24999994;
    auVar49._20_4_ = -0.24999994;
    auVar49._24_4_ = -0.24999994;
    auVar49._28_4_ = -0.24999994;
    auVar49._32_4_ = -0.24999994;
    auVar49._36_4_ = -0.24999994;
    auVar49._40_4_ = -0.24999994;
    auVar49._44_4_ = -0.24999994;
    auVar49._48_4_ = -0.24999994;
    auVar49._52_4_ = -0.24999994;
    auVar49._56_4_ = -0.24999994;
    auVar49._60_4_ = -0.24999994;
    auVar153 = vfmadd213ps_avx512f(auVar50,auVar153,auVar49);
    local_3e40 = auVar153._0_8_;
    local_3600 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_35f8 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_35f0 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_35e8 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_35e0 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_35d8 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_35d0 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_35c8 = uStack_3e08;
    local_3640 = local_3c40._0_8_;
    uStack_3638 = local_3c40._8_8_;
    uStack_3630 = local_3c40._16_8_;
    uStack_3628 = local_3c40._24_8_;
    uStack_3620 = local_3c40._32_8_;
    uStack_3618 = local_3c40._40_8_;
    uStack_3610 = local_3c40._48_8_;
    uStack_3608 = local_3c40._56_8_;
    local_3680[0] = 0.3333333;
    local_3680[1] = 0.3333333;
    afStack_3678[0] = 0.3333333;
    afStack_3678[1] = 0.3333333;
    afStack_3670[0] = 0.3333333;
    afStack_3670[1] = 0.3333333;
    afStack_3668[0] = 0.3333333;
    afStack_3668[1] = 0.3333333;
    afStack_3660[0] = 0.3333333;
    afStack_3660[1] = 0.3333333;
    afStack_3658[0] = 0.3333333;
    afStack_3658[1] = 0.3333333;
    afStack_3650[0] = 0.3333333;
    afStack_3650[1] = 0.3333333;
    afStack_3648[0] = 0.3333333;
    afStack_3648[1] = 0.3333333;
    auVar48._16_8_ = local_3c40._16_8_;
    auVar48._0_16_ = local_3c40._0_16_;
    auVar48._24_8_ = local_3c40._24_8_;
    auVar48._32_8_ = local_3c40._32_8_;
    auVar48._40_8_ = local_3c40._40_8_;
    auVar48._48_8_ = local_3c40._48_8_;
    auVar48._56_8_ = local_3c40._56_8_;
    auVar47._8_4_ = 0.3333333;
    auVar47._12_4_ = 0.3333333;
    auVar47._0_4_ = 0.3333333;
    auVar47._4_4_ = 0.3333333;
    auVar47._16_4_ = 0.3333333;
    auVar47._20_4_ = 0.3333333;
    auVar47._24_4_ = 0.3333333;
    auVar47._28_4_ = 0.3333333;
    auVar47._32_4_ = 0.3333333;
    auVar47._36_4_ = 0.3333333;
    auVar47._40_4_ = 0.3333333;
    auVar47._44_4_ = 0.3333333;
    auVar47._48_4_ = 0.3333333;
    auVar47._52_4_ = 0.3333333;
    auVar47._56_4_ = 0.3333333;
    auVar47._60_4_ = 0.3333333;
    auVar153 = vfmadd213ps_avx512f(auVar48,auVar153,auVar47);
    local_3e40 = auVar153._0_8_;
    local_39c0 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_39b8 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_39b0 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_39a8 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_39a0 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3998 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3990 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3988 = uStack_3e08;
    local_3a00 = local_3c40._0_8_;
    uStack_39f8 = local_3c40._8_8_;
    uStack_39f0 = local_3c40._16_8_;
    uStack_39e8 = local_3c40._24_8_;
    uStack_39e0 = local_3c40._32_8_;
    uStack_39d8 = local_3c40._40_8_;
    uStack_39d0 = local_3c40._48_8_;
    uStack_39c8 = local_3c40._56_8_;
    auVar39._16_8_ = local_3c40._16_8_;
    auVar39._0_16_ = local_3c40._0_16_;
    auVar39._24_8_ = local_3c40._24_8_;
    auVar39._32_8_ = local_3c40._32_8_;
    auVar39._40_8_ = local_3c40._40_8_;
    auVar39._48_8_ = local_3c40._48_8_;
    auVar39._56_8_ = local_3c40._56_8_;
    auVar153 = vmulps_avx512f(auVar153,auVar39);
    local_3e40 = auVar153._0_8_;
    local_3a40 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3a38 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3a30 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3a28 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3a20 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3a18 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3a10 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3a08 = uStack_3e08;
    local_3a80 = local_3e00._0_8_;
    uStack_3a78 = local_3e00._8_8_;
    uStack_3a70 = local_3e00._16_8_;
    uStack_3a68 = local_3e00._24_8_;
    uStack_3a60 = local_3e00._32_8_;
    uStack_3a58 = local_3e00._40_8_;
    uStack_3a50 = local_3e00._48_8_;
    uStack_3a48 = local_3e00._56_8_;
    auVar153 = vmulps_avx512f(auVar153,local_3e00);
    local_36c0 = local_3d40._0_8_;
    uStack_36b8 = local_3d40._8_8_;
    uStack_3d30 = auVar145._16_8_;
    uStack_36b0 = uStack_3d30;
    uStack_3d28 = auVar16._24_8_;
    uStack_36a8 = uStack_3d28;
    uStack_3d20 = auVar146._32_8_;
    uStack_36a0 = uStack_3d20;
    uStack_3d18 = auVar144._40_8_;
    uStack_3698 = uStack_3d18;
    uStack_3d10 = auVar147._48_8_;
    uStack_3690 = uStack_3d10;
    uStack_3d08 = auVar37._56_8_;
    uStack_3688 = uStack_3d08;
    local_3700[0] = -0.00021219444;
    local_3700[1] = -0.00021219444;
    afStack_36f8[0] = -0.00021219444;
    afStack_36f8[1] = -0.00021219444;
    afStack_36f0[0] = -0.00021219444;
    afStack_36f0[1] = -0.00021219444;
    afStack_36e8[0] = -0.00021219444;
    afStack_36e8[1] = -0.00021219444;
    afStack_36e0[0] = -0.00021219444;
    afStack_36e0[1] = -0.00021219444;
    afStack_36d8[0] = -0.00021219444;
    afStack_36d8[1] = -0.00021219444;
    afStack_36d0[0] = -0.00021219444;
    afStack_36d0[1] = -0.00021219444;
    afStack_36c8[0] = -0.00021219444;
    afStack_36c8[1] = -0.00021219444;
    local_3e40 = auVar153._0_8_;
    local_3740 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3738 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3730 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3728 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3720 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3718 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3710 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3708 = uStack_3e08;
    auVar46._16_8_ = uStack_3d30;
    auVar46._0_16_ = local_3d40;
    auVar46._24_8_ = uStack_3d28;
    auVar46._32_8_ = uStack_3d20;
    auVar46._40_8_ = uStack_3d18;
    auVar46._48_8_ = uStack_3d10;
    auVar46._56_8_ = uStack_3d08;
    auVar45._8_4_ = -0.00021219444;
    auVar45._12_4_ = -0.00021219444;
    auVar45._0_4_ = -0.00021219444;
    auVar45._4_4_ = -0.00021219444;
    auVar45._16_4_ = -0.00021219444;
    auVar45._20_4_ = -0.00021219444;
    auVar45._24_4_ = -0.00021219444;
    auVar45._28_4_ = -0.00021219444;
    auVar45._32_4_ = -0.00021219444;
    auVar45._36_4_ = -0.00021219444;
    auVar45._40_4_ = -0.00021219444;
    auVar45._44_4_ = -0.00021219444;
    auVar45._48_4_ = -0.00021219444;
    auVar45._52_4_ = -0.00021219444;
    auVar45._56_4_ = -0.00021219444;
    auVar45._60_4_ = -0.00021219444;
    auVar153 = vfmadd213ps_avx512f(auVar45,auVar46,auVar153);
    local_27c0 = local_3e00._0_8_;
    uStack_27b8 = local_3e00._8_8_;
    uStack_27b0 = local_3e00._16_8_;
    uStack_27a8 = local_3e00._24_8_;
    uStack_27a0 = local_3e00._32_8_;
    uStack_2798 = local_3e00._40_8_;
    uStack_2790 = local_3e00._48_8_;
    uStack_2788 = local_3e00._56_8_;
    local_2800[0] = 0.5;
    local_2800[1] = 0.5;
    afStack_27f8[0] = 0.5;
    afStack_27f8[1] = 0.5;
    afStack_27f0[0] = 0.5;
    afStack_27f0[1] = 0.5;
    afStack_27e8[0] = 0.5;
    afStack_27e8[1] = 0.5;
    afStack_27e0[0] = 0.5;
    afStack_27e0[1] = 0.5;
    afStack_27d8[0] = 0.5;
    afStack_27d8[1] = 0.5;
    afStack_27d0[0] = 0.5;
    afStack_27d0[1] = 0.5;
    afStack_27c8[0] = 0.5;
    afStack_27c8[1] = 0.5;
    local_3e40 = auVar153._0_8_;
    local_2840 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_2838 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_2830 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_2828 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_2820 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_2818 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_2810 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_2808 = uStack_3e08;
    auVar74._8_4_ = 0.5;
    auVar74._12_4_ = 0.5;
    auVar74._0_4_ = 0.5;
    auVar74._4_4_ = 0.5;
    auVar74._16_4_ = 0.5;
    auVar74._20_4_ = 0.5;
    auVar74._24_4_ = 0.5;
    auVar74._28_4_ = 0.5;
    auVar74._32_4_ = 0.5;
    auVar74._36_4_ = 0.5;
    auVar74._40_4_ = 0.5;
    auVar74._44_4_ = 0.5;
    auVar74._48_4_ = 0.5;
    auVar74._52_4_ = 0.5;
    auVar74._56_4_ = 0.5;
    auVar74._60_4_ = 0.5;
    auVar153 = vfnmadd213ps_avx512f(auVar74,local_3e00,auVar153);
    local_3bc0 = local_3c40._0_8_;
    uStack_3bb8 = local_3c40._8_8_;
    uStack_3bb0 = local_3c40._16_8_;
    uStack_3ba8 = local_3c40._24_8_;
    uStack_3ba0 = local_3c40._32_8_;
    uStack_3b98 = local_3c40._40_8_;
    uStack_3b90 = local_3c40._48_8_;
    uStack_3b88 = local_3c40._56_8_;
    local_3e40 = auVar153._0_8_;
    local_3c00 = local_3e40;
    uStack_3e38 = auVar153._8_8_;
    uStack_3bf8 = uStack_3e38;
    uStack_3e30 = auVar153._16_8_;
    uStack_3bf0 = uStack_3e30;
    uStack_3e28 = auVar153._24_8_;
    uStack_3be8 = uStack_3e28;
    uStack_3e20 = auVar153._32_8_;
    uStack_3be0 = uStack_3e20;
    uStack_3e18 = auVar153._40_8_;
    uStack_3bd8 = uStack_3e18;
    uStack_3e10 = auVar153._48_8_;
    uStack_3bd0 = uStack_3e10;
    uStack_3e08 = auVar153._56_8_;
    uStack_3bc8 = uStack_3e08;
    auVar155._16_8_ = local_3c40._16_8_;
    auVar155._0_16_ = local_3c40._0_16_;
    auVar155._24_8_ = local_3c40._24_8_;
    auVar155._32_8_ = local_3c40._32_8_;
    auVar155._40_8_ = local_3c40._40_8_;
    auVar155._48_8_ = local_3c40._48_8_;
    auVar155._56_8_ = local_3c40._56_8_;
    auVar153 = vaddps_avx512f(auVar155,auVar153);
    local_3780 = local_3d40._0_8_;
    uStack_3778 = local_3d40._8_8_;
    uStack_3770 = uStack_3d30;
    uStack_3768 = uStack_3d28;
    uStack_3760 = uStack_3d20;
    uStack_3758 = uStack_3d18;
    uStack_3750 = uStack_3d10;
    uStack_3748 = uStack_3d08;
    local_37c0[0] = 0.6933594;
    local_37c0[1] = 0.6933594;
    afStack_37b8[0] = 0.6933594;
    afStack_37b8[1] = 0.6933594;
    afStack_37b0[0] = 0.6933594;
    afStack_37b0[1] = 0.6933594;
    afStack_37a8[0] = 0.6933594;
    afStack_37a8[1] = 0.6933594;
    afStack_37a0[0] = 0.6933594;
    afStack_37a0[1] = 0.6933594;
    afStack_3798[0] = 0.6933594;
    afStack_3798[1] = 0.6933594;
    afStack_3790[0] = 0.6933594;
    afStack_3790[1] = 0.6933594;
    afStack_3788[0] = 0.6933594;
    afStack_3788[1] = 0.6933594;
    local_3c40._0_8_ = auVar153._0_8_;
    local_3800 = local_3c40._0_8_;
    local_3c40._8_8_ = auVar153._8_8_;
    uStack_37f8 = local_3c40._8_8_;
    local_3c40._16_8_ = auVar153._16_8_;
    uStack_37f0 = local_3c40._16_8_;
    local_3c40._24_8_ = auVar153._24_8_;
    uStack_37e8 = local_3c40._24_8_;
    local_3c40._32_8_ = auVar153._32_8_;
    uStack_37e0 = local_3c40._32_8_;
    local_3c40._40_8_ = auVar153._40_8_;
    uStack_37d8 = local_3c40._40_8_;
    local_3c40._48_8_ = auVar153._48_8_;
    uStack_37d0 = local_3c40._48_8_;
    local_3c40._56_8_ = auVar153._56_8_;
    uStack_37c8 = local_3c40._56_8_;
    auVar44._16_8_ = uStack_3d30;
    auVar44._0_16_ = local_3d40;
    auVar44._24_8_ = uStack_3d28;
    auVar44._32_8_ = uStack_3d20;
    auVar44._40_8_ = uStack_3d18;
    auVar44._48_8_ = uStack_3d10;
    auVar44._56_8_ = uStack_3d08;
    auVar43._8_4_ = 0.6933594;
    auVar43._12_4_ = 0.6933594;
    auVar43._0_4_ = 0.6933594;
    auVar43._4_4_ = 0.6933594;
    auVar43._16_4_ = 0.6933594;
    auVar43._20_4_ = 0.6933594;
    auVar43._24_4_ = 0.6933594;
    auVar43._28_4_ = 0.6933594;
    auVar43._32_4_ = 0.6933594;
    auVar43._36_4_ = 0.6933594;
    auVar43._40_4_ = 0.6933594;
    auVar43._44_4_ = 0.6933594;
    auVar43._48_4_ = 0.6933594;
    auVar43._52_4_ = 0.6933594;
    auVar43._56_4_ = 0.6933594;
    auVar43._60_4_ = 0.6933594;
    local_3c40 = vfmadd213ps_avx512f(auVar43,auVar44,auVar153);
    local_2280 = local_3c40._0_8_;
    uStack_2278 = local_3c40._8_8_;
    uStack_2270 = local_3c40._16_8_;
    uStack_2268 = local_3c40._24_8_;
    uStack_2260 = local_3c40._32_8_;
    uStack_2258 = local_3c40._40_8_;
    uStack_2250 = local_3c40._48_8_;
    uStack_2248 = local_3c40._56_8_;
    auVar153 = vpmovm2d_avx512dq(uVar20 & 0xffff);
    local_24c0 = vmovdqa64_avx512f(auVar153);
    auVar153 = vmovdqa64_avx512f(local_24c0);
    local_22c0 = vmovdqa64_avx512f(auVar153);
    auVar153 = vmovdqa64_avx512f(local_3c40);
    auVar152 = vmovdqa64_avx512f(local_22c0);
    auVar153 = vpord_avx512f(auVar153,auVar152);
    _local_3e40 = vmovdqa64_avx512f(auVar153);
    local_4340 = local_3e40;
    uStack_4338 = uStack_3e38;
    uStack_4330 = uStack_3e30;
    uStack_4328 = uStack_3e28;
    uStack_4320 = uStack_3e20;
    uStack_4318 = uStack_3e18;
    uStack_4310 = uStack_3e10;
    uStack_4308 = uStack_3e08;
    auVar153 = vmulps_avx512f(*local_4520,_local_3e40);
    local_3840 = 0;
    uStack_3838 = 0;
    uStack_3830 = 0;
    uStack_3828 = 0;
    uStack_3820 = 0;
    uStack_3818 = 0;
    uStack_3810 = 0;
    uStack_3808 = 0;
    local_4200[0] = 1.0;
    local_4200[1] = 1.0;
    afStack_41f8[0] = 1.0;
    afStack_41f8[1] = 1.0;
    afStack_41f0[0] = 1.0;
    afStack_41f0[1] = 1.0;
    afStack_41e8[0] = 1.0;
    afStack_41e8[1] = 1.0;
    afStack_41e0[0] = 1.0;
    afStack_41e0[1] = 1.0;
    afStack_41d8[0] = 1.0;
    afStack_41d8[1] = 1.0;
    afStack_41d0[0] = 1.0;
    afStack_41d0[1] = 1.0;
    afStack_41c8[0] = 1.0;
    afStack_41c8[1] = 1.0;
    local_4100._0_8_ = auVar153._0_8_;
    local_3e80 = local_4100._0_8_;
    local_4100._8_8_ = auVar153._8_8_;
    uStack_3e78 = local_4100._8_8_;
    local_4100._16_8_ = auVar153._16_8_;
    uStack_3e70 = local_4100._16_8_;
    local_4100._24_8_ = auVar153._24_8_;
    uStack_3e68 = local_4100._24_8_;
    local_4100._32_8_ = auVar153._32_8_;
    uStack_3e60 = local_4100._32_8_;
    local_4100._40_8_ = auVar153._40_8_;
    uStack_3e58 = local_4100._40_8_;
    local_4100._48_8_ = auVar153._48_8_;
    uStack_3e50 = local_4100._48_8_;
    local_4100._56_8_ = auVar153._56_8_;
    uStack_3e48 = local_4100._56_8_;
    local_3ec0[0] = 88.37626;
    local_3ec0[1] = 88.37626;
    afStack_3eb8[0] = 88.37626;
    afStack_3eb8[1] = 88.37626;
    afStack_3eb0[0] = 88.37626;
    afStack_3eb0[1] = 88.37626;
    afStack_3ea8[0] = 88.37626;
    afStack_3ea8[1] = 88.37626;
    afStack_3ea0[0] = 88.37626;
    afStack_3ea0[1] = 88.37626;
    afStack_3e98[0] = 88.37626;
    afStack_3e98[1] = 88.37626;
    afStack_3e90[0] = 88.37626;
    afStack_3e90[1] = 88.37626;
    afStack_3e88[0] = 88.37626;
    afStack_3e88[1] = 88.37626;
    auVar154._8_4_ = 88.37626;
    auVar154._12_4_ = 88.37626;
    auVar154._0_4_ = 88.37626;
    auVar154._4_4_ = 88.37626;
    auVar154._16_4_ = 88.37626;
    auVar154._20_4_ = 88.37626;
    auVar154._24_4_ = 88.37626;
    auVar154._28_4_ = 88.37626;
    auVar154._32_4_ = 88.37626;
    auVar154._36_4_ = 88.37626;
    auVar154._40_4_ = 88.37626;
    auVar154._44_4_ = 88.37626;
    auVar154._48_4_ = 88.37626;
    auVar154._52_4_ = 88.37626;
    auVar154._56_4_ = 88.37626;
    auVar154._60_4_ = 88.37626;
    auVar153 = vminps_avx512f(auVar153,auVar154);
    local_4100._0_8_ = auVar153._0_8_;
    local_3f00 = local_4100._0_8_;
    local_4100._8_8_ = auVar153._8_8_;
    uStack_3ef8 = local_4100._8_8_;
    local_4100._16_8_ = auVar153._16_8_;
    uStack_3ef0 = local_4100._16_8_;
    local_4100._24_8_ = auVar153._24_8_;
    uStack_3ee8 = local_4100._24_8_;
    local_4100._32_8_ = auVar153._32_8_;
    uStack_3ee0 = local_4100._32_8_;
    local_4100._40_8_ = auVar153._40_8_;
    uStack_3ed8 = local_4100._40_8_;
    local_4100._48_8_ = auVar153._48_8_;
    uStack_3ed0 = local_4100._48_8_;
    local_4100._56_8_ = auVar153._56_8_;
    uStack_3ec8 = local_4100._56_8_;
    local_3f40[0] = -88.37626;
    local_3f40[1] = -88.37626;
    afStack_3f38[0] = -88.37626;
    afStack_3f38[1] = -88.37626;
    afStack_3f30[0] = -88.37626;
    afStack_3f30[1] = -88.37626;
    afStack_3f28[0] = -88.37626;
    afStack_3f28[1] = -88.37626;
    afStack_3f20[0] = -88.37626;
    afStack_3f20[1] = -88.37626;
    afStack_3f18[0] = -88.37626;
    afStack_3f18[1] = -88.37626;
    afStack_3f10[0] = -88.37626;
    afStack_3f10[1] = -88.37626;
    afStack_3f08[0] = -88.37626;
    afStack_3f08[1] = -88.37626;
    auVar152._8_4_ = -88.37626;
    auVar152._12_4_ = -88.37626;
    auVar152._0_4_ = -88.37626;
    auVar152._4_4_ = -88.37626;
    auVar152._16_4_ = -88.37626;
    auVar152._20_4_ = -88.37626;
    auVar152._24_4_ = -88.37626;
    auVar152._28_4_ = -88.37626;
    auVar152._32_4_ = -88.37626;
    auVar152._36_4_ = -88.37626;
    auVar152._40_4_ = -88.37626;
    auVar152._44_4_ = -88.37626;
    auVar152._48_4_ = -88.37626;
    auVar152._52_4_ = -88.37626;
    auVar152._56_4_ = -88.37626;
    auVar152._60_4_ = -88.37626;
    auVar153 = vmaxps_avx512f(auVar153,auVar152);
    local_4100._0_8_ = auVar153._0_8_;
    local_2b80 = local_4100._0_8_;
    local_4100._8_8_ = auVar153._8_8_;
    uStack_2b78 = local_4100._8_8_;
    local_4100._16_8_ = auVar153._16_8_;
    uStack_2b70 = local_4100._16_8_;
    local_4100._24_8_ = auVar153._24_8_;
    uStack_2b68 = local_4100._24_8_;
    local_4100._32_8_ = auVar153._32_8_;
    uStack_2b60 = local_4100._32_8_;
    local_4100._40_8_ = auVar153._40_8_;
    uStack_2b58 = local_4100._40_8_;
    local_4100._48_8_ = auVar153._48_8_;
    uStack_2b50 = local_4100._48_8_;
    local_4100._56_8_ = auVar153._56_8_;
    uStack_2b48 = local_4100._56_8_;
    local_2bc0[0] = 1.442695;
    local_2bc0[1] = 1.442695;
    afStack_2bb8[0] = 1.442695;
    afStack_2bb8[1] = 1.442695;
    afStack_2bb0[0] = 1.442695;
    afStack_2bb0[1] = 1.442695;
    afStack_2ba8[0] = 1.442695;
    afStack_2ba8[1] = 1.442695;
    afStack_2ba0[0] = 1.442695;
    afStack_2ba0[1] = 1.442695;
    afStack_2b98[0] = 1.442695;
    afStack_2b98[1] = 1.442695;
    afStack_2b90[0] = 1.442695;
    afStack_2b90[1] = 1.442695;
    afStack_2b88[0] = 1.442695;
    afStack_2b88[1] = 1.442695;
    local_2c00[0] = 0.5;
    local_2c00[1] = 0.5;
    afStack_2bf8[0] = 0.5;
    afStack_2bf8[1] = 0.5;
    afStack_2bf0[0] = 0.5;
    afStack_2bf0[1] = 0.5;
    afStack_2be8[0] = 0.5;
    afStack_2be8[1] = 0.5;
    afStack_2be0[0] = 0.5;
    afStack_2be0[1] = 0.5;
    afStack_2bd8[0] = 0.5;
    afStack_2bd8[1] = 0.5;
    afStack_2bd0[0] = 0.5;
    afStack_2bd0[1] = 0.5;
    afStack_2bc8[0] = 0.5;
    afStack_2bc8[1] = 0.5;
    auVar71._8_4_ = 1.442695;
    auVar71._12_4_ = 1.442695;
    auVar71._0_4_ = 1.442695;
    auVar71._4_4_ = 1.442695;
    auVar71._16_4_ = 1.442695;
    auVar71._20_4_ = 1.442695;
    auVar71._24_4_ = 1.442695;
    auVar71._28_4_ = 1.442695;
    auVar71._32_4_ = 1.442695;
    auVar71._36_4_ = 1.442695;
    auVar71._40_4_ = 1.442695;
    auVar71._44_4_ = 1.442695;
    auVar71._48_4_ = 1.442695;
    auVar71._52_4_ = 1.442695;
    auVar71._56_4_ = 1.442695;
    auVar71._60_4_ = 1.442695;
    auVar70._8_4_ = 0.5;
    auVar70._12_4_ = 0.5;
    auVar70._0_4_ = 0.5;
    auVar70._4_4_ = 0.5;
    auVar70._16_4_ = 0.5;
    auVar70._20_4_ = 0.5;
    auVar70._24_4_ = 0.5;
    auVar70._28_4_ = 0.5;
    auVar70._32_4_ = 0.5;
    auVar70._36_4_ = 0.5;
    auVar70._40_4_ = 0.5;
    auVar70._44_4_ = 0.5;
    auVar70._48_4_ = 0.5;
    auVar70._52_4_ = 0.5;
    auVar70._56_4_ = 0.5;
    auVar70._60_4_ = 0.5;
    auVar152 = vfmadd213ps_avx512f(auVar71,auVar153,auVar70);
    auVar154 = vrndscaleps_avx512f(auVar152,1);
    uVar21 = vcmpps_avx512f(auVar152,auVar154,1);
    local_4202 = (ushort)uVar21;
    local_4140._0_8_ = auVar154._0_8_;
    local_2980 = local_4140._0_8_;
    local_4140._8_8_ = auVar154._8_8_;
    uStack_2978 = local_4140._8_8_;
    local_4140._16_8_ = auVar154._16_8_;
    uStack_2970 = local_4140._16_8_;
    local_4140._24_8_ = auVar154._24_8_;
    uStack_2968 = local_4140._24_8_;
    local_4140._32_8_ = auVar154._32_8_;
    uStack_2960 = local_4140._32_8_;
    local_4140._40_8_ = auVar154._40_8_;
    uStack_2958 = local_4140._40_8_;
    local_4140._48_8_ = auVar154._48_8_;
    uStack_2950 = local_4140._48_8_;
    local_4140._56_8_ = auVar154._56_8_;
    uStack_2948 = local_4140._56_8_;
    local_29c0[0] = 1.0;
    local_29c0[1] = 1.0;
    afStack_29b8[0] = 1.0;
    afStack_29b8[1] = 1.0;
    afStack_29b0[0] = 1.0;
    afStack_29b0[1] = 1.0;
    afStack_29a8[0] = 1.0;
    afStack_29a8[1] = 1.0;
    afStack_29a0[0] = 1.0;
    afStack_29a0[1] = 1.0;
    afStack_2998[0] = 1.0;
    afStack_2998[1] = 1.0;
    afStack_2990[0] = 1.0;
    afStack_2990[1] = 1.0;
    afStack_2988[0] = 1.0;
    afStack_2988[1] = 1.0;
    local_2880 = local_4140._0_8_;
    uStack_2878 = local_4140._8_8_;
    uStack_2870 = local_4140._16_8_;
    uStack_2868 = local_4140._24_8_;
    uStack_2860 = local_4140._32_8_;
    uStack_2858 = local_4140._40_8_;
    uStack_2850 = local_4140._48_8_;
    uStack_2848 = local_4140._56_8_;
    local_28c0[0] = 1.0;
    local_28c0[1] = 1.0;
    afStack_28b8[0] = 1.0;
    afStack_28b8[1] = 1.0;
    afStack_28b0[0] = 1.0;
    afStack_28b0[1] = 1.0;
    afStack_28a8[0] = 1.0;
    afStack_28a8[1] = 1.0;
    afStack_28a0[0] = 1.0;
    afStack_28a0[1] = 1.0;
    afStack_2898[0] = 1.0;
    afStack_2898[1] = 1.0;
    afStack_2890[0] = 1.0;
    afStack_2890[1] = 1.0;
    afStack_2888[0] = 1.0;
    afStack_2888[1] = 1.0;
    auVar73._8_4_ = 1.0;
    auVar73._12_4_ = 1.0;
    auVar73._0_4_ = 1.0;
    auVar73._4_4_ = 1.0;
    auVar73._16_4_ = 1.0;
    auVar73._20_4_ = 1.0;
    auVar73._24_4_ = 1.0;
    auVar73._28_4_ = 1.0;
    auVar73._32_4_ = 1.0;
    auVar73._36_4_ = 1.0;
    auVar73._40_4_ = 1.0;
    auVar73._44_4_ = 1.0;
    auVar73._48_4_ = 1.0;
    auVar73._52_4_ = 1.0;
    auVar73._56_4_ = 1.0;
    auVar73._60_4_ = 1.0;
    local_2900._0_4_ = auVar154._0_4_;
    local_2900._4_4_ = auVar154._4_4_;
    uStack_28f8._0_4_ = auVar154._8_4_;
    uStack_28f8._4_4_ = auVar154._12_4_;
    uStack_28f0._0_4_ = auVar154._16_4_;
    uStack_28f0._4_4_ = auVar154._20_4_;
    uStack_28e8._0_4_ = auVar154._24_4_;
    uStack_28e8._4_4_ = auVar154._28_4_;
    uStack_28e0._0_4_ = auVar154._32_4_;
    uStack_28e0._4_4_ = auVar154._36_4_;
    uStack_28d8._0_4_ = auVar154._40_4_;
    uStack_28d8._4_4_ = auVar154._44_4_;
    uStack_28d0._0_4_ = auVar154._48_4_;
    uStack_28d0._4_4_ = auVar154._52_4_;
    uStack_28c8._0_4_ = auVar154._56_4_;
    uStack_28c8._4_4_ = auVar154._60_4_;
    auVar152 = vsubps_avx512f(auVar154,auVar73);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_4202 >> 1) & 1);
    bVar3 = (bool)((byte)(local_4202 >> 2) & 1);
    bVar4 = (bool)((byte)(local_4202 >> 3) & 1);
    bVar5 = (bool)((byte)(local_4202 >> 4) & 1);
    bVar6 = (bool)((byte)(local_4202 >> 5) & 1);
    bVar7 = (bool)((byte)(local_4202 >> 6) & 1);
    bVar8 = (bool)((byte)(local_4202 >> 7) & 1);
    bVar9 = (byte)((ulong)uVar21 >> 8);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_4180._4_4_ = (uint)bVar2 * auVar152._4_4_ | (uint)!bVar2 * local_2900._4_4_;
    local_4180._0_4_ = (uint)bVar1 * auVar152._0_4_ | (uint)!bVar1 * (int)local_2900;
    local_4180._8_4_ = (uint)bVar3 * auVar152._8_4_ | (uint)!bVar3 * (int)uStack_28f8;
    local_4180._12_4_ = (uint)bVar4 * auVar152._12_4_ | (uint)!bVar4 * uStack_28f8._4_4_;
    uStack_4170._0_4_ = (uint)bVar5 * auVar152._16_4_ | (uint)!bVar5 * (int)uStack_28f0;
    uStack_4170._4_4_ = (uint)bVar6 * auVar152._20_4_ | (uint)!bVar6 * uStack_28f0._4_4_;
    auVar145 = _local_4180;
    uStack_4168._0_4_ = (uint)bVar7 * auVar152._24_4_ | (uint)!bVar7 * (int)uStack_28e8;
    uStack_4168._4_4_ = (uint)bVar8 * auVar152._28_4_ | (uint)!bVar8 * uStack_28e8._4_4_;
    auVar16 = _local_4180;
    uStack_4160._0_4_ =
         (uint)(bVar9 & 1) * auVar152._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_28e0;
    uStack_4160._4_4_ = (uint)bVar10 * auVar152._36_4_ | (uint)!bVar10 * uStack_28e0._4_4_;
    auVar146 = _local_4180;
    uStack_4158._0_4_ = (uint)bVar11 * auVar152._40_4_ | (uint)!bVar11 * (int)uStack_28d8;
    uStack_4158._4_4_ = (uint)bVar12 * auVar152._44_4_ | (uint)!bVar12 * uStack_28d8._4_4_;
    auVar144 = _local_4180;
    uStack_4150._0_4_ = (uint)bVar13 * auVar152._48_4_ | (uint)!bVar13 * (int)uStack_28d0;
    uStack_4150._4_4_ = (uint)bVar14 * auVar152._52_4_ | (uint)!bVar14 * uStack_28d0._4_4_;
    auVar147 = _local_4180;
    uStack_4148._0_4_ = (uint)bVar15 * auVar152._56_4_ | (uint)!bVar15 * (int)uStack_28c8;
    uStack_4148._4_4_ =
         (uint)(bVar9 >> 7) * auVar152._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_28c8._4_4_;
    auVar152 = _local_4180;
    local_2640 = local_4180._0_8_;
    uStack_2638 = local_4180._8_8_;
    uStack_4170 = auVar145._16_8_;
    uStack_2630 = uStack_4170;
    uStack_4168 = auVar16._24_8_;
    uStack_2628 = uStack_4168;
    uStack_4160 = auVar146._32_8_;
    uStack_2620 = uStack_4160;
    uStack_4158 = auVar144._40_8_;
    uStack_2618 = uStack_4158;
    uStack_4150 = auVar147._48_8_;
    uStack_2610 = uStack_4150;
    uStack_4148 = auVar152._56_8_;
    uStack_2608 = uStack_4148;
    local_2680[0] = 0.6933594;
    local_2680[1] = 0.6933594;
    afStack_2678[0] = 0.6933594;
    afStack_2678[1] = 0.6933594;
    afStack_2670[0] = 0.6933594;
    afStack_2670[1] = 0.6933594;
    afStack_2668[0] = 0.6933594;
    afStack_2668[1] = 0.6933594;
    afStack_2660[0] = 0.6933594;
    afStack_2660[1] = 0.6933594;
    afStack_2658[0] = 0.6933594;
    afStack_2658[1] = 0.6933594;
    afStack_2650[0] = 0.6933594;
    afStack_2650[1] = 0.6933594;
    afStack_2648[0] = 0.6933594;
    afStack_2648[1] = 0.6933594;
    local_26c0 = local_4100._0_8_;
    uStack_26b8 = local_4100._8_8_;
    uStack_26b0 = local_4100._16_8_;
    uStack_26a8 = local_4100._24_8_;
    uStack_26a0 = local_4100._32_8_;
    uStack_2698 = local_4100._40_8_;
    uStack_2690 = local_4100._48_8_;
    uStack_2688 = local_4100._56_8_;
    auVar78._16_8_ = uStack_4170;
    auVar78._0_16_ = local_4180;
    auVar78._24_8_ = uStack_4168;
    auVar78._32_8_ = uStack_4160;
    auVar78._40_8_ = uStack_4158;
    auVar78._48_8_ = uStack_4150;
    auVar78._56_8_ = uStack_4148;
    auVar77._8_4_ = 0.6933594;
    auVar77._12_4_ = 0.6933594;
    auVar77._0_4_ = 0.6933594;
    auVar77._4_4_ = 0.6933594;
    auVar77._16_4_ = 0.6933594;
    auVar77._20_4_ = 0.6933594;
    auVar77._24_4_ = 0.6933594;
    auVar77._28_4_ = 0.6933594;
    auVar77._32_4_ = 0.6933594;
    auVar77._36_4_ = 0.6933594;
    auVar77._40_4_ = 0.6933594;
    auVar77._44_4_ = 0.6933594;
    auVar77._48_4_ = 0.6933594;
    auVar77._52_4_ = 0.6933594;
    auVar77._56_4_ = 0.6933594;
    auVar77._60_4_ = 0.6933594;
    auVar153 = vfnmadd213ps_avx512f(auVar77,auVar78,auVar153);
    local_2700 = local_4180._0_8_;
    uStack_26f8 = local_4180._8_8_;
    uStack_26f0 = uStack_4170;
    uStack_26e8 = uStack_4168;
    uStack_26e0 = uStack_4160;
    uStack_26d8 = uStack_4158;
    uStack_26d0 = uStack_4150;
    uStack_26c8 = uStack_4148;
    local_2740[0] = -0.00021219444;
    local_2740[1] = -0.00021219444;
    afStack_2738[0] = -0.00021219444;
    afStack_2738[1] = -0.00021219444;
    afStack_2730[0] = -0.00021219444;
    afStack_2730[1] = -0.00021219444;
    afStack_2728[0] = -0.00021219444;
    afStack_2728[1] = -0.00021219444;
    afStack_2720[0] = -0.00021219444;
    afStack_2720[1] = -0.00021219444;
    afStack_2718[0] = -0.00021219444;
    afStack_2718[1] = -0.00021219444;
    afStack_2710[0] = -0.00021219444;
    afStack_2710[1] = -0.00021219444;
    afStack_2708[0] = -0.00021219444;
    afStack_2708[1] = -0.00021219444;
    local_4100._0_8_ = auVar153._0_8_;
    local_2780 = local_4100._0_8_;
    local_4100._8_8_ = auVar153._8_8_;
    uStack_2778 = local_4100._8_8_;
    local_4100._16_8_ = auVar153._16_8_;
    uStack_2770 = local_4100._16_8_;
    local_4100._24_8_ = auVar153._24_8_;
    uStack_2768 = local_4100._24_8_;
    local_4100._32_8_ = auVar153._32_8_;
    uStack_2760 = local_4100._32_8_;
    local_4100._40_8_ = auVar153._40_8_;
    uStack_2758 = local_4100._40_8_;
    local_4100._48_8_ = auVar153._48_8_;
    uStack_2750 = local_4100._48_8_;
    local_4100._56_8_ = auVar153._56_8_;
    uStack_2748 = local_4100._56_8_;
    auVar76._16_8_ = uStack_4170;
    auVar76._0_16_ = local_4180;
    auVar76._24_8_ = uStack_4168;
    auVar76._32_8_ = uStack_4160;
    auVar76._40_8_ = uStack_4158;
    auVar76._48_8_ = uStack_4150;
    auVar76._56_8_ = uStack_4148;
    auVar75._8_4_ = -0.00021219444;
    auVar75._12_4_ = -0.00021219444;
    auVar75._0_4_ = -0.00021219444;
    auVar75._4_4_ = -0.00021219444;
    auVar75._16_4_ = -0.00021219444;
    auVar75._20_4_ = -0.00021219444;
    auVar75._24_4_ = -0.00021219444;
    auVar75._28_4_ = -0.00021219444;
    auVar75._32_4_ = -0.00021219444;
    auVar75._36_4_ = -0.00021219444;
    auVar75._40_4_ = -0.00021219444;
    auVar75._44_4_ = -0.00021219444;
    auVar75._48_4_ = -0.00021219444;
    auVar75._52_4_ = -0.00021219444;
    auVar75._56_4_ = -0.00021219444;
    auVar75._60_4_ = -0.00021219444;
    local_4100 = vfnmadd213ps_avx512f(auVar75,auVar76,auVar153);
    local_3fc0 = local_4100._0_8_;
    uStack_3fb8 = local_4100._8_8_;
    uStack_3fb0 = local_4100._16_8_;
    uStack_3fa8 = local_4100._24_8_;
    uStack_3fa0 = local_4100._32_8_;
    uStack_3f98 = local_4100._40_8_;
    uStack_3f90 = local_4100._48_8_;
    uStack_3f88 = local_4100._56_8_;
    local_4140 = vmulps_avx512f(local_4100,local_4100);
    uStack_4278._0_4_ = 0.00019875691;
    uStack_4278._4_4_ = 0.00019875691;
    local_4280._0_4_ = 0.00019875691;
    local_4280._4_4_ = 0.00019875691;
    local_2c40[0] = 0.00019875691;
    local_2c40[1] = 0.00019875691;
    afStack_2c38[0] = 0.00019875691;
    afStack_2c38[1] = 0.00019875691;
    afStack_2c30[0] = 0.00019875691;
    afStack_2c30[1] = 0.00019875691;
    afStack_2c28[0] = 0.00019875691;
    afStack_2c28[1] = 0.00019875691;
    afStack_2c20[0] = 0.00019875691;
    afStack_2c20[1] = 0.00019875691;
    afStack_2c18[0] = 0.00019875691;
    afStack_2c18[1] = 0.00019875691;
    afStack_2c10[0] = 0.00019875691;
    afStack_2c10[1] = 0.00019875691;
    afStack_2c08[0] = 0.00019875691;
    afStack_2c08[1] = 0.00019875691;
    local_2c80 = local_4100._0_8_;
    uStack_2c78 = local_4100._8_8_;
    uStack_2c70 = local_4100._16_8_;
    uStack_2c68 = local_4100._24_8_;
    uStack_2c60 = local_4100._32_8_;
    uStack_2c58 = local_4100._40_8_;
    uStack_2c50 = local_4100._48_8_;
    uStack_2c48 = local_4100._56_8_;
    local_2cc0[0] = 0.0013981999;
    local_2cc0[1] = 0.0013981999;
    afStack_2cb8[0] = 0.0013981999;
    afStack_2cb8[1] = 0.0013981999;
    afStack_2cb0[0] = 0.0013981999;
    afStack_2cb0[1] = 0.0013981999;
    afStack_2ca8[0] = 0.0013981999;
    afStack_2ca8[1] = 0.0013981999;
    afStack_2ca0[0] = 0.0013981999;
    afStack_2ca0[1] = 0.0013981999;
    afStack_2c98[0] = 0.0013981999;
    afStack_2c98[1] = 0.0013981999;
    afStack_2c90[0] = 0.0013981999;
    afStack_2c90[1] = 0.0013981999;
    afStack_2c88[0] = 0.0013981999;
    afStack_2c88[1] = 0.0013981999;
    auVar69._16_4_ = 0.00019875691;
    auVar69._20_4_ = 0.00019875691;
    auVar69._0_16_ = _local_4280;
    auVar69._24_4_ = 0.00019875691;
    auVar69._28_4_ = 0.00019875691;
    auVar69._32_4_ = 0.00019875691;
    auVar69._36_4_ = 0.00019875691;
    auVar69._40_4_ = 0.00019875691;
    auVar69._44_4_ = 0.00019875691;
    auVar69._48_4_ = 0.00019875691;
    auVar69._52_4_ = 0.00019875691;
    auVar69._56_4_ = 0.00019875691;
    auVar69._60_4_ = 0.00019875691;
    auVar68._8_4_ = 0.0013981999;
    auVar68._12_4_ = 0.0013981999;
    auVar68._0_4_ = 0.0013981999;
    auVar68._4_4_ = 0.0013981999;
    auVar68._16_4_ = 0.0013981999;
    auVar68._20_4_ = 0.0013981999;
    auVar68._24_4_ = 0.0013981999;
    auVar68._28_4_ = 0.0013981999;
    auVar68._32_4_ = 0.0013981999;
    auVar68._36_4_ = 0.0013981999;
    auVar68._40_4_ = 0.0013981999;
    auVar68._44_4_ = 0.0013981999;
    auVar68._48_4_ = 0.0013981999;
    auVar68._52_4_ = 0.0013981999;
    auVar68._56_4_ = 0.0013981999;
    auVar68._60_4_ = 0.0013981999;
    auVar153 = vfmadd213ps_avx512f(local_4100,auVar69,auVar68);
    local_4280 = auVar153._0_8_;
    local_2d00 = local_4280;
    uStack_4278 = auVar153._8_8_;
    uStack_2cf8 = uStack_4278;
    uStack_4270 = auVar153._16_8_;
    uStack_2cf0 = uStack_4270;
    uStack_4268 = auVar153._24_8_;
    uStack_2ce8 = uStack_4268;
    uStack_4260 = auVar153._32_8_;
    uStack_2ce0 = uStack_4260;
    uStack_4258 = auVar153._40_8_;
    uStack_2cd8 = uStack_4258;
    uStack_4250 = auVar153._48_8_;
    uStack_2cd0 = uStack_4250;
    uStack_4248 = auVar153._56_8_;
    uStack_2cc8 = uStack_4248;
    local_2d40 = local_4100._0_8_;
    uStack_2d38 = local_4100._8_8_;
    uStack_2d30 = local_4100._16_8_;
    uStack_2d28 = local_4100._24_8_;
    uStack_2d20 = local_4100._32_8_;
    uStack_2d18 = local_4100._40_8_;
    uStack_2d10 = local_4100._48_8_;
    uStack_2d08 = local_4100._56_8_;
    local_2d80[0] = 0.008333452;
    local_2d80[1] = 0.008333452;
    afStack_2d78[0] = 0.008333452;
    afStack_2d78[1] = 0.008333452;
    afStack_2d70[0] = 0.008333452;
    afStack_2d70[1] = 0.008333452;
    afStack_2d68[0] = 0.008333452;
    afStack_2d68[1] = 0.008333452;
    afStack_2d60[0] = 0.008333452;
    afStack_2d60[1] = 0.008333452;
    afStack_2d58[0] = 0.008333452;
    afStack_2d58[1] = 0.008333452;
    afStack_2d50[0] = 0.008333452;
    afStack_2d50[1] = 0.008333452;
    afStack_2d48[0] = 0.008333452;
    afStack_2d48[1] = 0.008333452;
    auVar67._8_4_ = 0.008333452;
    auVar67._12_4_ = 0.008333452;
    auVar67._0_4_ = 0.008333452;
    auVar67._4_4_ = 0.008333452;
    auVar67._16_4_ = 0.008333452;
    auVar67._20_4_ = 0.008333452;
    auVar67._24_4_ = 0.008333452;
    auVar67._28_4_ = 0.008333452;
    auVar67._32_4_ = 0.008333452;
    auVar67._36_4_ = 0.008333452;
    auVar67._40_4_ = 0.008333452;
    auVar67._44_4_ = 0.008333452;
    auVar67._48_4_ = 0.008333452;
    auVar67._52_4_ = 0.008333452;
    auVar67._56_4_ = 0.008333452;
    auVar67._60_4_ = 0.008333452;
    auVar153 = vfmadd213ps_avx512f(local_4100,auVar153,auVar67);
    local_4280 = auVar153._0_8_;
    local_2dc0 = local_4280;
    uStack_4278 = auVar153._8_8_;
    uStack_2db8 = uStack_4278;
    uStack_4270 = auVar153._16_8_;
    uStack_2db0 = uStack_4270;
    uStack_4268 = auVar153._24_8_;
    uStack_2da8 = uStack_4268;
    uStack_4260 = auVar153._32_8_;
    uStack_2da0 = uStack_4260;
    uStack_4258 = auVar153._40_8_;
    uStack_2d98 = uStack_4258;
    uStack_4250 = auVar153._48_8_;
    uStack_2d90 = uStack_4250;
    uStack_4248 = auVar153._56_8_;
    uStack_2d88 = uStack_4248;
    local_2e00 = local_4100._0_8_;
    uStack_2df8 = local_4100._8_8_;
    uStack_2df0 = local_4100._16_8_;
    uStack_2de8 = local_4100._24_8_;
    uStack_2de0 = local_4100._32_8_;
    uStack_2dd8 = local_4100._40_8_;
    uStack_2dd0 = local_4100._48_8_;
    uStack_2dc8 = local_4100._56_8_;
    local_2e40[0] = 0.041665796;
    local_2e40[1] = 0.041665796;
    afStack_2e38[0] = 0.041665796;
    afStack_2e38[1] = 0.041665796;
    afStack_2e30[0] = 0.041665796;
    afStack_2e30[1] = 0.041665796;
    afStack_2e28[0] = 0.041665796;
    afStack_2e28[1] = 0.041665796;
    afStack_2e20[0] = 0.041665796;
    afStack_2e20[1] = 0.041665796;
    afStack_2e18[0] = 0.041665796;
    afStack_2e18[1] = 0.041665796;
    afStack_2e10[0] = 0.041665796;
    afStack_2e10[1] = 0.041665796;
    afStack_2e08[0] = 0.041665796;
    afStack_2e08[1] = 0.041665796;
    auVar66._8_4_ = 0.041665796;
    auVar66._12_4_ = 0.041665796;
    auVar66._0_4_ = 0.041665796;
    auVar66._4_4_ = 0.041665796;
    auVar66._16_4_ = 0.041665796;
    auVar66._20_4_ = 0.041665796;
    auVar66._24_4_ = 0.041665796;
    auVar66._28_4_ = 0.041665796;
    auVar66._32_4_ = 0.041665796;
    auVar66._36_4_ = 0.041665796;
    auVar66._40_4_ = 0.041665796;
    auVar66._44_4_ = 0.041665796;
    auVar66._48_4_ = 0.041665796;
    auVar66._52_4_ = 0.041665796;
    auVar66._56_4_ = 0.041665796;
    auVar66._60_4_ = 0.041665796;
    auVar153 = vfmadd213ps_avx512f(local_4100,auVar153,auVar66);
    local_4280 = auVar153._0_8_;
    local_2e80 = local_4280;
    uStack_4278 = auVar153._8_8_;
    uStack_2e78 = uStack_4278;
    uStack_4270 = auVar153._16_8_;
    uStack_2e70 = uStack_4270;
    uStack_4268 = auVar153._24_8_;
    uStack_2e68 = uStack_4268;
    uStack_4260 = auVar153._32_8_;
    uStack_2e60 = uStack_4260;
    uStack_4258 = auVar153._40_8_;
    uStack_2e58 = uStack_4258;
    uStack_4250 = auVar153._48_8_;
    uStack_2e50 = uStack_4250;
    uStack_4248 = auVar153._56_8_;
    uStack_2e48 = uStack_4248;
    local_2ec0 = local_4100._0_8_;
    uStack_2eb8 = local_4100._8_8_;
    uStack_2eb0 = local_4100._16_8_;
    uStack_2ea8 = local_4100._24_8_;
    uStack_2ea0 = local_4100._32_8_;
    uStack_2e98 = local_4100._40_8_;
    uStack_2e90 = local_4100._48_8_;
    uStack_2e88 = local_4100._56_8_;
    local_2f00[0] = 0.16666666;
    local_2f00[1] = 0.16666666;
    afStack_2ef8[0] = 0.16666666;
    afStack_2ef8[1] = 0.16666666;
    afStack_2ef0[0] = 0.16666666;
    afStack_2ef0[1] = 0.16666666;
    afStack_2ee8[0] = 0.16666666;
    afStack_2ee8[1] = 0.16666666;
    afStack_2ee0[0] = 0.16666666;
    afStack_2ee0[1] = 0.16666666;
    afStack_2ed8[0] = 0.16666666;
    afStack_2ed8[1] = 0.16666666;
    afStack_2ed0[0] = 0.16666666;
    afStack_2ed0[1] = 0.16666666;
    afStack_2ec8[0] = 0.16666666;
    afStack_2ec8[1] = 0.16666666;
    auVar65._8_4_ = 0.16666666;
    auVar65._12_4_ = 0.16666666;
    auVar65._0_4_ = 0.16666666;
    auVar65._4_4_ = 0.16666666;
    auVar65._16_4_ = 0.16666666;
    auVar65._20_4_ = 0.16666666;
    auVar65._24_4_ = 0.16666666;
    auVar65._28_4_ = 0.16666666;
    auVar65._32_4_ = 0.16666666;
    auVar65._36_4_ = 0.16666666;
    auVar65._40_4_ = 0.16666666;
    auVar65._44_4_ = 0.16666666;
    auVar65._48_4_ = 0.16666666;
    auVar65._52_4_ = 0.16666666;
    auVar65._56_4_ = 0.16666666;
    auVar65._60_4_ = 0.16666666;
    auVar153 = vfmadd213ps_avx512f(local_4100,auVar153,auVar65);
    local_4280 = auVar153._0_8_;
    local_2f40 = local_4280;
    uStack_4278 = auVar153._8_8_;
    uStack_2f38 = uStack_4278;
    uStack_4270 = auVar153._16_8_;
    uStack_2f30 = uStack_4270;
    uStack_4268 = auVar153._24_8_;
    uStack_2f28 = uStack_4268;
    uStack_4260 = auVar153._32_8_;
    uStack_2f20 = uStack_4260;
    uStack_4258 = auVar153._40_8_;
    uStack_2f18 = uStack_4258;
    uStack_4250 = auVar153._48_8_;
    uStack_2f10 = uStack_4250;
    uStack_4248 = auVar153._56_8_;
    uStack_2f08 = uStack_4248;
    local_2f80 = local_4100._0_8_;
    uStack_2f78 = local_4100._8_8_;
    uStack_2f70 = local_4100._16_8_;
    uStack_2f68 = local_4100._24_8_;
    uStack_2f60 = local_4100._32_8_;
    uStack_2f58 = local_4100._40_8_;
    uStack_2f50 = local_4100._48_8_;
    uStack_2f48 = local_4100._56_8_;
    local_2fc0[0] = 0.5;
    local_2fc0[1] = 0.5;
    afStack_2fb8[0] = 0.5;
    afStack_2fb8[1] = 0.5;
    afStack_2fb0[0] = 0.5;
    afStack_2fb0[1] = 0.5;
    afStack_2fa8[0] = 0.5;
    afStack_2fa8[1] = 0.5;
    afStack_2fa0[0] = 0.5;
    afStack_2fa0[1] = 0.5;
    afStack_2f98[0] = 0.5;
    afStack_2f98[1] = 0.5;
    afStack_2f90[0] = 0.5;
    afStack_2f90[1] = 0.5;
    afStack_2f88[0] = 0.5;
    afStack_2f88[1] = 0.5;
    auVar64._8_4_ = 0.5;
    auVar64._12_4_ = 0.5;
    auVar64._0_4_ = 0.5;
    auVar64._4_4_ = 0.5;
    auVar64._16_4_ = 0.5;
    auVar64._20_4_ = 0.5;
    auVar64._24_4_ = 0.5;
    auVar64._28_4_ = 0.5;
    auVar64._32_4_ = 0.5;
    auVar64._36_4_ = 0.5;
    auVar64._40_4_ = 0.5;
    auVar64._44_4_ = 0.5;
    auVar64._48_4_ = 0.5;
    auVar64._52_4_ = 0.5;
    auVar64._56_4_ = 0.5;
    auVar64._60_4_ = 0.5;
    auVar153 = vfmadd213ps_avx512f(local_4100,auVar153,auVar64);
    local_4280 = auVar153._0_8_;
    local_3000 = local_4280;
    uStack_4278 = auVar153._8_8_;
    uStack_2ff8 = uStack_4278;
    uStack_4270 = auVar153._16_8_;
    uStack_2ff0 = uStack_4270;
    uStack_4268 = auVar153._24_8_;
    uStack_2fe8 = uStack_4268;
    uStack_4260 = auVar153._32_8_;
    uStack_2fe0 = uStack_4260;
    uStack_4258 = auVar153._40_8_;
    uStack_2fd8 = uStack_4258;
    uStack_4250 = auVar153._48_8_;
    uStack_2fd0 = uStack_4250;
    uStack_4248 = auVar153._56_8_;
    uStack_2fc8 = uStack_4248;
    local_3040 = local_4140._0_8_;
    uStack_3038 = local_4140._8_8_;
    uStack_3030 = local_4140._16_8_;
    uStack_3028 = local_4140._24_8_;
    uStack_3020 = local_4140._32_8_;
    uStack_3018 = local_4140._40_8_;
    uStack_3010 = local_4140._48_8_;
    uStack_3008 = local_4140._56_8_;
    local_3080 = local_4100._0_8_;
    uStack_3078 = local_4100._8_8_;
    uStack_3070 = local_4100._16_8_;
    uStack_3068 = local_4100._24_8_;
    uStack_3060 = local_4100._32_8_;
    uStack_3058 = local_4100._40_8_;
    uStack_3050 = local_4100._48_8_;
    uStack_3048 = local_4100._56_8_;
    auVar154 = vfmadd213ps_avx512f(local_4140,auVar153,local_4100);
    local_4280 = auVar154._0_8_;
    local_4080 = local_4280;
    uStack_4278 = auVar154._8_8_;
    uStack_4078 = uStack_4278;
    uStack_4270 = auVar154._16_8_;
    uStack_4070 = uStack_4270;
    uStack_4268 = auVar154._24_8_;
    uStack_4068 = uStack_4268;
    uStack_4260 = auVar154._32_8_;
    uStack_4060 = uStack_4260;
    uStack_4258 = auVar154._40_8_;
    uStack_4058 = uStack_4258;
    uStack_4250 = auVar154._48_8_;
    uStack_4050 = uStack_4250;
    uStack_4248 = auVar154._56_8_;
    uStack_4048 = uStack_4248;
    local_40c0[0] = 1.0;
    local_40c0[1] = 1.0;
    afStack_40b8[0] = 1.0;
    afStack_40b8[1] = 1.0;
    afStack_40b0[0] = 1.0;
    afStack_40b0[1] = 1.0;
    afStack_40a8[0] = 1.0;
    afStack_40a8[1] = 1.0;
    afStack_40a0[0] = 1.0;
    afStack_40a0[1] = 1.0;
    afStack_4098[0] = 1.0;
    afStack_4098[1] = 1.0;
    afStack_4090[0] = 1.0;
    afStack_4090[1] = 1.0;
    afStack_4088[0] = 1.0;
    afStack_4088[1] = 1.0;
    auVar153._8_4_ = 1.0;
    auVar153._12_4_ = 1.0;
    auVar153._0_4_ = 1.0;
    auVar153._4_4_ = 1.0;
    auVar153._16_4_ = 1.0;
    auVar153._20_4_ = 1.0;
    auVar153._24_4_ = 1.0;
    auVar153._28_4_ = 1.0;
    auVar153._32_4_ = 1.0;
    auVar153._36_4_ = 1.0;
    auVar153._40_4_ = 1.0;
    auVar153._44_4_ = 1.0;
    auVar153._48_4_ = 1.0;
    auVar153._52_4_ = 1.0;
    auVar153._56_4_ = 1.0;
    auVar153._60_4_ = 1.0;
    auVar154 = vaddps_avx512f(auVar154,auVar153);
    local_2600 = local_4180._0_8_;
    uStack_25f8 = local_4180._8_8_;
    uStack_25f0 = uStack_4170;
    uStack_25e8 = uStack_4168;
    uStack_25e0 = uStack_4160;
    uStack_25d8 = uStack_4158;
    uStack_25d0 = uStack_4150;
    uStack_25c8 = uStack_4148;
    auVar79._16_8_ = uStack_4170;
    auVar79._0_16_ = local_4180;
    auVar79._24_8_ = uStack_4168;
    auVar79._32_8_ = uStack_4160;
    auVar79._40_8_ = uStack_4158;
    auVar79._48_8_ = uStack_4150;
    auVar79._56_8_ = uStack_4148;
    local_2440 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    vmovdqa64_avx512f(local_2440);
    auVar153 = vcvttps2dq_avx512f(auVar79);
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar155 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    local_2580 = vmovdqa64_avx512f(auVar153);
    local_25c0 = vmovdqa64_avx512f(auVar155);
    auVar153 = vmovdqa64_avx512f(local_2580);
    auVar155 = vmovdqa64_avx512f(local_25c0);
    auVar153 = vpaddd_avx512f(auVar153,auVar155);
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar153 = vmovdqa64_avx512f(auVar153);
    local_2500 = vmovdqa64_avx512f(auVar153);
    local_2504 = 0x17;
    auVar153 = vmovdqa64_avx512f(local_2500);
    auVar153 = vpslld_avx512f(auVar153,ZEXT416(0x17));
    local_41c0 = vmovdqa64_avx512f(auVar153);
    auVar153 = vmovdqa64_avx512f(local_41c0);
    local_2480 = vmovdqa64_avx512f(auVar153);
    local_42c0 = vmovdqa64_avx512f(local_2480);
    local_4280 = auVar154._0_8_;
    local_4000 = local_4280;
    uStack_4278 = auVar154._8_8_;
    uStack_3ff8 = uStack_4278;
    uStack_4270 = auVar154._16_8_;
    uStack_3ff0 = uStack_4270;
    uStack_4268 = auVar154._24_8_;
    uStack_3fe8 = uStack_4268;
    uStack_4260 = auVar154._32_8_;
    uStack_3fe0 = uStack_4260;
    uStack_4258 = auVar154._40_8_;
    uStack_3fd8 = uStack_4258;
    uStack_4250 = auVar154._48_8_;
    uStack_3fd0 = uStack_4250;
    uStack_4248 = auVar154._56_8_;
    uStack_3fc8 = uStack_4248;
    local_4040 = local_42c0._0_8_;
    uStack_4038 = local_42c0._8_8_;
    uStack_4030 = local_42c0._16_8_;
    uStack_4028 = local_42c0._24_8_;
    uStack_4020 = local_42c0._32_8_;
    uStack_4018 = local_42c0._40_8_;
    uStack_4010 = local_42c0._48_8_;
    uStack_4008 = local_42c0._56_8_;
    _local_4280 = vmulps_avx512f(auVar154,local_42c0);
    local_4600 = local_4280;
    uStack_45f8 = uStack_4278;
    uStack_45f0 = uStack_4270;
    uStack_45e8 = uStack_4268;
    uStack_45e0 = uStack_4260;
    uStack_45d8 = uStack_4258;
    uStack_45d0 = uStack_4250;
    uStack_45c8 = uStack_4248;
    local_4498 = local_4528;
    local_4500 = local_4280;
    uStack_44f8 = uStack_4278;
    uStack_44f0 = uStack_4270;
    uStack_44e8 = uStack_4268;
    uStack_44e0 = uStack_4260;
    uStack_44d8 = uStack_4258;
    uStack_44d0 = uStack_4250;
    uStack_44c8 = uStack_4248;
    *(undefined1 (*) [8])local_4528 = local_4280;
    *(undefined8 *)(local_4528 + 2) = uStack_4278;
    *(undefined8 *)(local_4528 + 4) = uStack_4270;
    *(undefined8 *)(local_4528 + 6) = uStack_4268;
    *(undefined8 *)(local_4528 + 8) = uStack_4260;
    *(undefined8 *)(local_4528 + 10) = uStack_4258;
    *(undefined8 *)(local_4528 + 0xc) = uStack_4250;
    *(undefined8 *)(local_4528 + 0xe) = uStack_4248;
    local_4518 = local_4518 + 1;
    local_4520 = local_4520 + 1;
    local_4528 = local_4528 + 0x10;
    local_43c0 = local_45c0;
    uStack_43b8 = uStack_45b8;
    uStack_43b0 = uStack_45b0;
    uStack_43a8 = uStack_45a8;
    uStack_43a0 = uStack_45a0;
    uStack_4398 = uStack_4598;
    uStack_4390 = uStack_4590;
    uStack_4388 = uStack_4588;
    local_4380 = local_4580;
    uStack_4378 = uStack_4578;
    uStack_4370 = uStack_4570;
    uStack_4368 = uStack_4568;
    uStack_4360 = uStack_4560;
    uStack_4358 = uStack_4558;
    uStack_4350 = uStack_4550;
    uStack_4348 = uStack_4548;
    local_4300 = local_45c0;
    uStack_42f8 = uStack_45b8;
    uStack_42f0 = uStack_45b0;
    uStack_42e8 = uStack_45a8;
    uStack_42e0 = uStack_45a0;
    uStack_42d8 = uStack_4598;
    uStack_42d0 = uStack_4590;
    uStack_42c8 = uStack_4588;
    _local_4180 = auVar152;
    local_3f80 = local_3fc0;
    uStack_3f78 = uStack_3fb8;
    uStack_3f70 = uStack_3fb0;
    uStack_3f68 = uStack_3fa8;
    uStack_3f60 = uStack_3fa0;
    uStack_3f58 = uStack_3f98;
    uStack_3f50 = uStack_3f90;
    uStack_3f48 = uStack_3f88;
    _local_3d40 = auVar37;
    local_3940 = local_3980;
    uStack_3938 = uStack_3978;
    uStack_3930 = uStack_3970;
    uStack_3928 = uStack_3968;
    uStack_3920 = uStack_3960;
    uStack_3918 = uStack_3958;
    uStack_3910 = uStack_3950;
    uStack_3908 = uStack_3948;
    uStack_3890 = uStack_4550;
    uStack_3888 = uStack_4548;
    local_2a82 = local_3d42;
    local_2a80 = local_2b00;
    uStack_2a78 = uStack_2af8;
    uStack_2a70 = uStack_2af0;
    uStack_2a68 = uStack_2ae8;
    uStack_2a60 = uStack_2ae0;
    uStack_2a58 = uStack_2ad8;
    uStack_2a50 = uStack_2ad0;
    uStack_2a48 = uStack_2ac8;
    local_2902 = local_4202;
    local_2900 = local_2980;
    uStack_28f8 = uStack_2978;
    uStack_28f0 = uStack_2970;
    uStack_28e8 = uStack_2968;
    uStack_28e0 = uStack_2960;
    uStack_28d8 = uStack_2958;
    uStack_28d0 = uStack_2950;
    uStack_28c8 = uStack_2948;
    local_2042 = local_3d42;
    local_2040 = local_20c0;
    uStack_2038 = uStack_20b8;
    uStack_2030 = uStack_20b0;
    uStack_2028 = uStack_20a8;
    uStack_2020 = uStack_20a0;
    uStack_2018 = uStack_2098;
    uStack_2010 = uStack_2090;
    uStack_2008 = uStack_2088;
    local_1f62 = local_3cc2;
  }
  for (; local_4534 + 7 < in_ECX; local_4534 = local_4534 + 8) {
    local_4488 = local_4518;
    local_4620 = *(undefined8 *)*local_4518;
    uStack_4618 = *(undefined8 *)(*local_4518 + 8);
    uStack_4610 = *(undefined8 *)(*local_4518 + 0x10);
    uStack_4608 = *(undefined8 *)(*local_4518 + 0x18);
    local_4490 = local_4520;
    local_4640 = *(undefined8 *)*local_4520;
    uStack_4638 = *(undefined8 *)(*local_4520 + 8);
    uStack_4630 = *(undefined8 *)(*local_4520 + 0x10);
    uStack_4628 = *(undefined8 *)(*local_4520 + 0x18);
    local_43f8 = &local_452d;
    local_4400 = &local_4620;
    local_4408 = &local_4640;
    local_1ba0 = 0x3f800000;
    uStack_1b9c = 0x3f800000;
    uStack_1b98 = 0x3f800000;
    uStack_1b94 = 0x3f800000;
    uStack_1b90 = 0x3f800000;
    uStack_1b8c = 0x3f800000;
    uStack_1b88 = 0x3f800000;
    uStack_1b84 = 0x3f800000;
    local_1900 = 0;
    uStack_18f8 = 0;
    uStack_18f0 = 0;
    uStack_18e8 = 0;
    local_1bc0 = vcmpps_avx(*(undefined1 (*) [32])*local_4518,ZEXT1632(ZEXT816(0)),2);
    local_1b60 = SUB168(*(undefined1 (*) [16])*local_4518,0);
    local_1920 = local_1b60;
    uStack_1b58 = SUB168(*(undefined1 (*) [16])*local_4518,8);
    uStack_1918 = uStack_1b58;
    local_1940 = 0x800000;
    uStack_193c = 0x800000;
    uStack_1938 = 0x800000;
    uStack_1934 = 0x800000;
    uStack_1930 = 0x800000;
    uStack_192c = 0x800000;
    uStack_1928 = 0x800000;
    uStack_1924 = 0x800000;
    auVar83._8_4_ = 0x800000;
    auVar83._0_8_ = 0x80000000800000;
    auVar83._12_4_ = 0x800000;
    auVar83._16_4_ = 0x800000;
    auVar83._20_4_ = 0x800000;
    auVar83._24_4_ = 0x800000;
    auVar83._28_4_ = 0x800000;
    auVar16 = vmaxps_avx(*(undefined1 (*) [32])*local_4518,auVar83);
    local_1b60 = auVar16._0_8_;
    local_cc0 = local_1b60;
    uStack_1b58 = auVar16._8_8_;
    uStack_cb8 = uStack_1b58;
    uStack_1b50 = auVar16._16_8_;
    uStack_cb0 = uStack_1b50;
    uStack_1b48 = auVar16._24_8_;
    uStack_ca8 = uStack_1b48;
    local_ce0 = local_1b60;
    uStack_cd8 = uStack_1b58;
    uStack_cd0 = uStack_1b50;
    uStack_cc8 = uStack_1b48;
    local_ce4 = 0x17;
    local_ba0 = local_1b60;
    uStack_b98 = uStack_1b58;
    uStack_b90 = uStack_1b50;
    uStack_b88 = uStack_1b48;
    local_ba4 = 0x17;
    auVar19 = vpsrld_avx2(auVar16,ZEXT416(0x17));
    local_1680 = local_1b60;
    uStack_1678 = uStack_1b58;
    uStack_1670 = uStack_1b50;
    uStack_1668 = uStack_1b48;
    local_16a0 = 0x807fffff;
    uStack_169c = 0x807fffff;
    uStack_1698 = 0x807fffff;
    uStack_1694 = 0x807fffff;
    uStack_1690 = 0x807fffff;
    uStack_168c = 0x807fffff;
    uStack_1688 = 0x807fffff;
    uStack_1684 = 0x807fffff;
    auVar85._8_4_ = 0x807fffff;
    auVar85._0_8_ = 0x807fffff807fffff;
    auVar85._12_4_ = 0x807fffff;
    auVar85._16_4_ = 0x807fffff;
    auVar85._20_4_ = 0x807fffff;
    auVar85._24_4_ = 0x807fffff;
    auVar85._28_4_ = 0x807fffff;
    auVar16 = vpand_avx2(auVar16,auVar85);
    local_1b60 = auVar16._0_8_;
    local_c40 = local_1b60;
    uStack_1b58 = auVar16._8_8_;
    uStack_c38 = uStack_1b58;
    uStack_1b50 = auVar16._16_8_;
    uStack_c30 = uStack_1b50;
    uStack_1b48 = auVar16._24_8_;
    uStack_c28 = uStack_1b48;
    local_c60 = 0x3f000000;
    uStack_c5c = 0x3f000000;
    uStack_c58 = 0x3f000000;
    uStack_c54 = 0x3f000000;
    uStack_c50 = 0x3f000000;
    uStack_c4c = 0x3f000000;
    uStack_c48 = 0x3f000000;
    uStack_c44 = 0x3f000000;
    auVar109._8_4_ = 0x3f000000;
    auVar109._0_8_ = 0x3f0000003f000000;
    auVar109._12_4_ = 0x3f000000;
    auVar109._16_4_ = 0x3f000000;
    auVar109._20_4_ = 0x3f000000;
    auVar109._24_4_ = 0x3f000000;
    auVar109._28_4_ = 0x3f000000;
    auVar18 = vpor_avx2(auVar16,auVar109);
    local_1b80._0_8_ = auVar19._0_8_;
    local_c00 = local_1b80._0_8_;
    local_1b80._8_8_ = auVar19._8_8_;
    uStack_bf8 = local_1b80._8_8_;
    local_1b80._16_8_ = auVar19._16_8_;
    uStack_bf0 = local_1b80._16_8_;
    local_1b80._24_8_ = auVar19._24_8_;
    uStack_be8 = local_1b80._24_8_;
    local_c20 = 0x7f0000007f;
    uStack_c18 = 0x7f0000007f;
    uStack_c10 = 0x7f0000007f;
    uStack_c08 = 0x7f0000007f;
    local_b60 = local_1b80._0_8_;
    uStack_b58 = local_1b80._8_8_;
    uStack_b50 = local_1b80._16_8_;
    uStack_b48 = local_1b80._24_8_;
    local_b80 = 0x7f0000007f;
    uStack_b78 = 0x7f0000007f;
    uStack_b70 = 0x7f0000007f;
    uStack_b68 = 0x7f0000007f;
    auVar110._8_8_ = 0x7f0000007f;
    auVar110._0_8_ = 0x7f0000007f;
    auVar110._16_8_ = 0x7f0000007f;
    auVar110._24_8_ = 0x7f0000007f;
    local_1b80 = vpsubd_avx2(auVar19,auVar110);
    local_be0 = local_1b80._0_8_;
    uStack_bd8 = local_1b80._8_8_;
    uStack_bd0 = local_1b80._16_8_;
    uStack_bc8 = local_1b80._24_8_;
    auVar16 = vcvtdq2ps_avx(local_1b80);
    local_1be0 = auVar16._0_8_;
    uVar21 = local_1be0;
    uStack_1bd8 = auVar16._8_8_;
    uVar24 = uStack_1bd8;
    uStack_1bd0 = auVar16._16_8_;
    uVar25 = uStack_1bd0;
    uStack_1bc8 = auVar16._24_8_;
    uVar26 = uStack_1bc8;
    local_1ac0 = 0x3f8000003f800000;
    uStack_1ab8 = 0x3f8000003f800000;
    uStack_1ab0 = 0x3f8000003f800000;
    uStack_1aa8 = 0x3f8000003f800000;
    local_1aa0._0_4_ = auVar16._0_4_;
    local_1aa0._4_4_ = auVar16._4_4_;
    uStack_1a98._0_4_ = auVar16._8_4_;
    uStack_1a98._4_4_ = auVar16._12_4_;
    uStack_1a90._0_4_ = auVar16._16_4_;
    uStack_1a90._4_4_ = auVar16._20_4_;
    uStack_1a88._0_4_ = auVar16._24_4_;
    uStack_1a88._4_4_ = auVar16._28_4_;
    local_1be0._4_4_ = local_1aa0._4_4_ + 1.0;
    local_1be0._0_4_ = (float)local_1aa0 + 1.0;
    uStack_1bd8._0_4_ = (float)uStack_1a98 + 1.0;
    uStack_1bd8._4_4_ = uStack_1a98._4_4_ + 1.0;
    uStack_1bd0._0_4_ = (float)uStack_1a90 + 1.0;
    uStack_1bd0._4_4_ = uStack_1a90._4_4_ + 1.0;
    auVar145 = _local_1be0;
    uStack_1bc8._0_4_ = (float)uStack_1a88 + 1.0;
    uStack_1bc8._4_4_ = uStack_1a88._4_4_ + 1.0;
    auVar19 = _local_1be0;
    auVar159._8_4_ = 0x3f3504f3;
    auVar159._0_8_ = 0x3f3504f33f3504f3;
    auVar159._12_4_ = 0x3f3504f3;
    auVar159._16_4_ = 0x3f3504f3;
    auVar159._20_4_ = 0x3f3504f3;
    auVar159._24_4_ = 0x3f3504f3;
    auVar159._28_4_ = 0x3f3504f3;
    local_1c00 = vcmpps_avx(auVar18,auVar159,1);
    local_1b60 = auVar18._0_8_;
    local_16c0 = local_1b60;
    uStack_1b58 = auVar18._8_8_;
    uStack_16b8 = uStack_1b58;
    uStack_1b50 = auVar18._16_8_;
    uStack_16b0 = uStack_1b50;
    uStack_1b48 = auVar18._24_8_;
    uStack_16a8 = uStack_1b48;
    local_16e0 = local_1c00._0_8_;
    uStack_16d8 = local_1c00._8_8_;
    uStack_16d0 = local_1c00._16_8_;
    uStack_16c8 = local_1c00._24_8_;
    local_1c20 = vpand_avx2(auVar18,local_1c00);
    local_1a20 = local_1b60;
    uStack_1a18 = uStack_1b58;
    uStack_1a10 = uStack_1b50;
    uStack_1a08 = uStack_1b48;
    local_1a40 = 0x3f8000003f800000;
    uStack_1a38 = 0x3f8000003f800000;
    uStack_1a30 = 0x3f8000003f800000;
    uStack_1a28 = 0x3f8000003f800000;
    auVar82._8_8_ = 0x3f8000003f800000;
    auVar82._0_8_ = 0x3f8000003f800000;
    auVar82._16_8_ = 0x3f8000003f800000;
    auVar82._24_8_ = 0x3f8000003f800000;
    auVar16 = vsubps_avx(auVar18,auVar82);
    local_1a60 = local_1be0;
    uStack_1a58 = uStack_1bd8;
    uStack_1bd0 = auVar145._16_8_;
    uStack_1a50 = uStack_1bd0;
    uStack_1bc8 = auVar19._24_8_;
    uStack_1a48 = uStack_1bc8;
    local_1700 = 0x3f8000003f800000;
    uStack_16f8 = 0x3f8000003f800000;
    uStack_16f0 = 0x3f8000003f800000;
    uStack_16e8 = 0x3f8000003f800000;
    local_1720 = local_1c00._0_8_;
    uStack_1718 = local_1c00._8_8_;
    uStack_1710 = local_1c00._16_8_;
    uStack_1708 = local_1c00._24_8_;
    auVar84._8_8_ = 0x3f8000003f800000;
    auVar84._0_8_ = 0x3f8000003f800000;
    auVar84._16_8_ = 0x3f8000003f800000;
    auVar84._24_8_ = 0x3f8000003f800000;
    local_1a80 = vpand_avx2(auVar84,local_1c00);
    auVar156._16_8_ = uStack_1bd0;
    auVar156._0_16_ = _local_1be0;
    auVar156._24_8_ = uStack_1bc8;
    _local_1be0 = vsubps_avx(auVar156,local_1a80);
    local_1b60 = auVar16._0_8_;
    uVar27 = local_1b60;
    uStack_1b58 = auVar16._8_8_;
    uVar28 = uStack_1b58;
    uStack_1b50 = auVar16._16_8_;
    uVar29 = uStack_1b50;
    uStack_1b48 = auVar16._24_8_;
    uVar30 = uStack_1b48;
    local_1ae0._0_4_ = auVar16._0_4_;
    local_1ae0._4_4_ = auVar16._4_4_;
    uStack_1ad8._0_4_ = auVar16._8_4_;
    uStack_1ad8._4_4_ = auVar16._12_4_;
    uStack_1ad0._0_4_ = auVar16._16_4_;
    uStack_1ad0._4_4_ = auVar16._20_4_;
    uStack_1ac8._0_4_ = auVar16._24_4_;
    uStack_1ac8._4_4_ = auVar16._28_4_;
    local_1b00._0_4_ = local_1c20._0_4_;
    local_1b00._4_4_ = local_1c20._4_4_;
    uStack_1af8._0_4_ = local_1c20._8_4_;
    uStack_1af8._4_4_ = local_1c20._12_4_;
    uStack_1af0._0_4_ = local_1c20._16_4_;
    uStack_1af0._4_4_ = local_1c20._20_4_;
    uStack_1ae8._0_4_ = local_1c20._24_4_;
    uStack_1ae8._4_4_ = local_1c20._28_4_;
    local_1b60._0_4_ = (float)local_1ae0 + (float)local_1b00;
    local_1b60._4_4_ = local_1ae0._4_4_ + local_1b00._4_4_;
    uStack_1ad8._0_4_ = (float)uStack_1ad8 + (float)uStack_1af8;
    uStack_1ad8._4_4_ = uStack_1ad8._4_4_ + uStack_1af8._4_4_;
    uStack_1ad0._0_4_ = (float)uStack_1ad0 + (float)uStack_1af0;
    uStack_1ad0._4_4_ = uStack_1ad0._4_4_ + uStack_1af0._4_4_;
    uStack_1ac8._0_4_ = (float)uStack_1ac8 + (float)uStack_1ae8;
    fStack_1c24 = uStack_1ac8._4_4_ + uStack_1ae8._4_4_;
    uStack_1b58._0_4_ = (float)uStack_1ad8;
    uStack_1b58._4_4_ = uStack_1ad8._4_4_;
    uStack_1b50._0_4_ = (float)uStack_1ad0;
    uStack_1b50._4_4_ = uStack_1ad0._4_4_;
    auVar145 = _local_1b60;
    uStack_1b48._0_4_ = (float)uStack_1ac8;
    uStack_1b48._4_4_ = fStack_1c24;
    auVar18 = _local_1b60;
    local_1980 = local_1b60;
    uStack_1978 = uStack_1b58;
    uStack_1b50 = auVar145._16_8_;
    uStack_1970 = uStack_1b50;
    uStack_1b48 = auVar18._24_8_;
    uStack_1968 = uStack_1b48;
    local_1c40 = (float)local_1b60._0_4_ * (float)local_1b60._0_4_;
    fStack_1c3c = (float)local_1b60._4_4_ * (float)local_1b60._4_4_;
    fStack_1c38 = (float)uStack_1ad8 * (float)uStack_1ad8;
    fStack_1c34 = uStack_1ad8._4_4_ * uStack_1ad8._4_4_;
    fStack_1c30 = (float)uStack_1ad0 * (float)uStack_1ad0;
    fStack_1c2c = uStack_1ad0._4_4_ * uStack_1ad0._4_4_;
    fStack_1c28 = (float)uStack_1ac8 * (float)uStack_1ac8;
    uStack_1c58._0_4_ = 0x3d9021bb;
    local_1c60 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_1c58._4_4_ = 0x3d9021bb;
    uStack_1c50._0_4_ = 0x3d9021bb;
    uStack_1c50._4_4_ = 0x3d9021bb;
    auVar145 = _local_1c60;
    uStack_1c48._0_4_ = 0.070376836;
    uStack_1c48._4_4_ = 0x3d9021bb;
    auVar16 = _local_1c60;
    local_18a0 = local_1c60;
    local_18b8 = local_1b60;
    local_17e0 = ::_ps256_cephes_log_p1;
    local_1220 = 0x3d9021bb3d9021bb;
    uStack_1218 = uStack_1c58;
    uStack_1c50 = auVar145._16_8_;
    uStack_1210 = uStack_1c50;
    uStack_1c48 = auVar16._24_8_;
    uStack_1208 = uStack_1c48;
    local_1240 = local_1b60;
    uStack_1238 = uStack_1b58;
    uStack_1230 = uStack_1b50;
    uStack_1228 = uStack_1b48;
    local_1260[0] = -0.1151461;
    local_1260[1] = -0.1151461;
    afStack_1258[0] = -0.1151461;
    afStack_1258[1] = -0.1151461;
    afStack_1250[0] = -0.1151461;
    afStack_1250[1] = -0.1151461;
    afStack_1248[0] = -0.1151461;
    afStack_1248[1] = -0.1151461;
    auVar94._8_4_ = -0.1151461;
    auVar94._12_4_ = -0.1151461;
    auVar94._0_4_ = -0.1151461;
    auVar94._4_4_ = -0.1151461;
    auVar94._16_4_ = -0.1151461;
    auVar94._20_4_ = -0.1151461;
    auVar94._24_4_ = -0.1151461;
    auVar94._28_4_ = -0.1151461;
    auVar22 = vfmadd213ps_fma(auVar18,auVar16,auVar94);
    local_17f8 = ::_ps256_cephes_log_p2;
    local_1c60 = auVar22._0_8_;
    local_11c0 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_11b8 = uStack_1c58;
    uStack_11b0 = 0;
    uStack_11a8 = 0;
    local_11e0 = local_1b60;
    uStack_11d8 = uStack_1b58;
    uStack_11d0 = uStack_1b50;
    uStack_11c8 = uStack_1b48;
    local_1200[0] = 0.116769984;
    local_1200[1] = 0.116769984;
    afStack_11f8[0] = 0.116769984;
    afStack_11f8[1] = 0.116769984;
    afStack_11f0[0] = 0.116769984;
    afStack_11f0[1] = 0.116769984;
    afStack_11e8[0] = 0.116769984;
    afStack_11e8[1] = 0.116769984;
    auVar95._8_4_ = 0.116769984;
    auVar95._12_4_ = 0.116769984;
    auVar95._0_4_ = 0.116769984;
    auVar95._4_4_ = 0.116769984;
    auVar95._16_4_ = 0.116769984;
    auVar95._20_4_ = 0.116769984;
    auVar95._24_4_ = 0.116769984;
    auVar95._28_4_ = 0.116769984;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar95);
    local_1810 = ::_ps256_cephes_log_p3;
    local_1c60 = auVar22._0_8_;
    local_1160 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_1158 = uStack_1c58;
    uStack_1150 = 0;
    uStack_1148 = 0;
    local_1180 = local_1b60;
    uStack_1178 = uStack_1b58;
    uStack_1170 = uStack_1b50;
    uStack_1168 = uStack_1b48;
    local_11a0[0] = -0.12420141;
    local_11a0[1] = -0.12420141;
    afStack_1198[0] = -0.12420141;
    afStack_1198[1] = -0.12420141;
    afStack_1190[0] = -0.12420141;
    afStack_1190[1] = -0.12420141;
    afStack_1188[0] = -0.12420141;
    afStack_1188[1] = -0.12420141;
    auVar96._8_4_ = -0.12420141;
    auVar96._12_4_ = -0.12420141;
    auVar96._0_4_ = -0.12420141;
    auVar96._4_4_ = -0.12420141;
    auVar96._16_4_ = -0.12420141;
    auVar96._20_4_ = -0.12420141;
    auVar96._24_4_ = -0.12420141;
    auVar96._28_4_ = -0.12420141;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar96);
    local_1828 = ::_ps256_cephes_log_p4;
    local_1c60 = auVar22._0_8_;
    local_1100 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_10f8 = uStack_1c58;
    uStack_10f0 = 0;
    uStack_10e8 = 0;
    local_1120 = local_1b60;
    uStack_1118 = uStack_1b58;
    uStack_1110 = uStack_1b50;
    uStack_1108 = uStack_1b48;
    local_1140[0] = 0.14249323;
    local_1140[1] = 0.14249323;
    afStack_1138[0] = 0.14249323;
    afStack_1138[1] = 0.14249323;
    afStack_1130[0] = 0.14249323;
    afStack_1130[1] = 0.14249323;
    afStack_1128[0] = 0.14249323;
    afStack_1128[1] = 0.14249323;
    auVar97._8_4_ = 0.14249323;
    auVar97._12_4_ = 0.14249323;
    auVar97._0_4_ = 0.14249323;
    auVar97._4_4_ = 0.14249323;
    auVar97._16_4_ = 0.14249323;
    auVar97._20_4_ = 0.14249323;
    auVar97._24_4_ = 0.14249323;
    auVar97._28_4_ = 0.14249323;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar97);
    local_1840 = ::_ps256_cephes_log_p5;
    local_1c60 = auVar22._0_8_;
    local_10a0 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_1098 = uStack_1c58;
    uStack_1090 = 0;
    uStack_1088 = 0;
    local_10c0 = local_1b60;
    uStack_10b8 = uStack_1b58;
    uStack_10b0 = uStack_1b50;
    uStack_10a8 = uStack_1b48;
    local_10e0[0] = -0.16668057;
    local_10e0[1] = -0.16668057;
    afStack_10d8[0] = -0.16668057;
    afStack_10d8[1] = -0.16668057;
    afStack_10d0[0] = -0.16668057;
    afStack_10d0[1] = -0.16668057;
    afStack_10c8[0] = -0.16668057;
    afStack_10c8[1] = -0.16668057;
    auVar98._8_4_ = -0.16668057;
    auVar98._12_4_ = -0.16668057;
    auVar98._0_4_ = -0.16668057;
    auVar98._4_4_ = -0.16668057;
    auVar98._16_4_ = -0.16668057;
    auVar98._20_4_ = -0.16668057;
    auVar98._24_4_ = -0.16668057;
    auVar98._28_4_ = -0.16668057;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar98);
    local_1858 = ::_ps256_cephes_log_p6;
    local_1c60 = auVar22._0_8_;
    local_1040 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_1038 = uStack_1c58;
    uStack_1030 = 0;
    uStack_1028 = 0;
    local_1060 = local_1b60;
    uStack_1058 = uStack_1b58;
    uStack_1050 = uStack_1b50;
    uStack_1048 = uStack_1b48;
    local_1080[0] = 0.20000714;
    local_1080[1] = 0.20000714;
    afStack_1078[0] = 0.20000714;
    afStack_1078[1] = 0.20000714;
    afStack_1070[0] = 0.20000714;
    afStack_1070[1] = 0.20000714;
    afStack_1068[0] = 0.20000714;
    afStack_1068[1] = 0.20000714;
    auVar99._8_4_ = 0.20000714;
    auVar99._12_4_ = 0.20000714;
    auVar99._0_4_ = 0.20000714;
    auVar99._4_4_ = 0.20000714;
    auVar99._16_4_ = 0.20000714;
    auVar99._20_4_ = 0.20000714;
    auVar99._24_4_ = 0.20000714;
    auVar99._28_4_ = 0.20000714;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar99);
    local_1870 = ::_ps256_cephes_log_p7;
    local_1c60 = auVar22._0_8_;
    local_fe0 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_fd8 = uStack_1c58;
    uStack_fd0 = 0;
    uStack_fc8 = 0;
    local_1000 = local_1b60;
    uStack_ff8 = uStack_1b58;
    uStack_ff0 = uStack_1b50;
    uStack_fe8 = uStack_1b48;
    local_1020[0] = -0.24999994;
    local_1020[1] = -0.24999994;
    afStack_1018[0] = -0.24999994;
    afStack_1018[1] = -0.24999994;
    afStack_1010[0] = -0.24999994;
    afStack_1010[1] = -0.24999994;
    afStack_1008[0] = -0.24999994;
    afStack_1008[1] = -0.24999994;
    auVar100._8_4_ = -0.24999994;
    auVar100._12_4_ = -0.24999994;
    auVar100._0_4_ = -0.24999994;
    auVar100._4_4_ = -0.24999994;
    auVar100._16_4_ = -0.24999994;
    auVar100._20_4_ = -0.24999994;
    auVar100._24_4_ = -0.24999994;
    auVar100._28_4_ = -0.24999994;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar100);
    local_1888 = ::_ps256_cephes_log_p8;
    local_1c60 = auVar22._0_8_;
    local_f80 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_f78 = uStack_1c58;
    uStack_f70 = 0;
    uStack_f68 = 0;
    local_fa0 = local_1b60;
    uStack_f98 = uStack_1b58;
    uStack_f90 = uStack_1b50;
    uStack_f88 = uStack_1b48;
    local_fc0[0] = 0.3333333;
    local_fc0[1] = 0.3333333;
    afStack_fb8[0] = 0.3333333;
    afStack_fb8[1] = 0.3333333;
    afStack_fb0[0] = 0.3333333;
    afStack_fb0[1] = 0.3333333;
    afStack_fa8[0] = 0.3333333;
    afStack_fa8[1] = 0.3333333;
    auVar101._8_4_ = 0.3333333;
    auVar101._12_4_ = 0.3333333;
    auVar101._0_4_ = 0.3333333;
    auVar101._4_4_ = 0.3333333;
    auVar101._16_4_ = 0.3333333;
    auVar101._20_4_ = 0.3333333;
    auVar101._24_4_ = 0.3333333;
    auVar101._28_4_ = 0.3333333;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar101);
    local_1c60 = auVar22._0_8_;
    uVar31 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uVar32 = uStack_1c58;
    uStack_1990 = 0;
    uStack_1988 = 0;
    local_19c0 = local_1b60;
    uStack_19b8 = uStack_1b58;
    uStack_19b0 = uStack_1b50;
    uStack_19a8 = uStack_1b48;
    local_19a0._0_4_ = auVar22._0_4_;
    local_19a0._4_4_ = auVar22._4_4_;
    uStack_1998._0_4_ = auVar22._8_4_;
    uStack_1998._4_4_ = auVar22._12_4_;
    local_1c60._4_4_ = local_19a0._4_4_ * (float)local_1b60._4_4_;
    local_1c60._0_4_ = (float)local_19a0 * (float)local_1b60._0_4_;
    uStack_1c58._0_4_ = (float)uStack_1998 * (float)uStack_1ad8;
    uStack_1c58._4_4_ = uStack_1998._4_4_ * uStack_1ad8._4_4_;
    uStack_1c50._0_4_ = (float)uStack_1ad0 * 0.0;
    uStack_1c50._4_4_ = uStack_1ad0._4_4_ * 0.0;
    auVar145 = _local_1c60;
    local_19e0 = local_1c60;
    uStack_19d8 = uStack_1c58;
    uStack_1c50 = auVar145._16_8_;
    uStack_19d0 = uStack_1c50;
    uStack_1c48 = (ulong)(uint)((float)uStack_1ac8 * 0.0);
    uStack_19c8 = uStack_1c48;
    local_1a00 = CONCAT44(fStack_1c3c,local_1c40);
    uStack_19f8 = CONCAT44(fStack_1c34,fStack_1c38);
    uStack_19f0 = CONCAT44(fStack_1c2c,fStack_1c30);
    uStack_19e8 = CONCAT44(fStack_1c24,fStack_1c28);
    uStack_1c48._0_4_ = (float)uStack_1ac8 * 0.0 * fStack_1c28;
    local_1c60._4_4_ = local_19a0._4_4_ * (float)local_1b60._4_4_ * fStack_1c3c;
    local_1c60._0_4_ = (float)local_19a0 * (float)local_1b60._0_4_ * local_1c40;
    uStack_1c58._0_4_ = (float)uStack_1998 * (float)uStack_1ad8 * fStack_1c38;
    uStack_1c58._4_4_ = uStack_1998._4_4_ * uStack_1ad8._4_4_ * fStack_1c34;
    uStack_1c50._0_4_ = (float)uStack_1ad0 * 0.0 * fStack_1c30;
    uStack_1c50._4_4_ = uStack_1ad0._4_4_ * 0.0 * fStack_1c2c;
    auVar145 = _local_1c60;
    uStack_1c48._4_4_ = 0;
    auVar16 = _local_1c60;
    local_18a8 = local_1be0;
    local_1898 = ::_ps256_cephes_log_q1;
    local_f20 = local_1be0;
    uStack_f18 = uStack_1bd8;
    uStack_f10 = uStack_1bd0;
    uStack_f08 = uStack_1bc8;
    local_f40[0] = -0.00021219444;
    local_f40[1] = -0.00021219444;
    afStack_f38[0] = -0.00021219444;
    afStack_f38[1] = -0.00021219444;
    afStack_f30[0] = -0.00021219444;
    afStack_f30[1] = -0.00021219444;
    afStack_f28[0] = -0.00021219444;
    afStack_f28[1] = -0.00021219444;
    local_f60 = local_1c60;
    uStack_f58 = uStack_1c58;
    uStack_1c50 = auVar145._16_8_;
    uStack_f50 = uStack_1c50;
    uStack_1c48 = (ulong)(uint)(float)uStack_1c48;
    uStack_f48 = uStack_1c48;
    auVar102._8_4_ = -0.00021219444;
    auVar102._12_4_ = -0.00021219444;
    auVar102._0_4_ = -0.00021219444;
    auVar102._4_4_ = -0.00021219444;
    auVar102._16_4_ = -0.00021219444;
    auVar102._20_4_ = -0.00021219444;
    auVar102._24_4_ = -0.00021219444;
    auVar102._28_4_ = -0.00021219444;
    auVar22 = vfmadd213ps_fma(auVar102,_local_1be0,auVar16);
    local_15f8 = &local_1c40;
    local_1600 = ::_ps256_0p5;
    local_da0 = CONCAT44(fStack_1c3c,local_1c40);
    uStack_d98 = CONCAT44(fStack_1c34,fStack_1c38);
    uStack_d90 = CONCAT44(fStack_1c2c,fStack_1c30);
    uStack_d88 = CONCAT44(fStack_1c24,fStack_1c28);
    auVar142._4_4_ = fStack_1c3c;
    auVar142._0_4_ = local_1c40;
    auVar142._8_4_ = fStack_1c38;
    auVar142._12_4_ = fStack_1c34;
    auVar142._16_4_ = fStack_1c30;
    auVar142._20_4_ = fStack_1c2c;
    auVar142._24_4_ = fStack_1c28;
    auVar142._28_4_ = fStack_1c24;
    local_dc0[0] = 0.5;
    local_dc0[1] = 0.5;
    afStack_db8[0] = 0.5;
    afStack_db8[1] = 0.5;
    afStack_db0[0] = 0.5;
    afStack_db0[1] = 0.5;
    afStack_da8[0] = 0.5;
    afStack_da8[1] = 0.5;
    local_1c60 = auVar22._0_8_;
    local_de0 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uStack_dd8 = uStack_1c58;
    uStack_dd0 = 0;
    uStack_dc8 = 0;
    auVar106._8_4_ = 0.5;
    auVar106._12_4_ = 0.5;
    auVar106._0_4_ = 0.5;
    auVar106._4_4_ = 0.5;
    auVar106._16_4_ = 0.5;
    auVar106._20_4_ = 0.5;
    auVar106._24_4_ = 0.5;
    auVar106._28_4_ = 0.5;
    auVar22 = vfnmadd213ps_fma(auVar106,auVar142,ZEXT1632(auVar22));
    local_1b20 = local_1b60;
    uStack_1b18 = uStack_1b58;
    uStack_1b10 = uStack_1b50;
    uStack_1b08 = uStack_1b48;
    local_1c60 = auVar22._0_8_;
    uVar33 = local_1c60;
    uStack_1c58 = auVar22._8_8_;
    uVar34 = uStack_1c58;
    uStack_1b30 = 0;
    uStack_1b28 = 0;
    local_1b40._0_4_ = auVar22._0_4_;
    local_1b40._4_4_ = auVar22._4_4_;
    uStack_1b38._0_4_ = auVar22._8_4_;
    uStack_1b38._4_4_ = auVar22._12_4_;
    local_1b60._4_4_ = (float)local_1b60._4_4_ + local_1b40._4_4_;
    local_1b60._0_4_ = (float)local_1b60._0_4_ + (float)local_1b40;
    uStack_1b58._0_4_ = (float)uStack_1ad8 + (float)uStack_1b38;
    uStack_1b58._4_4_ = uStack_1ad8._4_4_ + uStack_1b38._4_4_;
    uStack_1b50._0_4_ = (float)uStack_1ad0 + 0.0;
    uStack_1b50._4_4_ = uStack_1ad0._4_4_ + 0.0;
    auVar145 = _local_1b60;
    uStack_1b48._0_4_ = (float)uStack_1ac8 + 0.0;
    uStack_1b48._4_4_ = fStack_1c24 + 0.0;
    auVar16 = _local_1b60;
    local_18b0 = ::_ps256_cephes_log_q2;
    local_ec0 = local_1be0;
    uStack_eb8 = uStack_1bd8;
    uStack_eb0 = uStack_1bd0;
    uStack_ea8 = uStack_1bc8;
    local_ee0[0] = 0.6933594;
    local_ee0[1] = 0.6933594;
    afStack_ed8[0] = 0.6933594;
    afStack_ed8[1] = 0.6933594;
    afStack_ed0[0] = 0.6933594;
    afStack_ed0[1] = 0.6933594;
    afStack_ec8[0] = 0.6933594;
    afStack_ec8[1] = 0.6933594;
    local_f00 = local_1b60;
    uStack_ef8 = uStack_1b58;
    uStack_1b50 = auVar145._16_8_;
    uStack_ef0 = uStack_1b50;
    uStack_1b48 = auVar16._24_8_;
    uStack_ee8 = uStack_1b48;
    auVar103._8_4_ = 0.6933594;
    auVar103._12_4_ = 0.6933594;
    auVar103._0_4_ = 0.6933594;
    auVar103._4_4_ = 0.6933594;
    auVar103._16_4_ = 0.6933594;
    auVar103._20_4_ = 0.6933594;
    auVar103._24_4_ = 0.6933594;
    auVar103._28_4_ = 0.6933594;
    auVar22 = vfmadd213ps_fma(auVar103,_local_1be0,auVar16);
    local_1b60 = auVar22._0_8_;
    local_c80 = local_1b60;
    uStack_1b58 = auVar22._8_8_;
    uStack_c78 = uStack_1b58;
    uStack_c70 = 0;
    uStack_c68 = 0;
    local_ca0 = local_1bc0._0_8_;
    uStack_c98 = local_1bc0._8_8_;
    uStack_c90 = local_1bc0._16_8_;
    uStack_c88 = local_1bc0._24_8_;
    _local_1c60 = vpor_avx2(ZEXT1632(auVar22),local_1bc0);
    local_1f00._0_4_ = (float)local_4640;
    local_1f00._4_4_ = (float)((ulong)local_4640 >> 0x20);
    uStack_1ef8._0_4_ = (float)uStack_4638;
    uStack_1ef8._4_4_ = (float)((ulong)uStack_4638 >> 0x20);
    uStack_1ef0._0_4_ = (float)uStack_4630;
    uStack_1ef0._4_4_ = (float)((ulong)uStack_4630 >> 0x20);
    uStack_1ee8._0_4_ = (float)uStack_4628;
    uStack_1ee8._4_4_ = (undefined4)((ulong)uStack_4628 >> 0x20);
    local_1f20._0_4_ = local_1c60._0_4_;
    local_1f20._4_4_ = local_1c60._4_4_;
    uStack_1f18._0_4_ = local_1c60._8_4_;
    uStack_1f18._4_4_ = local_1c60._12_4_;
    uStack_1f10._0_4_ = local_1c60._16_4_;
    uStack_1f10._4_4_ = local_1c60._20_4_;
    uStack_1f08._0_4_ = local_1c60._24_4_;
    local_1e00._4_4_ = local_1f00._4_4_ * local_1f20._4_4_;
    local_1e00._0_4_ = (float)local_1f00 * (float)local_1f20;
    uStack_1df8._0_4_ = (float)uStack_1ef8 * (float)uStack_1f18;
    uStack_1df8._4_4_ = uStack_1ef8._4_4_ * uStack_1f18._4_4_;
    uStack_1df0._0_4_ = (float)uStack_1ef0 * (float)uStack_1f10;
    uStack_1df0._4_4_ = uStack_1ef0._4_4_ * uStack_1f10._4_4_;
    auVar145 = _local_1e00;
    uStack_1de8._0_4_ = (float)uStack_1ee8 * (float)uStack_1f08;
    uStack_1de8._4_4_ = uStack_1ee8._4_4_;
    auVar16 = _local_1e00;
    local_18e0 = 0;
    uStack_18d8 = 0;
    uStack_18d0 = 0;
    uStack_18c8 = 0;
    local_1e80 = 0x3f800000;
    uStack_1e7c = 0x3f800000;
    uStack_1e78 = 0x3f800000;
    uStack_1e74 = 0x3f800000;
    uStack_1e70 = 0x3f800000;
    uStack_1e6c = 0x3f800000;
    uStack_1e68 = 0x3f800000;
    uStack_1e64 = 0x3f800000;
    local_1c80 = local_1e00;
    uStack_1c78 = uStack_1df8;
    uStack_1df0 = auVar145._16_8_;
    uStack_1c70 = uStack_1df0;
    uStack_1de8 = auVar16._24_8_;
    uStack_1c68 = uStack_1de8;
    local_1ca0 = 0x42b0c0a5;
    uStack_1c9c = 0x42b0c0a5;
    uStack_1c98 = 0x42b0c0a5;
    uStack_1c94 = 0x42b0c0a5;
    uStack_1c90 = 0x42b0c0a5;
    uStack_1c8c = 0x42b0c0a5;
    uStack_1c88 = 0x42b0c0a5;
    uStack_1c84 = 0x42b0c0a5;
    auVar19._16_8_ = uStack_1df0;
    auVar19._0_16_ = _local_1e00;
    auVar19._24_8_ = uStack_1de8;
    auVar16._8_4_ = 0x42b0c0a5;
    auVar16._0_8_ = 0x42b0c0a542b0c0a5;
    auVar16._12_4_ = 0x42b0c0a5;
    auVar16._16_4_ = 0x42b0c0a5;
    auVar16._20_4_ = 0x42b0c0a5;
    auVar16._24_4_ = 0x42b0c0a5;
    auVar16._28_4_ = 0x42b0c0a5;
    auVar16 = vminps_avx(auVar19,auVar16);
    local_1e00 = auVar16._0_8_;
    local_1cc0 = local_1e00;
    uStack_1df8 = auVar16._8_8_;
    uStack_1cb8 = uStack_1df8;
    uStack_1df0 = auVar16._16_8_;
    uStack_1cb0 = uStack_1df0;
    uStack_1de8 = auVar16._24_8_;
    uStack_1ca8 = uStack_1de8;
    local_1ce0 = 0xc2b0c0a5;
    uStack_1cdc = 0xc2b0c0a5;
    uStack_1cd8 = 0xc2b0c0a5;
    uStack_1cd4 = 0xc2b0c0a5;
    uStack_1cd0 = 0xc2b0c0a5;
    uStack_1ccc = 0xc2b0c0a5;
    uStack_1cc8 = 0xc2b0c0a5;
    uStack_1cc4 = 0xc2b0c0a5;
    auVar18._8_4_ = 0xc2b0c0a5;
    auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar18._12_4_ = 0xc2b0c0a5;
    auVar18._16_4_ = 0xc2b0c0a5;
    auVar18._20_4_ = 0xc2b0c0a5;
    auVar18._24_4_ = 0xc2b0c0a5;
    auVar18._28_4_ = 0xc2b0c0a5;
    auVar18 = vmaxps_avx(auVar16,auVar18);
    local_17c8 = local_1e00;
    local_1730 = ::_ps256_cephes_LOG2EF;
    local_1738 = ::_ps256_0p5;
    local_1e00 = auVar18._0_8_;
    local_14c0 = local_1e00;
    uStack_1df8 = auVar18._8_8_;
    uStack_14b8 = uStack_1df8;
    uStack_1df0 = auVar18._16_8_;
    uStack_14b0 = uStack_1df0;
    uStack_1de8 = auVar18._24_8_;
    uStack_14a8 = uStack_1de8;
    local_14e0[0] = 1.442695;
    local_14e0[1] = 1.442695;
    afStack_14d8[0] = 1.442695;
    afStack_14d8[1] = 1.442695;
    afStack_14d0[0] = 1.442695;
    afStack_14d0[1] = 1.442695;
    afStack_14c8[0] = 1.442695;
    afStack_14c8[1] = 1.442695;
    local_1500[0] = 0.5;
    local_1500[1] = 0.5;
    afStack_14f8[0] = 0.5;
    afStack_14f8[1] = 0.5;
    afStack_14f0[0] = 0.5;
    afStack_14f0[1] = 0.5;
    afStack_14e8[0] = 0.5;
    afStack_14e8[1] = 0.5;
    auVar88._8_4_ = 1.442695;
    auVar88._12_4_ = 1.442695;
    auVar88._0_4_ = 1.442695;
    auVar88._4_4_ = 1.442695;
    auVar88._16_4_ = 1.442695;
    auVar88._20_4_ = 1.442695;
    auVar88._24_4_ = 1.442695;
    auVar88._28_4_ = 1.442695;
    auVar87._8_4_ = 0.5;
    auVar87._12_4_ = 0.5;
    auVar87._0_4_ = 0.5;
    auVar87._4_4_ = 0.5;
    auVar87._16_4_ = 0.5;
    auVar87._20_4_ = 0.5;
    auVar87._24_4_ = 0.5;
    auVar87._28_4_ = 0.5;
    auVar23 = vfmadd213ps_fma(auVar88,auVar18,auVar87);
    auVar19 = vroundps_avx(ZEXT1632(auVar23),1);
    auVar16 = vcmpps_avx(ZEXT1632(auVar23),auVar19,1);
    local_1ea0._0_8_ = auVar16._0_8_;
    local_1640 = local_1ea0._0_8_;
    local_1ea0._8_8_ = auVar16._8_8_;
    uStack_1638 = local_1ea0._8_8_;
    local_1ea0._16_8_ = auVar16._16_8_;
    uStack_1630 = local_1ea0._16_8_;
    local_1ea0._24_8_ = auVar16._24_8_;
    uStack_1628 = local_1ea0._24_8_;
    local_1660 = 0x3f8000003f800000;
    uStack_1658 = 0x3f8000003f800000;
    uStack_1650 = 0x3f8000003f800000;
    uStack_1648 = 0x3f8000003f800000;
    auVar86._8_8_ = 0x3f8000003f800000;
    auVar86._0_8_ = 0x3f8000003f800000;
    auVar86._16_8_ = 0x3f8000003f800000;
    auVar86._24_8_ = 0x3f8000003f800000;
    local_1ea0 = vpand_avx2(auVar16,auVar86);
    local_1e20 = auVar19._0_8_;
    local_1d80 = local_1e20;
    uStack_1e18 = auVar19._8_8_;
    uStack_1d78 = uStack_1e18;
    uStack_1e10 = auVar19._16_8_;
    uStack_1d70 = uStack_1e10;
    uStack_1e08 = auVar19._24_8_;
    uStack_1d68 = uStack_1e08;
    local_1da0 = local_1ea0._0_8_;
    uStack_1d98 = local_1ea0._8_8_;
    uStack_1d90 = local_1ea0._16_8_;
    uStack_1d88 = local_1ea0._24_8_;
    local_1e40 = vsubps_avx(auVar19,local_1ea0);
    local_15e0 = local_1e40;
    local_15d0 = ::_ps256_cephes_exp_C1;
    local_e60 = local_1e40._0_8_;
    uStack_e58 = local_1e40._8_8_;
    uStack_e50 = local_1e40._16_8_;
    uStack_e48 = local_1e40._24_8_;
    local_e80[0] = 0.6933594;
    local_e80[1] = 0.6933594;
    afStack_e78[0] = 0.6933594;
    afStack_e78[1] = 0.6933594;
    afStack_e70[0] = 0.6933594;
    afStack_e70[1] = 0.6933594;
    afStack_e68[0] = 0.6933594;
    afStack_e68[1] = 0.6933594;
    local_ea0 = local_1e00;
    uStack_e98 = uStack_1df8;
    uStack_e90 = uStack_1df0;
    uStack_e88 = uStack_1de8;
    auVar104._8_4_ = 0.6933594;
    auVar104._12_4_ = 0.6933594;
    auVar104._0_4_ = 0.6933594;
    auVar104._4_4_ = 0.6933594;
    auVar104._16_4_ = 0.6933594;
    auVar104._20_4_ = 0.6933594;
    auVar104._24_4_ = 0.6933594;
    auVar104._28_4_ = 0.6933594;
    auVar23 = vfnmadd213ps_fma(auVar104,local_1e40,auVar18);
    local_15e8 = ::_ps256_cephes_exp_C2;
    local_e00 = local_1e40._0_8_;
    uStack_df8 = local_1e40._8_8_;
    uStack_df0 = local_1e40._16_8_;
    uStack_de8 = local_1e40._24_8_;
    local_e20[0] = -0.00021219444;
    local_e20[1] = -0.00021219444;
    afStack_e18[0] = -0.00021219444;
    afStack_e18[1] = -0.00021219444;
    afStack_e10[0] = -0.00021219444;
    afStack_e10[1] = -0.00021219444;
    afStack_e08[0] = -0.00021219444;
    afStack_e08[1] = -0.00021219444;
    local_1e00 = auVar23._0_8_;
    local_e40 = local_1e00;
    uStack_1df8 = auVar23._8_8_;
    uStack_e38 = uStack_1df8;
    uStack_e30 = 0;
    uStack_e28 = 0;
    auVar105._8_4_ = -0.00021219444;
    auVar105._12_4_ = -0.00021219444;
    auVar105._0_4_ = -0.00021219444;
    auVar105._4_4_ = -0.00021219444;
    auVar105._16_4_ = -0.00021219444;
    auVar105._20_4_ = -0.00021219444;
    auVar105._24_4_ = -0.00021219444;
    auVar105._28_4_ = -0.00021219444;
    auVar23 = vfnmadd213ps_fma(auVar105,local_1e40,ZEXT1632(auVar23));
    auVar156 = ZEXT1632(auVar23);
    local_1e00 = auVar23._0_8_;
    local_1d20 = local_1e00;
    uStack_1df8 = auVar23._8_8_;
    uStack_1d18 = uStack_1df8;
    uStack_1d10 = 0;
    uStack_1d08 = 0;
    local_1d00._0_4_ = auVar23._0_4_;
    local_1d00._4_4_ = auVar23._4_4_;
    uStack_1cf8._0_4_ = auVar23._8_4_;
    uStack_1cf8._4_4_ = auVar23._12_4_;
    local_1e20._4_4_ = local_1d00._4_4_ * local_1d00._4_4_;
    local_1e20._0_4_ = (float)local_1d00 * (float)local_1d00;
    local_12a0 = local_1e20;
    uStack_1e18._0_4_ = (float)uStack_1cf8 * (float)uStack_1cf8;
    uStack_1e18._4_4_ = uStack_1cf8._4_4_ * uStack_1cf8._4_4_;
    auVar17 = _local_1e20;
    _local_1e20 = ZEXT1632(_local_1e20);
    auVar19 = _local_1e20;
    uStack_1eb8._0_4_ = 0x39506967;
    local_1ec0 = (undefined1  [8])0x3950696739506967;
    uStack_1eb8._4_4_ = 0x39506967;
    uStack_1eb0._0_4_ = 0x39506967;
    uStack_1eb0._4_4_ = 0x39506967;
    auVar145 = _local_1ec0;
    uStack_1ea8._0_4_ = 0x39506967;
    uStack_1ea8._4_4_ = 0x39506967;
    auVar16 = _local_1ec0;
    local_17b8 = local_1ec0;
    local_1750 = ::_ps256_cephes_exp_p1;
    local_1460 = 0x3950696739506967;
    uStack_1458 = uStack_1eb8;
    uStack_1eb0 = auVar145._16_8_;
    uStack_1450 = uStack_1eb0;
    uStack_1ea8 = auVar16._24_8_;
    uStack_1448 = uStack_1ea8;
    local_1480 = local_1e00;
    uStack_1478 = uStack_1df8;
    uStack_1470 = 0;
    uStack_1468 = 0;
    local_14a0[0] = 0.0013981999;
    local_14a0[1] = 0.0013981999;
    afStack_1498[0] = 0.0013981999;
    afStack_1498[1] = 0.0013981999;
    afStack_1490[0] = 0.0013981999;
    afStack_1490[1] = 0.0013981999;
    afStack_1488[0] = 0.0013981999;
    afStack_1488[1] = 0.0013981999;
    auVar89._8_4_ = 0.0013981999;
    auVar89._12_4_ = 0.0013981999;
    auVar89._0_4_ = 0.0013981999;
    auVar89._4_4_ = 0.0013981999;
    auVar89._16_4_ = 0.0013981999;
    auVar89._20_4_ = 0.0013981999;
    auVar89._24_4_ = 0.0013981999;
    auVar89._28_4_ = 0.0013981999;
    auVar23 = vfmadd213ps_fma(auVar156,auVar16,auVar89);
    local_1768 = ::_ps256_cephes_exp_p2;
    local_1ec0 = auVar23._0_8_;
    local_1400 = local_1ec0;
    uStack_1eb8 = auVar23._8_8_;
    uStack_13f8 = uStack_1eb8;
    uStack_13f0 = 0;
    uStack_13e8 = 0;
    local_1420 = local_1e00;
    uStack_1418 = uStack_1df8;
    uStack_1410 = 0;
    uStack_1408 = 0;
    local_1440[0] = 0.008333452;
    local_1440[1] = 0.008333452;
    afStack_1438[0] = 0.008333452;
    afStack_1438[1] = 0.008333452;
    afStack_1430[0] = 0.008333452;
    afStack_1430[1] = 0.008333452;
    afStack_1428[0] = 0.008333452;
    afStack_1428[1] = 0.008333452;
    auVar90._8_4_ = 0.008333452;
    auVar90._12_4_ = 0.008333452;
    auVar90._0_4_ = 0.008333452;
    auVar90._4_4_ = 0.008333452;
    auVar90._16_4_ = 0.008333452;
    auVar90._20_4_ = 0.008333452;
    auVar90._24_4_ = 0.008333452;
    auVar90._28_4_ = 0.008333452;
    auVar23 = vfmadd213ps_fma(auVar156,ZEXT1632(auVar23),auVar90);
    local_1780 = ::_ps256_cephes_exp_p3;
    local_1ec0 = auVar23._0_8_;
    local_13a0 = local_1ec0;
    uStack_1eb8 = auVar23._8_8_;
    uStack_1398 = uStack_1eb8;
    uStack_1390 = 0;
    uStack_1388 = 0;
    local_13c0 = local_1e00;
    uStack_13b8 = uStack_1df8;
    uStack_13b0 = 0;
    uStack_13a8 = 0;
    local_13e0[0] = 0.041665796;
    local_13e0[1] = 0.041665796;
    afStack_13d8[0] = 0.041665796;
    afStack_13d8[1] = 0.041665796;
    afStack_13d0[0] = 0.041665796;
    afStack_13d0[1] = 0.041665796;
    afStack_13c8[0] = 0.041665796;
    afStack_13c8[1] = 0.041665796;
    auVar91._8_4_ = 0.041665796;
    auVar91._12_4_ = 0.041665796;
    auVar91._0_4_ = 0.041665796;
    auVar91._4_4_ = 0.041665796;
    auVar91._16_4_ = 0.041665796;
    auVar91._20_4_ = 0.041665796;
    auVar91._24_4_ = 0.041665796;
    auVar91._28_4_ = 0.041665796;
    auVar23 = vfmadd213ps_fma(auVar156,ZEXT1632(auVar23),auVar91);
    local_1798 = ::_ps256_cephes_exp_p4;
    local_1ec0 = auVar23._0_8_;
    local_1340 = local_1ec0;
    uStack_1eb8 = auVar23._8_8_;
    uStack_1338 = uStack_1eb8;
    uStack_1330 = 0;
    uStack_1328 = 0;
    local_1360 = local_1e00;
    uStack_1358 = uStack_1df8;
    uStack_1350 = 0;
    uStack_1348 = 0;
    local_1380[0] = 0.16666666;
    local_1380[1] = 0.16666666;
    afStack_1378[0] = 0.16666666;
    afStack_1378[1] = 0.16666666;
    afStack_1370[0] = 0.16666666;
    afStack_1370[1] = 0.16666666;
    afStack_1368[0] = 0.16666666;
    afStack_1368[1] = 0.16666666;
    auVar92._8_4_ = 0.16666666;
    auVar92._12_4_ = 0.16666666;
    auVar92._0_4_ = 0.16666666;
    auVar92._4_4_ = 0.16666666;
    auVar92._16_4_ = 0.16666666;
    auVar92._20_4_ = 0.16666666;
    auVar92._24_4_ = 0.16666666;
    auVar92._28_4_ = 0.16666666;
    auVar23 = vfmadd213ps_fma(auVar156,ZEXT1632(auVar23),auVar92);
    local_17b0 = ::_ps256_cephes_exp_p5;
    local_1ec0 = auVar23._0_8_;
    local_12e0 = local_1ec0;
    uStack_1eb8 = auVar23._8_8_;
    uStack_12d8 = uStack_1eb8;
    uStack_12d0 = 0;
    uStack_12c8 = 0;
    local_1300 = local_1e00;
    uStack_12f8 = uStack_1df8;
    uStack_12f0 = 0;
    uStack_12e8 = 0;
    local_1320[0] = 0.5;
    local_1320[1] = 0.5;
    afStack_1318[0] = 0.5;
    afStack_1318[1] = 0.5;
    afStack_1310[0] = 0.5;
    afStack_1310[1] = 0.5;
    afStack_1308[0] = 0.5;
    afStack_1308[1] = 0.5;
    auVar93._8_4_ = 0.5;
    auVar93._12_4_ = 0.5;
    auVar93._0_4_ = 0.5;
    auVar93._4_4_ = 0.5;
    auVar93._16_4_ = 0.5;
    auVar93._20_4_ = 0.5;
    auVar93._24_4_ = 0.5;
    auVar93._28_4_ = 0.5;
    auVar23 = vfmadd213ps_fma(auVar156,ZEXT1632(auVar23),auVar93);
    local_17c0 = local_1e20;
    local_1ec0 = auVar23._0_8_;
    local_1280 = local_1ec0;
    uStack_1eb8 = auVar23._8_8_;
    uStack_1278 = uStack_1eb8;
    uStack_1270 = 0;
    uStack_1268 = 0;
    uStack_1e18 = auVar17._8_8_;
    uStack_1298 = uStack_1e18;
    uStack_1290 = 0;
    uStack_1288 = 0;
    local_12c0 = local_1e00;
    uStack_12b8 = uStack_1df8;
    uStack_12b0 = 0;
    uStack_12a8 = 0;
    auVar23 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar23),auVar156);
    local_1ec0 = auVar23._0_8_;
    uVar35 = local_1ec0;
    uStack_1eb8 = auVar23._8_8_;
    uVar36 = uStack_1eb8;
    uStack_1db0 = 0;
    uStack_1da8 = 0;
    local_1de0 = 0x3f8000003f800000;
    uStack_1dd8 = 0x3f8000003f800000;
    uStack_1dd0 = 0x3f8000003f800000;
    uStack_1dc8 = 0x3f8000003f800000;
    local_1dc0._0_4_ = auVar23._0_4_;
    local_1dc0._4_4_ = auVar23._4_4_;
    uStack_1db8._0_4_ = auVar23._8_4_;
    uStack_1db8._4_4_ = auVar23._12_4_;
    local_1ec0._4_4_ = local_1dc0._4_4_ + 1.0;
    local_1ec0._0_4_ = (float)local_1dc0 + 1.0;
    uStack_1eb8._0_4_ = (float)uStack_1db8 + 1.0;
    uStack_1eb8._4_4_ = uStack_1db8._4_4_ + 1.0;
    uStack_1eb0._0_4_ = 0x3f800000;
    uStack_1eb0._4_4_ = 0x3f800000;
    auVar145 = _local_1ec0;
    uStack_1ea8._0_4_ = 0x3f800000;
    uStack_1ea8._4_4_ = 0x3f800000;
    auVar18 = _local_1ec0;
    local_15c0._0_4_ = local_1e40._0_4_;
    local_15c0._4_4_ = local_1e40._4_4_;
    uStack_15b8._0_4_ = local_1e40._8_4_;
    uStack_15b8._4_4_ = local_1e40._12_4_;
    uStack_15b0._0_4_ = local_1e40._16_4_;
    uStack_15b0._4_4_ = local_1e40._20_4_;
    uStack_15a8._0_4_ = local_1e40._24_4_;
    uStack_15a8._4_4_ = local_1e40._28_4_;
    local_1e60._4_4_ = (int)local_15c0._4_4_;
    local_1e60._0_4_ = (int)(float)local_15c0;
    local_1e60._8_4_ = (int)(float)uStack_15b8;
    local_1e60._12_4_ = (int)uStack_15b8._4_4_;
    local_1e60._16_4_ = (int)(float)uStack_15b0;
    local_1e60._20_4_ = (int)uStack_15b0._4_4_;
    auVar148 = local_1e60._0_24_;
    local_1e60._24_4_ = (int)(float)uStack_15a8;
    local_1e60._28_4_ = (int)uStack_15a8._4_4_;
    auVar16 = local_1e60;
    local_1580 = local_1e60._0_8_;
    uStack_1578 = local_1e60._8_8_;
    local_1e60._16_8_ = auVar148._16_8_;
    uStack_1570 = local_1e60._16_8_;
    local_1e60._24_8_ = auVar16._24_8_;
    uStack_1568 = local_1e60._24_8_;
    local_15a0 = 0x7f0000007f;
    uStack_1598 = 0x7f0000007f;
    uStack_1590 = 0x7f0000007f;
    uStack_1588 = 0x7f0000007f;
    local_d60 = local_1e60._0_8_;
    uStack_d58 = local_1e60._8_8_;
    uStack_d50 = local_1e60._16_8_;
    uStack_d48 = local_1e60._24_8_;
    local_d80 = 0x7f0000007f;
    uStack_d78 = 0x7f0000007f;
    uStack_d70 = 0x7f0000007f;
    uStack_d68 = 0x7f0000007f;
    auVar108._16_8_ = local_1e60._16_8_;
    auVar108._0_16_ = local_1e60._0_16_;
    auVar108._24_8_ = local_1e60._24_8_;
    auVar107._8_8_ = 0x7f0000007f;
    auVar107._0_8_ = 0x7f0000007f;
    auVar107._16_8_ = 0x7f0000007f;
    auVar107._24_8_ = 0x7f0000007f;
    auVar16 = vpaddd_avx2(auVar108,auVar107);
    local_1e60._0_8_ = auVar16._0_8_;
    local_1540 = local_1e60._0_8_;
    local_1e60._8_8_ = auVar16._8_8_;
    uStack_1538 = local_1e60._8_8_;
    local_1e60._16_8_ = auVar16._16_8_;
    uStack_1530 = local_1e60._16_8_;
    local_1e60._24_8_ = auVar16._24_8_;
    uStack_1528 = local_1e60._24_8_;
    local_1544 = 0x17;
    local_d20 = local_1e60._0_8_;
    uStack_d18 = local_1e60._8_8_;
    uStack_d10 = local_1e60._16_8_;
    uStack_d08 = local_1e60._24_8_;
    local_d24 = 0x17;
    local_1e60 = vpslld_avx2(auVar16,ZEXT416(0x17));
    local_1520 = local_1e60._0_8_;
    uStack_1518 = local_1e60._8_8_;
    uStack_1510 = local_1e60._16_8_;
    uStack_1508 = local_1e60._24_8_;
    local_1ee0 = local_1e60._0_8_;
    uStack_1ed8 = local_1e60._8_8_;
    uStack_1ed0 = local_1e60._16_8_;
    uStack_1ec8 = local_1e60._24_8_;
    local_1d40 = local_1ec0;
    uStack_1d38 = uStack_1eb8;
    uStack_1eb0 = auVar145._16_8_;
    uStack_1d30 = uStack_1eb0;
    uStack_1ea8 = auVar18._24_8_;
    uStack_1d28 = uStack_1ea8;
    local_1d60._0_4_ = local_1e60._0_4_;
    local_1d60._4_4_ = local_1e60._4_4_;
    uStack_1d58._0_4_ = local_1e60._8_4_;
    uStack_1d58._4_4_ = local_1e60._12_4_;
    uStack_1d50._0_4_ = local_1e60._16_4_;
    uStack_1d50._4_4_ = local_1e60._20_4_;
    uStack_1d48._0_4_ = local_1e60._24_4_;
    local_1ec0._4_4_ = (local_1dc0._4_4_ + 1.0) * local_1d60._4_4_;
    local_1ec0._0_4_ = ((float)local_1dc0 + 1.0) * (float)local_1d60;
    uStack_1eb8._0_4_ = ((float)uStack_1db8 + 1.0) * (float)uStack_1d58;
    uStack_1eb8._4_4_ = (uStack_1db8._4_4_ + 1.0) * uStack_1d58._4_4_;
    uStack_1eb0._0_4_ = (float)uStack_1d50 * 1.0;
    uStack_1eb0._4_4_ = uStack_1d50._4_4_ * 1.0;
    auVar145 = _local_1ec0;
    uStack_1ea8._0_4_ = (float)uStack_1d48 * 1.0;
    uStack_1ea8._4_4_ = 0x3f800000;
    auVar16 = _local_1ec0;
    local_4660 = local_1ec0;
    uStack_4658 = uStack_1eb8;
    uStack_1eb0 = auVar145._16_8_;
    uStack_4650 = uStack_1eb0;
    uStack_1ea8 = auVar16._24_8_;
    uStack_4648 = uStack_1ea8;
    local_4458 = local_4528;
    local_4480 = local_1ec0;
    uStack_4478 = uStack_1eb8;
    uStack_4470 = uStack_1eb0;
    uStack_4468 = uStack_1ea8;
    *(undefined1 (*) [8])local_4528 = local_1ec0;
    *(undefined8 *)(local_4528 + 2) = uStack_1eb8;
    *(undefined8 *)(local_4528 + 4) = uStack_1eb0;
    *(undefined8 *)(local_4528 + 6) = uStack_1ea8;
    local_4518 = (undefined1 (*) [64])(*local_4518 + 0x20);
    local_4520 = (undefined1 (*) [64])(*local_4520 + 0x20);
    local_4528 = local_4528 + 8;
    local_1f60 = local_4640;
    uStack_1f58 = uStack_4638;
    uStack_1f50 = uStack_4630;
    uStack_1f48 = uStack_4628;
    local_1f40 = local_4620;
    uStack_1f38 = uStack_4618;
    uStack_1f30 = uStack_4610;
    uStack_1f28 = uStack_4608;
    local_1f20 = local_1c60;
    uStack_1f18 = uStack_1c58;
    uStack_1f10 = uStack_1c50;
    uStack_1f08 = uStack_1c48;
    local_1f00 = local_4640;
    uStack_1ef8 = uStack_4638;
    uStack_1ef0 = uStack_4630;
    uStack_1ee8 = uStack_4628;
    _local_1ec0 = auVar16;
    _local_1e20 = auVar19;
    _local_1e00 = auVar156;
    local_1dc0 = uVar35;
    uStack_1db8 = uVar36;
    local_1d60 = local_1e60._0_8_;
    uStack_1d58 = local_1e60._8_8_;
    uStack_1d50 = local_1e60._16_8_;
    uStack_1d48 = local_1e60._24_8_;
    local_1d00 = local_1d20;
    uStack_1cf8 = uStack_1d18;
    uStack_1cf0 = uStack_1d10;
    uStack_1ce8 = uStack_1d08;
    _local_1b60 = ZEXT1632(auVar22);
    local_1b40 = uVar33;
    uStack_1b38 = uVar34;
    local_1b00 = local_1c20._0_8_;
    uStack_1af8 = local_1c20._8_8_;
    uStack_1af0 = local_1c20._16_8_;
    uStack_1ae8 = local_1c20._24_8_;
    local_1ae0 = uVar27;
    uStack_1ad8 = uVar28;
    uStack_1ad0 = uVar29;
    uStack_1ac8 = uVar30;
    local_1aa0 = uVar21;
    uStack_1a98 = uVar24;
    uStack_1a90 = uVar25;
    uStack_1a88 = uVar26;
    local_19a0 = uVar31;
    uStack_1998 = uVar32;
    local_1960 = local_1980;
    uStack_1958 = uStack_1978;
    uStack_1950 = uStack_1970;
    uStack_1948 = uStack_1968;
    uStack_1910 = uStack_4610;
    uStack_1908 = uStack_4608;
    local_1890 = local_18a8;
    local_1880 = local_18b8;
    local_1878 = local_18a0;
    local_1868 = local_18b8;
    local_1860 = local_18a0;
    local_1850 = local_18b8;
    local_1848 = local_18a0;
    local_1838 = local_18b8;
    local_1830 = local_18a0;
    local_1820 = local_18b8;
    local_1818 = local_18a0;
    local_1808 = local_18b8;
    local_1800 = local_18a0;
    local_17f0 = local_18b8;
    local_17e8 = local_18a0;
    local_17d8 = local_18b8;
    local_17d0 = local_18a0;
    local_17a8 = local_17c8;
    local_17a0 = local_17b8;
    local_1790 = local_17c8;
    local_1788 = local_17b8;
    local_1778 = local_17c8;
    local_1770 = local_17b8;
    local_1760 = local_17c8;
    local_1758 = local_17b8;
    local_1748 = local_17c8;
    local_1740 = local_17b8;
    local_1728 = local_17c8;
    local_1608 = local_18a0;
    local_15f0 = local_17c8;
    local_15d8 = local_17c8;
    local_15c8 = local_15e0;
    local_15c0 = local_1e40._0_8_;
    uStack_15b8 = local_1e40._8_8_;
    uStack_15b0 = local_1e40._16_8_;
    uStack_15a8 = local_1e40._24_8_;
  }
  for (; local_452c = in_ECX, local_4534 + 3 < in_ECX; local_4534 = local_4534 + 4) {
    local_4448 = local_4518;
    local_4670 = *(undefined8 *)*local_4518;
    uStack_4668 = *(undefined8 *)(*local_4518 + 8);
    local_4450 = local_4520;
    local_4680 = *(undefined8 *)*local_4520;
    uStack_4678 = *(undefined8 *)(*local_4520 + 8);
    local_43e0 = &local_452d;
    local_43e8 = &local_4670;
    local_43f0 = &local_4680;
    local_920 = 0x3f800000;
    uStack_91c = 0x3f800000;
    uStack_918 = 0x3f800000;
    uStack_914 = 0x3f800000;
    local_7d0 = (undefined1  [16])0x0;
    local_120 = 0;
    uStack_118 = 0;
    local_930 = vcmpps_avx(*(undefined1 (*) [16])*local_4518,ZEXT816(0),2);
    local_7f0 = 0x800000;
    uStack_7ec = 0x800000;
    uStack_7e8 = 0x800000;
    uStack_7e4 = 0x800000;
    auVar113._8_4_ = 0x800000;
    auVar113._0_8_ = 0x80000000800000;
    auVar113._12_4_ = 0x800000;
    auVar22 = vmaxps_avx(*(undefined1 (*) [16])*local_4518,auVar113);
    local_900 = auVar22._0_8_;
    local_e0 = local_900;
    uStack_8f8 = auVar22._8_8_;
    uStack_d8 = uStack_8f8;
    local_f0 = local_900;
    uStack_e8 = uStack_8f8;
    local_f4 = 0x17;
    auVar17 = vpsrld_avx(auVar22,ZEXT416(0x17));
    local_700 = local_900;
    uStack_6f8 = uStack_8f8;
    local_710 = 0x807fffff;
    uStack_70c = 0x807fffff;
    uStack_708 = 0x807fffff;
    uStack_704 = 0x807fffff;
    auVar117._8_4_ = 0x807fffff;
    auVar117._0_8_ = 0x807fffff807fffff;
    auVar117._12_4_ = 0x807fffff;
    auVar22 = vpand_avx(auVar22,auVar117);
    local_900 = auVar22._0_8_;
    local_a0 = local_900;
    uStack_8f8 = auVar22._8_8_;
    uStack_98 = uStack_8f8;
    local_b0 = 0x3f000000;
    uStack_ac = 0x3f000000;
    uStack_a8 = 0x3f000000;
    uStack_a4 = 0x3f000000;
    auVar139._8_4_ = 0x3f000000;
    auVar139._0_8_ = 0x3f0000003f000000;
    auVar139._12_4_ = 0x3f000000;
    auVar23 = vpor_avx(auVar22,auVar139);
    local_910._0_8_ = auVar17._0_8_;
    local_80 = local_910._0_8_;
    local_910._8_8_ = auVar17._8_8_;
    uStack_78 = local_910._8_8_;
    local_90 = 0x7f0000007f;
    uStack_88 = 0x7f0000007f;
    auVar140._8_8_ = 0x7f0000007f;
    auVar140._0_8_ = 0x7f0000007f;
    local_910 = vpsubd_avx(auVar17,auVar140);
    local_790 = local_910._0_8_;
    uStack_788 = local_910._8_8_;
    auVar22 = vcvtdq2ps_avx(local_910);
    local_940 = auVar22._0_8_;
    uVar21 = local_940;
    uStack_938 = auVar22._8_8_;
    uVar24 = uStack_938;
    local_8b0 = 0x3f8000003f800000;
    uStack_8a8 = 0x3f8000003f800000;
    local_8a0._0_4_ = auVar22._0_4_;
    local_8a0._4_4_ = auVar22._4_4_;
    uStack_898._0_4_ = auVar22._8_4_;
    uStack_898._4_4_ = auVar22._12_4_;
    local_940._4_4_ = local_8a0._4_4_ + 1.0;
    local_940._0_4_ = (float)local_8a0 + 1.0;
    uStack_938._0_4_ = (float)uStack_898 + 1.0;
    uStack_938._4_4_ = uStack_898._4_4_ + 1.0;
    local_900 = auVar23._0_8_;
    local_60 = local_900;
    uStack_8f8 = auVar23._8_8_;
    uStack_58 = uStack_8f8;
    local_70 = 0x3f3504f3;
    uStack_6c = 0x3f3504f3;
    uStack_68 = 0x3f3504f3;
    uStack_64 = 0x3f3504f3;
    auVar141._8_4_ = 0x3f3504f3;
    auVar141._0_8_ = 0x3f3504f33f3504f3;
    auVar141._12_4_ = 0x3f3504f3;
    local_950 = vcmpps_avx(auVar23,auVar141,1);
    local_720 = local_900;
    uStack_718 = uStack_8f8;
    local_730 = local_950._0_8_;
    uStack_728 = local_950._8_8_;
    local_960 = vpand_avx(auVar23,local_950);
    local_860 = local_900;
    uStack_858 = uStack_8f8;
    local_870 = 0x3f8000003f800000;
    uStack_868 = 0x3f8000003f800000;
    auVar112._8_8_ = 0x3f8000003f800000;
    auVar112._0_8_ = 0x3f8000003f800000;
    auVar22 = vsubps_avx(auVar23,auVar112);
    local_880 = local_940;
    uStack_878 = uStack_938;
    local_740 = 0x3f8000003f800000;
    uStack_738 = 0x3f8000003f800000;
    local_750 = local_950._0_8_;
    uStack_748 = local_950._8_8_;
    auVar116._8_8_ = 0x3f8000003f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    local_890 = vpand_avx(auVar116,local_950);
    auVar111._8_8_ = uStack_938;
    auVar111._0_8_ = local_940;
    _local_940 = vsubps_avx(auVar111,local_890);
    local_900 = auVar22._0_8_;
    uVar25 = local_900;
    uStack_8f8 = auVar22._8_8_;
    uVar26 = uStack_8f8;
    local_8c0._0_4_ = auVar22._0_4_;
    local_8c0._4_4_ = auVar22._4_4_;
    uStack_8b8._0_4_ = auVar22._8_4_;
    uStack_8b8._4_4_ = auVar22._12_4_;
    local_8d0._0_4_ = local_960._0_4_;
    local_8d0._4_4_ = local_960._4_4_;
    uStack_8c8._0_4_ = local_960._8_4_;
    uStack_8c8._4_4_ = local_960._12_4_;
    local_900._0_4_ = (float)local_8c0 + (float)local_8d0;
    local_900._4_4_ = local_8c0._4_4_ + local_8d0._4_4_;
    uStack_8b8._0_4_ = (float)uStack_8b8 + (float)uStack_8c8;
    uStack_8b8._4_4_ = uStack_8b8._4_4_ + uStack_8c8._4_4_;
    uStack_8f8._0_4_ = (float)uStack_8b8;
    uStack_8f8._4_4_ = uStack_8b8._4_4_;
    local_810 = local_900;
    uStack_808 = uStack_8f8;
    local_970 = (float)local_900._0_4_ * (float)local_900._0_4_;
    fStack_96c = (float)local_900._4_4_ * (float)local_900._4_4_;
    fStack_968 = (float)uStack_8b8 * (float)uStack_8b8;
    fStack_964 = uStack_8b8._4_4_ * uStack_8b8._4_4_;
    uStack_978._0_4_ = 0x3d9021bb;
    local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_978._4_4_ = 0x3d9021bb;
    local_6c8 = local_980;
    local_680 = local_900;
    local_5a8 = ::_ps_cephes_log_p1;
    local_2e0 = 0x3d9021bb3d9021bb;
    uStack_2d8 = uStack_978;
    local_2f0 = local_900;
    uStack_2e8 = uStack_8f8;
    local_300[0] = -0.1151461;
    local_300[1] = -0.1151461;
    afStack_2f8[0] = -0.1151461;
    afStack_2f8[1] = -0.1151461;
    auVar129._8_4_ = -0.1151461;
    auVar129._12_4_ = -0.1151461;
    auVar129._0_4_ = -0.1151461;
    auVar129._4_4_ = -0.1151461;
    auVar22 = vfmadd213ps_fma(_local_900,_local_980,auVar129);
    local_5c0 = ::_ps_cephes_log_p2;
    local_980 = auVar22._0_8_;
    local_2b0 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_2a8 = uStack_978;
    local_2c0 = local_900;
    uStack_2b8 = uStack_8f8;
    local_2d0[0] = 0.116769984;
    local_2d0[1] = 0.116769984;
    afStack_2c8[0] = 0.116769984;
    afStack_2c8[1] = 0.116769984;
    auVar130._8_4_ = 0.116769984;
    auVar130._12_4_ = 0.116769984;
    auVar130._0_4_ = 0.116769984;
    auVar130._4_4_ = 0.116769984;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar130);
    local_5d8 = ::_ps_cephes_log_p3;
    local_980 = auVar22._0_8_;
    local_280 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_278 = uStack_978;
    local_290 = local_900;
    uStack_288 = uStack_8f8;
    local_2a0[0] = -0.12420141;
    local_2a0[1] = -0.12420141;
    afStack_298[0] = -0.12420141;
    afStack_298[1] = -0.12420141;
    auVar131._8_4_ = -0.12420141;
    auVar131._12_4_ = -0.12420141;
    auVar131._0_4_ = -0.12420141;
    auVar131._4_4_ = -0.12420141;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar131);
    local_5f0 = ::_ps_cephes_log_p4;
    local_980 = auVar22._0_8_;
    local_250 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_248 = uStack_978;
    local_260 = local_900;
    uStack_258 = uStack_8f8;
    local_270[0] = 0.14249323;
    local_270[1] = 0.14249323;
    afStack_268[0] = 0.14249323;
    afStack_268[1] = 0.14249323;
    auVar132._8_4_ = 0.14249323;
    auVar132._12_4_ = 0.14249323;
    auVar132._0_4_ = 0.14249323;
    auVar132._4_4_ = 0.14249323;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar132);
    local_608 = ::_ps_cephes_log_p5;
    local_980 = auVar22._0_8_;
    local_220 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_218 = uStack_978;
    local_230 = local_900;
    uStack_228 = uStack_8f8;
    local_240[0] = -0.16668057;
    local_240[1] = -0.16668057;
    afStack_238[0] = -0.16668057;
    afStack_238[1] = -0.16668057;
    auVar133._8_4_ = -0.16668057;
    auVar133._12_4_ = -0.16668057;
    auVar133._0_4_ = -0.16668057;
    auVar133._4_4_ = -0.16668057;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar133);
    local_620 = ::_ps_cephes_log_p6;
    local_980 = auVar22._0_8_;
    local_1f0 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_1e8 = uStack_978;
    local_200 = local_900;
    uStack_1f8 = uStack_8f8;
    local_210[0] = 0.20000714;
    local_210[1] = 0.20000714;
    afStack_208[0] = 0.20000714;
    afStack_208[1] = 0.20000714;
    auVar134._8_4_ = 0.20000714;
    auVar134._12_4_ = 0.20000714;
    auVar134._0_4_ = 0.20000714;
    auVar134._4_4_ = 0.20000714;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar134);
    local_638 = ::_ps_cephes_log_p7;
    local_980 = auVar22._0_8_;
    local_1c0 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_1b8 = uStack_978;
    local_1d0 = local_900;
    uStack_1c8 = uStack_8f8;
    local_1e0[0] = -0.24999994;
    local_1e0[1] = -0.24999994;
    afStack_1d8[0] = -0.24999994;
    afStack_1d8[1] = -0.24999994;
    auVar135._8_4_ = -0.24999994;
    auVar135._12_4_ = -0.24999994;
    auVar135._0_4_ = -0.24999994;
    auVar135._4_4_ = -0.24999994;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar135);
    local_650 = ::_ps_cephes_log_p8;
    local_980 = auVar22._0_8_;
    local_190 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_188 = uStack_978;
    local_1a0 = local_900;
    uStack_198 = uStack_8f8;
    local_1b0[0] = 0.3333333;
    local_1b0[1] = 0.3333333;
    afStack_1a8[0] = 0.3333333;
    afStack_1a8[1] = 0.3333333;
    auVar136._8_4_ = 0.3333333;
    auVar136._12_4_ = 0.3333333;
    auVar136._0_4_ = 0.3333333;
    auVar136._4_4_ = 0.3333333;
    auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar136);
    local_980 = auVar22._0_8_;
    uVar27 = local_980;
    uStack_978 = auVar22._8_8_;
    uVar28 = uStack_978;
    local_830 = local_900;
    uStack_828 = uStack_8f8;
    local_820._0_4_ = auVar22._0_4_;
    local_820._4_4_ = auVar22._4_4_;
    uStack_818._0_4_ = auVar22._8_4_;
    uStack_818._4_4_ = auVar22._12_4_;
    local_980._4_4_ = local_820._4_4_ * (float)local_900._4_4_;
    local_980._0_4_ = (float)local_820 * (float)local_900._0_4_;
    uStack_978._0_4_ = (float)uStack_818 * (float)uStack_8b8;
    uStack_978._4_4_ = uStack_818._4_4_ * uStack_8b8._4_4_;
    local_840 = local_980;
    uStack_838 = uStack_978;
    local_850 = CONCAT44(fStack_96c,local_970);
    uStack_848 = CONCAT44(fStack_964,fStack_968);
    local_980._4_4_ = local_820._4_4_ * (float)local_900._4_4_ * fStack_96c;
    local_980._0_4_ = (float)local_820 * (float)local_900._0_4_ * local_970;
    uStack_978._0_4_ = (float)uStack_818 * (float)uStack_8b8 * fStack_968;
    uStack_978._4_4_ = uStack_818._4_4_ * uStack_8b8._4_4_ * fStack_964;
    local_670 = local_940;
    local_660 = ::_ps_cephes_log_q1;
    local_160 = local_940;
    uStack_158 = uStack_938;
    local_170[0] = -0.00021219444;
    local_170[1] = -0.00021219444;
    afStack_168[0] = -0.00021219444;
    afStack_168[1] = -0.00021219444;
    local_180 = local_980;
    uStack_178 = uStack_978;
    auVar137._8_4_ = -0.00021219444;
    auVar137._12_4_ = -0.00021219444;
    auVar137._0_4_ = -0.00021219444;
    auVar137._4_4_ = -0.00021219444;
    auVar22 = vfmadd213ps_fma(auVar137,_local_940,_local_980);
    local_6b8 = &local_970;
    local_6c0 = ::_ps_0p5;
    local_430 = CONCAT44(fStack_96c,local_970);
    uStack_428 = CONCAT44(fStack_964,fStack_968);
    auVar143._4_4_ = fStack_96c;
    auVar143._0_4_ = local_970;
    auVar143._8_4_ = fStack_968;
    auVar143._12_4_ = fStack_964;
    local_440[0] = 0.5;
    local_440[1] = 0.5;
    afStack_438[0] = 0.5;
    afStack_438[1] = 0.5;
    local_980 = auVar22._0_8_;
    local_450 = local_980;
    uStack_978 = auVar22._8_8_;
    uStack_448 = uStack_978;
    auVar123._8_4_ = 0.5;
    auVar123._12_4_ = 0.5;
    auVar123._0_4_ = 0.5;
    auVar123._4_4_ = 0.5;
    _local_980 = vfnmadd213ps_fma(auVar123,auVar143,auVar22);
    local_8e0 = local_900;
    uStack_8d8 = uStack_8f8;
    local_8f0._0_4_ = local_980._0_4_;
    local_8f0._4_4_ = local_980._4_4_;
    uStack_8e8._0_4_ = local_980._8_4_;
    uStack_8e8._4_4_ = local_980._12_4_;
    local_900._4_4_ = (float)local_900._4_4_ + local_8f0._4_4_;
    local_900._0_4_ = (float)local_900._0_4_ + (float)local_8f0;
    uStack_8f8._0_4_ = (float)uStack_8b8 + (float)uStack_8e8;
    uStack_8f8._4_4_ = uStack_8b8._4_4_ + uStack_8e8._4_4_;
    local_678 = ::_ps_cephes_log_q2;
    local_130 = local_940;
    uStack_128 = uStack_938;
    local_140[0] = 0.6933594;
    local_140[1] = 0.6933594;
    afStack_138[0] = 0.6933594;
    afStack_138[1] = 0.6933594;
    local_150 = local_900;
    uStack_148 = uStack_8f8;
    auVar138._8_4_ = 0.6933594;
    auVar138._12_4_ = 0.6933594;
    auVar138._0_4_ = 0.6933594;
    auVar138._4_4_ = 0.6933594;
    auVar22 = vfmadd213ps_fma(auVar138,_local_940,_local_900);
    local_900 = auVar22._0_8_;
    local_c0 = local_900;
    uStack_8f8 = auVar22._8_8_;
    uStack_b8 = uStack_8f8;
    local_d0 = local_930._0_8_;
    uStack_c8 = local_930._8_8_;
    _local_900 = vpor_avx(auVar22,local_930);
    local_b10._0_4_ = (float)local_4680;
    local_b10._4_4_ = (float)((ulong)local_4680 >> 0x20);
    uStack_b08._0_4_ = (float)uStack_4678;
    uStack_b08._4_4_ = (float)((ulong)uStack_4678 >> 0x20);
    local_b20._0_4_ = local_900._0_4_;
    local_b20._4_4_ = local_900._4_4_;
    uStack_b18._0_4_ = local_900._8_4_;
    uStack_b18._4_4_ = local_900._12_4_;
    local_a90._4_4_ = local_b10._4_4_ * local_b20._4_4_;
    local_a90._0_4_ = (float)local_b10 * (float)local_b20;
    uStack_a88._0_4_ = (float)uStack_b08 * (float)uStack_b18;
    uStack_a88._4_4_ = uStack_b08._4_4_ * uStack_b18._4_4_;
    local_7c0 = (undefined1  [16])0x0;
    local_ad0 = 0x3f800000;
    uStack_acc = 0x3f800000;
    uStack_ac8 = 0x3f800000;
    uStack_ac4 = 0x3f800000;
    local_990 = local_a90;
    uStack_988 = uStack_a88;
    local_9a0 = 0x42b0c0a5;
    uStack_99c = 0x42b0c0a5;
    uStack_998 = 0x42b0c0a5;
    uStack_994 = 0x42b0c0a5;
    auVar17._8_8_ = uStack_a88;
    auVar17._0_8_ = local_a90;
    auVar22._8_4_ = 0x42b0c0a5;
    auVar22._0_8_ = 0x42b0c0a542b0c0a5;
    auVar22._12_4_ = 0x42b0c0a5;
    auVar22 = vminps_avx(auVar17,auVar22);
    local_a90 = auVar22._0_8_;
    local_9b0 = local_a90;
    uStack_a88 = auVar22._8_8_;
    uStack_9a8 = uStack_a88;
    local_9c0 = 0xc2b0c0a5;
    uStack_9bc = 0xc2b0c0a5;
    uStack_9b8 = 0xc2b0c0a5;
    uStack_9b4 = 0xc2b0c0a5;
    auVar23._8_4_ = 0xc2b0c0a5;
    auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar23._12_4_ = 0xc2b0c0a5;
    auVar17 = vmaxps_avx(auVar22,auVar23);
    local_a90 = auVar17._0_8_;
    uVar29 = local_a90;
    uStack_a88 = auVar17._8_8_;
    uVar30 = uStack_a88;
    local_9e0 = 0x3fb8aa3b;
    uStack_9dc = 0x3fb8aa3b;
    uStack_9d8 = 0x3fb8aa3b;
    uStack_9d4 = 0x3fb8aa3b;
    local_9d0._0_4_ = auVar17._0_4_;
    local_9d0._4_4_ = auVar17._4_4_;
    uStack_9c8._0_4_ = auVar17._8_4_;
    uStack_9c8._4_4_ = auVar17._12_4_;
    local_ab0._4_4_ = local_9d0._4_4_ * 1.442695;
    local_ab0._0_4_ = (float)local_9d0 * 1.442695;
    uStack_aa8._0_4_ = (float)uStack_9c8 * 1.442695;
    uStack_aa8._4_4_ = uStack_9c8._4_4_ * 1.442695;
    local_a50 = local_ab0;
    uStack_a48 = uStack_aa8;
    local_a60 = 0x3f000000;
    uStack_a5c = 0x3f000000;
    uStack_a58 = 0x3f000000;
    uStack_a54 = 0x3f000000;
    local_ab0._0_4_ = (float)local_9d0 * 1.442695 + 0.5;
    local_ab0._4_4_ = local_9d0._4_4_ * 1.442695 + 0.5;
    fVar157 = (float)uStack_9c8 * 1.442695 + 0.5;
    fVar158 = uStack_9c8._4_4_ * 1.442695 + 0.5;
    uStack_aa8._0_4_ = fVar157;
    uStack_aa8._4_4_ = fVar158;
    local_7a0 = local_ab0;
    uStack_798 = uStack_aa8;
    local_ac0._4_4_ = (int)(float)local_ab0._4_4_;
    local_ac0._0_4_ = (int)(float)local_ab0._0_4_;
    local_ac0._8_4_ = (int)fVar157;
    local_ac0._12_4_ = (int)fVar158;
    local_780 = local_ac0._0_8_;
    uStack_778 = local_ac0._8_8_;
    auVar114._8_8_ = local_ac0._8_8_;
    auVar114._0_8_ = local_ac0._0_8_;
    auVar23 = vcvtdq2ps_avx(auVar114);
    local_aa0 = auVar23._0_8_;
    local_760 = local_aa0;
    uStack_a98 = auVar23._8_8_;
    uStack_758 = uStack_a98;
    local_770 = local_ab0;
    uStack_768 = uStack_aa8;
    auVar115._8_8_ = uStack_aa8;
    auVar115._0_8_ = local_ab0;
    auVar22 = vcmpps_avx(auVar115,auVar23,1);
    local_ae0._0_8_ = auVar22._0_8_;
    local_6e0 = local_ae0._0_8_;
    local_ae0._8_8_ = auVar22._8_8_;
    uStack_6d8 = local_ae0._8_8_;
    local_6f0 = 0x3f8000003f800000;
    uStack_6e8 = 0x3f8000003f800000;
    auVar118._8_8_ = 0x3f8000003f800000;
    auVar118._0_8_ = 0x3f8000003f800000;
    local_ae0 = vpand_avx(auVar22,auVar118);
    local_a30 = local_aa0;
    uStack_a28 = uStack_a98;
    local_a40 = local_ae0._0_8_;
    uStack_a38 = local_ae0._8_8_;
    _local_ab0 = vsubps_avx(auVar23,local_ae0);
    local_6a0 = local_ab0;
    local_690 = ::_ps_cephes_exp_C1;
    local_6b0 = local_a90;
    local_490 = local_ab0;
    uStack_488 = uStack_aa8;
    local_4a0[0] = 0.6933594;
    local_4a0[1] = 0.6933594;
    afStack_498[0] = 0.6933594;
    afStack_498[1] = 0.6933594;
    local_4b0 = local_a90;
    uStack_4a8 = uStack_a88;
    auVar121._8_4_ = 0.6933594;
    auVar121._12_4_ = 0.6933594;
    auVar121._0_4_ = 0.6933594;
    auVar121._4_4_ = 0.6933594;
    auVar22 = vfnmadd213ps_fma(auVar121,_local_ab0,auVar17);
    local_6a8 = ::_ps_cephes_exp_C2;
    local_460 = local_ab0;
    uStack_458 = uStack_aa8;
    local_470[0] = -0.00021219444;
    local_470[1] = -0.00021219444;
    afStack_468[0] = -0.00021219444;
    afStack_468[1] = -0.00021219444;
    local_a90 = auVar22._0_8_;
    local_480 = local_a90;
    uStack_a88 = auVar22._8_8_;
    uStack_478 = uStack_a88;
    auVar122._8_4_ = -0.00021219444;
    auVar122._12_4_ = -0.00021219444;
    auVar122._0_4_ = -0.00021219444;
    auVar122._4_4_ = -0.00021219444;
    _local_a90 = vfnmadd213ps_fma(auVar122,_local_ab0,auVar22);
    local_a00 = local_a90;
    uStack_9f8 = uStack_a88;
    local_9f0._0_4_ = local_a90._0_4_;
    local_9f0._4_4_ = local_a90._4_4_;
    uStack_9e8._0_4_ = local_a90._8_4_;
    uStack_9e8._4_4_ = local_a90._12_4_;
    local_aa0._4_4_ = local_9f0._4_4_ * local_9f0._4_4_;
    local_aa0._0_4_ = (float)local_9f0 * (float)local_9f0;
    uStack_a98._0_4_ = (float)uStack_9e8 * (float)uStack_9e8;
    uStack_a98._4_4_ = uStack_9e8._4_4_ * uStack_9e8._4_4_;
    uStack_ae8._0_4_ = 0x39506967;
    local_af0 = (undefined1  [8])0x3950696739506967;
    uStack_ae8._4_4_ = 0x39506967;
    local_580 = local_af0;
    local_518 = ::_ps_cephes_exp_p1;
    local_400 = 0x3950696739506967;
    uStack_3f8 = uStack_ae8;
    local_410 = local_a90;
    uStack_408 = uStack_a88;
    local_420[0] = 0.0013981999;
    local_420[1] = 0.0013981999;
    afStack_418[0] = 0.0013981999;
    afStack_418[1] = 0.0013981999;
    auVar124._8_4_ = 0.0013981999;
    auVar124._12_4_ = 0.0013981999;
    auVar124._0_4_ = 0.0013981999;
    auVar124._4_4_ = 0.0013981999;
    auVar22 = vfmadd213ps_fma(_local_a90,_local_af0,auVar124);
    local_530 = ::_ps_cephes_exp_p2;
    local_af0 = auVar22._0_8_;
    local_3d0 = local_af0;
    uStack_ae8 = auVar22._8_8_;
    uStack_3c8 = uStack_ae8;
    local_3e0 = local_a90;
    uStack_3d8 = uStack_a88;
    local_3f0[0] = 0.008333452;
    local_3f0[1] = 0.008333452;
    afStack_3e8[0] = 0.008333452;
    afStack_3e8[1] = 0.008333452;
    auVar125._8_4_ = 0.008333452;
    auVar125._12_4_ = 0.008333452;
    auVar125._0_4_ = 0.008333452;
    auVar125._4_4_ = 0.008333452;
    auVar22 = vfmadd213ps_fma(_local_a90,auVar22,auVar125);
    local_548 = ::_ps_cephes_exp_p3;
    local_af0 = auVar22._0_8_;
    local_3a0 = local_af0;
    uStack_ae8 = auVar22._8_8_;
    uStack_398 = uStack_ae8;
    local_3b0 = local_a90;
    uStack_3a8 = uStack_a88;
    local_3c0[0] = 0.041665796;
    local_3c0[1] = 0.041665796;
    afStack_3b8[0] = 0.041665796;
    afStack_3b8[1] = 0.041665796;
    auVar126._8_4_ = 0.041665796;
    auVar126._12_4_ = 0.041665796;
    auVar126._0_4_ = 0.041665796;
    auVar126._4_4_ = 0.041665796;
    auVar22 = vfmadd213ps_fma(_local_a90,auVar22,auVar126);
    local_560 = ::_ps_cephes_exp_p4;
    local_af0 = auVar22._0_8_;
    local_370 = local_af0;
    uStack_ae8 = auVar22._8_8_;
    uStack_368 = uStack_ae8;
    local_380 = local_a90;
    uStack_378 = uStack_a88;
    local_390[0] = 0.16666666;
    local_390[1] = 0.16666666;
    afStack_388[0] = 0.16666666;
    afStack_388[1] = 0.16666666;
    auVar127._8_4_ = 0.16666666;
    auVar127._12_4_ = 0.16666666;
    auVar127._0_4_ = 0.16666666;
    auVar127._4_4_ = 0.16666666;
    auVar22 = vfmadd213ps_fma(_local_a90,auVar22,auVar127);
    local_578 = ::_ps_cephes_exp_p5;
    local_af0 = auVar22._0_8_;
    local_340 = local_af0;
    uStack_ae8 = auVar22._8_8_;
    uStack_338 = uStack_ae8;
    local_350 = local_a90;
    uStack_348 = uStack_a88;
    local_360[0] = 0.5;
    local_360[1] = 0.5;
    afStack_358[0] = 0.5;
    afStack_358[1] = 0.5;
    auVar128._8_4_ = 0.5;
    auVar128._12_4_ = 0.5;
    auVar128._0_4_ = 0.5;
    auVar128._4_4_ = 0.5;
    auVar22 = vfmadd213ps_fma(_local_a90,auVar22,auVar128);
    local_588 = local_aa0;
    local_af0 = auVar22._0_8_;
    local_310 = local_af0;
    uStack_ae8 = auVar22._8_8_;
    uStack_308 = uStack_ae8;
    local_320 = local_aa0;
    uStack_318 = uStack_a98;
    local_330 = local_a90;
    uStack_328 = uStack_a88;
    auVar22 = vfmadd213ps_fma(_local_aa0,auVar22,_local_a90);
    local_af0 = auVar22._0_8_;
    uVar31 = local_af0;
    uStack_ae8 = auVar22._8_8_;
    uVar32 = uStack_ae8;
    local_a80 = 0x3f8000003f800000;
    uStack_a78 = 0x3f8000003f800000;
    local_a70._0_4_ = auVar22._0_4_;
    local_a70._4_4_ = auVar22._4_4_;
    uStack_a68._0_4_ = auVar22._8_4_;
    uStack_a68._4_4_ = auVar22._12_4_;
    local_af0._4_4_ = local_a70._4_4_ + 1.0;
    local_af0._0_4_ = (float)local_a70 + 1.0;
    uStack_ae8._0_4_ = (float)uStack_a68 + 1.0;
    uStack_ae8._4_4_ = uStack_a68._4_4_ + 1.0;
    local_7b0._0_4_ = local_ab0._0_4_;
    local_7b0._4_4_ = local_ab0._4_4_;
    uStack_7a8._0_4_ = local_ab0._8_4_;
    uStack_7a8._4_4_ = local_ab0._12_4_;
    local_ac0._4_4_ = (int)local_7b0._4_4_;
    local_ac0._0_4_ = (int)(float)local_7b0;
    local_ac0._8_4_ = (int)(float)uStack_7a8;
    local_ac0._12_4_ = (int)uStack_7a8._4_4_;
    local_4f0 = local_ac0._0_8_;
    uStack_4e8 = local_ac0._8_8_;
    local_500 = 0x7f0000007f;
    uStack_4f8 = 0x7f0000007f;
    auVar120._8_8_ = local_ac0._8_8_;
    auVar120._0_8_ = local_ac0._0_8_;
    auVar119._8_8_ = 0x7f0000007f;
    auVar119._0_8_ = 0x7f0000007f;
    auVar22 = vpaddd_avx(auVar120,auVar119);
    local_ac0._0_8_ = auVar22._0_8_;
    local_4d0 = local_ac0._0_8_;
    local_ac0._8_8_ = auVar22._8_8_;
    uStack_4c8 = local_ac0._8_8_;
    local_4d4 = 0x17;
    local_ac0 = vpslld_avx(auVar22,ZEXT416(0x17));
    local_4c0 = local_ac0._0_8_;
    uStack_4b8 = local_ac0._8_8_;
    local_b00 = local_ac0._0_8_;
    uStack_af8 = local_ac0._8_8_;
    local_a10 = local_af0;
    uStack_a08 = uStack_ae8;
    local_a20._0_4_ = local_ac0._0_4_;
    local_a20._4_4_ = local_ac0._4_4_;
    uStack_a18._0_4_ = local_ac0._8_4_;
    uStack_a18._4_4_ = local_ac0._12_4_;
    local_af0._4_4_ = (local_a70._4_4_ + 1.0) * local_a20._4_4_;
    local_af0._0_4_ = ((float)local_a70 + 1.0) * (float)local_a20;
    uStack_ae8._0_4_ = ((float)uStack_a68 + 1.0) * (float)uStack_a18;
    uStack_ae8._4_4_ = (uStack_a68._4_4_ + 1.0) * uStack_a18._4_4_;
    local_4428 = local_4528;
    local_4440 = local_af0;
    uStack_4438 = uStack_ae8;
    *(undefined1 (*) [8])local_4528 = local_af0;
    *(undefined8 *)(local_4528 + 2) = uStack_ae8;
    local_4518 = (undefined1 (*) [64])(*local_4518 + 0x10);
    local_4520 = (undefined1 (*) [64])(*local_4520 + 0x10);
    local_4528 = local_4528 + 4;
    local_b40 = local_4680;
    uStack_b38 = uStack_4678;
    local_b30 = local_4670;
    uStack_b28 = uStack_4668;
    local_b20 = local_900;
    uStack_b18 = uStack_8f8;
    local_b10 = local_4680;
    uStack_b08 = uStack_4678;
    local_a70 = uVar31;
    uStack_a68 = uVar32;
    local_a20 = local_ac0._0_8_;
    uStack_a18 = local_ac0._8_8_;
    local_9f0 = local_a00;
    uStack_9e8 = uStack_9f8;
    local_9d0 = uVar29;
    uStack_9c8 = uVar30;
    local_8f0 = local_980;
    uStack_8e8 = uStack_978;
    local_8d0 = local_960._0_8_;
    uStack_8c8 = local_960._8_8_;
    local_8c0 = uVar25;
    uStack_8b8 = uVar26;
    local_8a0 = uVar21;
    uStack_898 = uVar24;
    local_820 = uVar27;
    uStack_818 = uVar28;
    local_800 = local_810;
    uStack_7f8 = uStack_808;
    local_7e0 = local_4670;
    uStack_7d8 = uStack_4668;
    local_7b0 = local_ab0;
    uStack_7a8 = uStack_aa8;
    local_698 = local_6b0;
    local_688 = local_6a0;
    local_668 = local_6c8;
    local_658 = local_670;
    local_648 = local_680;
    local_640 = local_6c8;
    local_630 = local_680;
    local_628 = local_6c8;
    local_618 = local_680;
    local_610 = local_6c8;
    local_600 = local_680;
    local_5f8 = local_6c8;
    local_5e8 = local_680;
    local_5e0 = local_6c8;
    local_5d0 = local_680;
    local_5c8 = local_6c8;
    local_5b8 = local_680;
    local_5b0 = local_6c8;
    local_5a0 = local_680;
    local_598 = local_6c8;
    local_590 = local_6b0;
    local_570 = local_6b0;
    local_568 = local_580;
    local_558 = local_6b0;
    local_550 = local_580;
    local_540 = local_6b0;
    local_538 = local_580;
    local_528 = local_6b0;
    local_520 = local_580;
    local_510 = local_6b0;
    local_508 = local_580;
    local_110 = local_4670;
    uStack_108 = uStack_4668;
  }
  for (; local_4534 < local_452c; local_4534 = local_4534 + 1) {
    local_43c8 = &local_452d;
    local_43d0 = local_4518;
    local_43d8 = local_4520;
    fVar157 = powf(*(float *)*local_4518,*(float *)*local_4520);
    *local_4528 = fVar157;
    local_4518 = (undefined1 (*) [64])(*local_4518 + 4);
    local_4520 = (undefined1 (*) [64])(*local_4520 + 4);
    local_4528 = local_4528 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}